

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Primitive PVar14;
  uint uVar15;
  Geometry *pGVar16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  uint uVar121;
  ulong uVar122;
  RTCIntersectArguments *pRVar123;
  byte bVar124;
  long lVar125;
  long lVar126;
  ulong uVar127;
  long lVar128;
  ulong uVar129;
  undefined4 uVar130;
  undefined8 unaff_R14;
  float fVar131;
  float fVar133;
  undefined1 auVar134 [16];
  float fVar132;
  float fVar150;
  float fVar154;
  float fVar157;
  float fVar158;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar149;
  float fVar153;
  float fVar161;
  float fVar164;
  float fVar167;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar151;
  float fVar155;
  float fVar159;
  float fVar162;
  float fVar165;
  float fVar169;
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar152;
  float fVar156;
  float fVar160;
  float fVar163;
  float fVar166;
  float fVar168;
  float fVar170;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  float fVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar201;
  float fVar202;
  float fVar204;
  float fVar206;
  float fVar207;
  undefined1 auVar195 [32];
  float fVar203;
  undefined1 auVar196 [32];
  undefined1 auVar205 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar208;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar247 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar225 [16];
  float fVar223;
  undefined1 auVar227 [16];
  float fVar224;
  float fVar234;
  float fVar237;
  undefined1 auVar228 [32];
  undefined1 auVar226 [16];
  float fVar235;
  float fVar238;
  float fVar240;
  float fVar241;
  undefined1 auVar229 [32];
  float fVar236;
  float fVar239;
  float fVar242;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar243;
  float fVar254;
  float fVar255;
  undefined1 auVar244 [16];
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar248 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  float fVar256;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  float fVar260;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar273;
  undefined1 auVar266 [32];
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar286;
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  float fVar290;
  float fVar291;
  float fVar293;
  undefined1 auVar287 [16];
  float fVar295;
  undefined1 auVar292 [12];
  float fVar296;
  float fVar297;
  float fVar298;
  undefined1 auVar288 [32];
  float fVar294;
  undefined1 auVar289 [32];
  float fVar299;
  undefined1 auVar300 [16];
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [64];
  float fVar315;
  float fVar317;
  float fVar319;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  float fVar316;
  float fVar318;
  float fVar320;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar321;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar327 [16];
  float in_register_0000151c;
  undefined1 auVar328 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [64];
  float fVar335;
  float fVar341;
  float fVar342;
  float fVar344;
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  float fVar343;
  float fVar345;
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [64];
  float fVar346;
  float fVar351;
  float fVar352;
  float fVar353;
  float in_register_0000159c;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  float fVar354;
  float fVar358;
  float fVar359;
  float fVar360;
  float in_register_000015dc;
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float local_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined8 local_830;
  undefined8 uStack_828;
  float local_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [16];
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 (*local_700) [16];
  Precalculations *local_6f8;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 auStack_630 [8];
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [56];
  LinearSpace3fa *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  RTCHitN local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float local_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  undefined1 auVar177 [24];
  undefined1 auVar329 [32];
  
  PVar14 = prim[1];
  uVar122 = (ulong)(byte)PVar14;
  fVar186 = *(float *)(prim + uVar122 * 0x19 + 0x12);
  auVar247 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar247 = vinsertps_avx(auVar247,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar189 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar189 = vinsertps_avx(auVar189,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar247 = vsubps_avx(auVar247,*(undefined1 (*) [16])(prim + uVar122 * 0x19 + 6));
  auVar171._0_4_ = fVar186 * auVar247._0_4_;
  auVar171._4_4_ = fVar186 * auVar247._4_4_;
  auVar171._8_4_ = fVar186 * auVar247._8_4_;
  auVar171._12_4_ = fVar186 * auVar247._12_4_;
  auVar244._0_4_ = fVar186 * auVar189._0_4_;
  auVar244._4_4_ = fVar186 * auVar189._4_4_;
  auVar244._8_4_ = fVar186 * auVar189._8_4_;
  auVar244._12_4_ = fVar186 * auVar189._12_4_;
  auVar247 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 4 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 4 + 10)));
  auVar137._16_16_ = auVar189;
  auVar137._0_16_ = auVar247;
  auVar247 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 5 + 6)));
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 5 + 10)));
  auVar195._16_16_ = auVar189;
  auVar195._0_16_ = auVar247;
  auVar337 = vcvtdq2ps_avx(auVar195);
  auVar247 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 6 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 6 + 10)));
  auVar211._16_16_ = auVar189;
  auVar211._0_16_ = auVar247;
  auVar247 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0xb + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0xb + 10)));
  auVar19 = vcvtdq2ps_avx(auVar211);
  auVar212._16_16_ = auVar189;
  auVar212._0_16_ = auVar247;
  auVar20 = vcvtdq2ps_avx(auVar212);
  auVar247 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0xc + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0xc + 10)));
  auVar261._16_16_ = auVar189;
  auVar261._0_16_ = auVar247;
  auVar247 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0xd + 6)));
  auVar21 = vcvtdq2ps_avx(auVar261);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0xd + 10)));
  auVar274._16_16_ = auVar189;
  auVar274._0_16_ = auVar247;
  auVar22 = vcvtdq2ps_avx(auVar274);
  auVar247 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x12 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x12 + 10)));
  auVar275._16_16_ = auVar189;
  auVar275._0_16_ = auVar247;
  auVar247 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x13 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x13 + 10)));
  auVar23 = vcvtdq2ps_avx(auVar275);
  auVar301._16_16_ = auVar189;
  auVar301._0_16_ = auVar247;
  auVar24 = vcvtdq2ps_avx(auVar301);
  auVar247 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x14 + 6)));
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar122 * 0x14 + 10)));
  auVar311._16_16_ = auVar189;
  auVar311._0_16_ = auVar247;
  auVar25 = vcvtdq2ps_avx(auVar311);
  auVar247 = vshufps_avx(auVar244,auVar244,0);
  auVar189 = vshufps_avx(auVar244,auVar244,0x55);
  auVar205 = vshufps_avx(auVar244,auVar244,0xaa);
  fVar186 = auVar205._0_4_;
  fVar201 = auVar205._4_4_;
  fVar202 = auVar205._8_4_;
  fVar203 = auVar205._12_4_;
  fVar204 = auVar189._0_4_;
  fVar206 = auVar189._4_4_;
  fVar207 = auVar189._8_4_;
  fVar243 = auVar189._12_4_;
  fVar254 = auVar247._0_4_;
  fVar255 = auVar247._4_4_;
  fVar256 = auVar247._8_4_;
  fVar257 = auVar247._12_4_;
  auVar328._0_4_ = fVar254 * auVar137._0_4_ + fVar204 * auVar337._0_4_ + fVar186 * auVar19._0_4_;
  auVar328._4_4_ = fVar255 * auVar137._4_4_ + fVar206 * auVar337._4_4_ + fVar201 * auVar19._4_4_;
  auVar328._8_4_ = fVar256 * auVar137._8_4_ + fVar207 * auVar337._8_4_ + fVar202 * auVar19._8_4_;
  auVar328._12_4_ = fVar257 * auVar137._12_4_ + fVar243 * auVar337._12_4_ + fVar203 * auVar19._12_4_
  ;
  auVar328._16_4_ = fVar254 * auVar137._16_4_ + fVar204 * auVar337._16_4_ + fVar186 * auVar19._16_4_
  ;
  auVar328._20_4_ = fVar255 * auVar137._20_4_ + fVar206 * auVar337._20_4_ + fVar201 * auVar19._20_4_
  ;
  auVar328._24_4_ = fVar256 * auVar137._24_4_ + fVar207 * auVar337._24_4_ + fVar202 * auVar19._24_4_
  ;
  auVar328._28_4_ = fVar243 + in_register_000015dc + in_register_0000151c;
  auVar322._0_4_ = fVar254 * auVar20._0_4_ + fVar204 * auVar21._0_4_ + auVar22._0_4_ * fVar186;
  auVar322._4_4_ = fVar255 * auVar20._4_4_ + fVar206 * auVar21._4_4_ + auVar22._4_4_ * fVar201;
  auVar322._8_4_ = fVar256 * auVar20._8_4_ + fVar207 * auVar21._8_4_ + auVar22._8_4_ * fVar202;
  auVar322._12_4_ = fVar257 * auVar20._12_4_ + fVar243 * auVar21._12_4_ + auVar22._12_4_ * fVar203;
  auVar322._16_4_ = fVar254 * auVar20._16_4_ + fVar204 * auVar21._16_4_ + auVar22._16_4_ * fVar186;
  auVar322._20_4_ = fVar255 * auVar20._20_4_ + fVar206 * auVar21._20_4_ + auVar22._20_4_ * fVar201;
  auVar322._24_4_ = fVar256 * auVar20._24_4_ + fVar207 * auVar21._24_4_ + auVar22._24_4_ * fVar202;
  auVar322._28_4_ = fVar243 + in_register_000015dc + in_register_0000159c;
  auVar248._0_4_ = fVar254 * auVar23._0_4_ + fVar204 * auVar24._0_4_ + auVar25._0_4_ * fVar186;
  auVar248._4_4_ = fVar255 * auVar23._4_4_ + fVar206 * auVar24._4_4_ + auVar25._4_4_ * fVar201;
  auVar248._8_4_ = fVar256 * auVar23._8_4_ + fVar207 * auVar24._8_4_ + auVar25._8_4_ * fVar202;
  auVar248._12_4_ = fVar257 * auVar23._12_4_ + fVar243 * auVar24._12_4_ + auVar25._12_4_ * fVar203;
  auVar248._16_4_ = fVar254 * auVar23._16_4_ + fVar204 * auVar24._16_4_ + auVar25._16_4_ * fVar186;
  auVar248._20_4_ = fVar255 * auVar23._20_4_ + fVar206 * auVar24._20_4_ + auVar25._20_4_ * fVar201;
  auVar248._24_4_ = fVar256 * auVar23._24_4_ + fVar207 * auVar24._24_4_ + auVar25._24_4_ * fVar202;
  auVar248._28_4_ = fVar257 + fVar243 + fVar203;
  auVar247 = vshufps_avx(auVar171,auVar171,0);
  auVar189 = vshufps_avx(auVar171,auVar171,0x55);
  auVar205 = vshufps_avx(auVar171,auVar171,0xaa);
  fVar201 = auVar205._0_4_;
  fVar202 = auVar205._4_4_;
  fVar203 = auVar205._8_4_;
  fVar204 = auVar205._12_4_;
  fVar255 = auVar189._0_4_;
  fVar256 = auVar189._4_4_;
  fVar257 = auVar189._8_4_;
  fVar258 = auVar189._12_4_;
  fVar206 = auVar247._0_4_;
  fVar207 = auVar247._4_4_;
  fVar243 = auVar247._8_4_;
  fVar254 = auVar247._12_4_;
  fVar186 = auVar137._28_4_;
  auVar178._0_4_ = fVar206 * auVar137._0_4_ + fVar255 * auVar337._0_4_ + fVar201 * auVar19._0_4_;
  auVar178._4_4_ = fVar207 * auVar137._4_4_ + fVar256 * auVar337._4_4_ + fVar202 * auVar19._4_4_;
  auVar178._8_4_ = fVar243 * auVar137._8_4_ + fVar257 * auVar337._8_4_ + fVar203 * auVar19._8_4_;
  auVar178._12_4_ = fVar254 * auVar137._12_4_ + fVar258 * auVar337._12_4_ + fVar204 * auVar19._12_4_
  ;
  auVar178._16_4_ = fVar206 * auVar137._16_4_ + fVar255 * auVar337._16_4_ + fVar201 * auVar19._16_4_
  ;
  auVar178._20_4_ = fVar207 * auVar137._20_4_ + fVar256 * auVar337._20_4_ + fVar202 * auVar19._20_4_
  ;
  auVar178._24_4_ = fVar243 * auVar137._24_4_ + fVar257 * auVar337._24_4_ + fVar203 * auVar19._24_4_
  ;
  auVar178._28_4_ = fVar186 + auVar337._28_4_ + auVar19._28_4_;
  auVar228._0_4_ = fVar206 * auVar20._0_4_ + auVar22._0_4_ * fVar201 + fVar255 * auVar21._0_4_;
  auVar228._4_4_ = fVar207 * auVar20._4_4_ + auVar22._4_4_ * fVar202 + fVar256 * auVar21._4_4_;
  auVar228._8_4_ = fVar243 * auVar20._8_4_ + auVar22._8_4_ * fVar203 + fVar257 * auVar21._8_4_;
  auVar228._12_4_ = fVar254 * auVar20._12_4_ + auVar22._12_4_ * fVar204 + fVar258 * auVar21._12_4_;
  auVar228._16_4_ = fVar206 * auVar20._16_4_ + auVar22._16_4_ * fVar201 + fVar255 * auVar21._16_4_;
  auVar228._20_4_ = fVar207 * auVar20._20_4_ + auVar22._20_4_ * fVar202 + fVar256 * auVar21._20_4_;
  auVar228._24_4_ = fVar243 * auVar20._24_4_ + auVar22._24_4_ * fVar203 + fVar257 * auVar21._24_4_;
  auVar228._28_4_ = fVar186 + auVar22._28_4_ + auVar19._28_4_;
  auVar213._0_4_ = fVar206 * auVar23._0_4_ + fVar255 * auVar24._0_4_ + auVar25._0_4_ * fVar201;
  auVar213._4_4_ = fVar207 * auVar23._4_4_ + fVar256 * auVar24._4_4_ + auVar25._4_4_ * fVar202;
  auVar213._8_4_ = fVar243 * auVar23._8_4_ + fVar257 * auVar24._8_4_ + auVar25._8_4_ * fVar203;
  auVar213._12_4_ = fVar254 * auVar23._12_4_ + fVar258 * auVar24._12_4_ + auVar25._12_4_ * fVar204;
  auVar213._16_4_ = fVar206 * auVar23._16_4_ + fVar255 * auVar24._16_4_ + auVar25._16_4_ * fVar201;
  auVar213._20_4_ = fVar207 * auVar23._20_4_ + fVar256 * auVar24._20_4_ + auVar25._20_4_ * fVar202;
  auVar213._24_4_ = fVar243 * auVar23._24_4_ + fVar257 * auVar24._24_4_ + auVar25._24_4_ * fVar203;
  auVar213._28_4_ = fVar186 + auVar21._28_4_ + fVar204;
  auVar276._8_4_ = 0x7fffffff;
  auVar276._0_8_ = 0x7fffffff7fffffff;
  auVar276._12_4_ = 0x7fffffff;
  auVar276._16_4_ = 0x7fffffff;
  auVar276._20_4_ = 0x7fffffff;
  auVar276._24_4_ = 0x7fffffff;
  auVar276._28_4_ = 0x7fffffff;
  auVar138._8_4_ = 0x219392ef;
  auVar138._0_8_ = 0x219392ef219392ef;
  auVar138._12_4_ = 0x219392ef;
  auVar138._16_4_ = 0x219392ef;
  auVar138._20_4_ = 0x219392ef;
  auVar138._24_4_ = 0x219392ef;
  auVar138._28_4_ = 0x219392ef;
  auVar137 = vandps_avx(auVar328,auVar276);
  auVar137 = vcmpps_avx(auVar137,auVar138,1);
  auVar337 = vblendvps_avx(auVar328,auVar138,auVar137);
  auVar137 = vandps_avx(auVar322,auVar276);
  auVar137 = vcmpps_avx(auVar137,auVar138,1);
  auVar19 = vblendvps_avx(auVar322,auVar138,auVar137);
  auVar137 = vandps_avx(auVar248,auVar276);
  auVar137 = vcmpps_avx(auVar137,auVar138,1);
  auVar137 = vblendvps_avx(auVar248,auVar138,auVar137);
  auVar20 = vrcpps_avx(auVar337);
  fVar186 = auVar20._0_4_;
  fVar201 = auVar20._4_4_;
  auVar21._4_4_ = auVar337._4_4_ * fVar201;
  auVar21._0_4_ = auVar337._0_4_ * fVar186;
  fVar202 = auVar20._8_4_;
  auVar21._8_4_ = auVar337._8_4_ * fVar202;
  fVar203 = auVar20._12_4_;
  auVar21._12_4_ = auVar337._12_4_ * fVar203;
  fVar204 = auVar20._16_4_;
  auVar21._16_4_ = auVar337._16_4_ * fVar204;
  fVar206 = auVar20._20_4_;
  auVar21._20_4_ = auVar337._20_4_ * fVar206;
  fVar207 = auVar20._24_4_;
  auVar21._24_4_ = auVar337._24_4_ * fVar207;
  auVar21._28_4_ = auVar337._28_4_;
  auVar277._8_4_ = 0x3f800000;
  auVar277._0_8_ = 0x3f8000003f800000;
  auVar277._12_4_ = 0x3f800000;
  auVar277._16_4_ = 0x3f800000;
  auVar277._20_4_ = 0x3f800000;
  auVar277._24_4_ = 0x3f800000;
  auVar277._28_4_ = 0x3f800000;
  auVar337 = vsubps_avx(auVar277,auVar21);
  fVar186 = fVar186 + fVar186 * auVar337._0_4_;
  fVar201 = fVar201 + fVar201 * auVar337._4_4_;
  fVar202 = fVar202 + fVar202 * auVar337._8_4_;
  fVar203 = fVar203 + fVar203 * auVar337._12_4_;
  fVar204 = fVar204 + fVar204 * auVar337._16_4_;
  fVar206 = fVar206 + fVar206 * auVar337._20_4_;
  fVar207 = fVar207 + fVar207 * auVar337._24_4_;
  auVar337 = vrcpps_avx(auVar19);
  fVar243 = auVar337._0_4_;
  fVar254 = auVar337._4_4_;
  auVar20._4_4_ = fVar254 * auVar19._4_4_;
  auVar20._0_4_ = fVar243 * auVar19._0_4_;
  fVar255 = auVar337._8_4_;
  auVar20._8_4_ = fVar255 * auVar19._8_4_;
  fVar256 = auVar337._12_4_;
  auVar20._12_4_ = fVar256 * auVar19._12_4_;
  fVar257 = auVar337._16_4_;
  auVar20._16_4_ = fVar257 * auVar19._16_4_;
  fVar258 = auVar337._20_4_;
  auVar20._20_4_ = fVar258 * auVar19._20_4_;
  fVar259 = auVar337._24_4_;
  auVar20._24_4_ = fVar259 * auVar19._24_4_;
  auVar20._28_4_ = auVar19._28_4_;
  auVar337 = vsubps_avx(auVar277,auVar20);
  fVar243 = fVar243 + fVar243 * auVar337._0_4_;
  fVar254 = fVar254 + fVar254 * auVar337._4_4_;
  fVar255 = fVar255 + fVar255 * auVar337._8_4_;
  fVar256 = fVar256 + fVar256 * auVar337._12_4_;
  fVar257 = fVar257 + fVar257 * auVar337._16_4_;
  fVar258 = fVar258 + fVar258 * auVar337._20_4_;
  fVar259 = fVar259 + fVar259 * auVar337._24_4_;
  auVar337 = vrcpps_avx(auVar137);
  fVar260 = auVar337._0_4_;
  fVar267 = auVar337._4_4_;
  auVar19._4_4_ = fVar267 * auVar137._4_4_;
  auVar19._0_4_ = fVar260 * auVar137._0_4_;
  fVar268 = auVar337._8_4_;
  auVar19._8_4_ = fVar268 * auVar137._8_4_;
  fVar269 = auVar337._12_4_;
  auVar19._12_4_ = fVar269 * auVar137._12_4_;
  fVar270 = auVar337._16_4_;
  auVar19._16_4_ = fVar270 * auVar137._16_4_;
  fVar271 = auVar337._20_4_;
  auVar19._20_4_ = fVar271 * auVar137._20_4_;
  fVar272 = auVar337._24_4_;
  auVar19._24_4_ = fVar272 * auVar137._24_4_;
  auVar19._28_4_ = auVar137._28_4_;
  auVar137 = vsubps_avx(auVar277,auVar19);
  fVar260 = fVar260 + fVar260 * auVar137._0_4_;
  fVar267 = fVar267 + fVar267 * auVar137._4_4_;
  fVar268 = fVar268 + fVar268 * auVar137._8_4_;
  fVar269 = fVar269 + fVar269 * auVar137._12_4_;
  fVar270 = fVar270 + fVar270 * auVar137._16_4_;
  fVar271 = fVar271 + fVar271 * auVar137._20_4_;
  fVar272 = fVar272 + fVar272 * auVar137._24_4_;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = *(ulong *)(prim + uVar122 * 7 + 6);
  auVar247 = vpmovsxwd_avx(auVar247);
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar122 * 7 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar189);
  auVar139._16_16_ = auVar189;
  auVar139._0_16_ = auVar247;
  auVar137 = vcvtdq2ps_avx(auVar139);
  auVar137 = vsubps_avx(auVar137,auVar178);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar122 * 9 + 6);
  auVar247 = vpmovsxwd_avx(auVar205);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + uVar122 * 9 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar210);
  auVar134._0_4_ = fVar186 * auVar137._0_4_;
  auVar134._4_4_ = fVar201 * auVar137._4_4_;
  auVar134._8_4_ = fVar202 * auVar137._8_4_;
  auVar134._12_4_ = fVar203 * auVar137._12_4_;
  auVar22._16_4_ = fVar204 * auVar137._16_4_;
  auVar22._0_16_ = auVar134;
  auVar22._20_4_ = fVar206 * auVar137._20_4_;
  auVar22._24_4_ = fVar207 * auVar137._24_4_;
  auVar22._28_4_ = auVar137._28_4_;
  auVar278._16_16_ = auVar189;
  auVar278._0_16_ = auVar247;
  auVar137 = vcvtdq2ps_avx(auVar278);
  auVar137 = vsubps_avx(auVar137,auVar178);
  auVar172._0_4_ = fVar186 * auVar137._0_4_;
  auVar172._4_4_ = fVar201 * auVar137._4_4_;
  auVar172._8_4_ = fVar202 * auVar137._8_4_;
  auVar172._12_4_ = fVar203 * auVar137._12_4_;
  auVar23._16_4_ = fVar204 * auVar137._16_4_;
  auVar23._0_16_ = auVar172;
  auVar23._20_4_ = fVar206 * auVar137._20_4_;
  auVar23._24_4_ = fVar207 * auVar137._24_4_;
  auVar23._28_4_ = auVar137._28_4_;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + uVar122 * 0xe + 6);
  auVar247 = vpmovsxwd_avx(auVar135);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar122 * 0xe + 0xe);
  auVar189 = vpmovsxwd_avx(auVar7);
  auVar196._16_16_ = auVar189;
  auVar196._0_16_ = auVar247;
  auVar137 = vcvtdq2ps_avx(auVar196);
  auVar137 = vsubps_avx(auVar137,auVar228);
  auVar187._0_4_ = fVar243 * auVar137._0_4_;
  auVar187._4_4_ = fVar254 * auVar137._4_4_;
  auVar187._8_4_ = fVar255 * auVar137._8_4_;
  auVar187._12_4_ = fVar256 * auVar137._12_4_;
  auVar337._16_4_ = fVar257 * auVar137._16_4_;
  auVar337._0_16_ = auVar187;
  auVar337._20_4_ = fVar258 * auVar137._20_4_;
  auVar337._24_4_ = fVar259 * auVar137._24_4_;
  auVar337._28_4_ = auVar137._28_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  auVar247 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar14 * 0x10 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar9);
  auVar279._16_16_ = auVar189;
  auVar279._0_16_ = auVar247;
  auVar137 = vcvtdq2ps_avx(auVar279);
  auVar137 = vsubps_avx(auVar137,auVar228);
  auVar225._0_4_ = fVar243 * auVar137._0_4_;
  auVar225._4_4_ = fVar254 * auVar137._4_4_;
  auVar225._8_4_ = fVar255 * auVar137._8_4_;
  auVar225._12_4_ = fVar256 * auVar137._12_4_;
  auVar24._16_4_ = fVar257 * auVar137._16_4_;
  auVar24._0_16_ = auVar225;
  auVar24._20_4_ = fVar258 * auVar137._20_4_;
  auVar24._24_4_ = fVar259 * auVar137._24_4_;
  auVar24._28_4_ = auVar137._28_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar122 * 0x15 + 6);
  auVar247 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar122 * 0x15 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar11);
  auVar249._16_16_ = auVar189;
  auVar249._0_16_ = auVar247;
  auVar137 = vcvtdq2ps_avx(auVar249);
  auVar137 = vsubps_avx(auVar137,auVar213);
  auVar245._0_4_ = fVar260 * auVar137._0_4_;
  auVar245._4_4_ = fVar267 * auVar137._4_4_;
  auVar245._8_4_ = fVar268 * auVar137._8_4_;
  auVar245._12_4_ = fVar269 * auVar137._12_4_;
  auVar25._16_4_ = fVar270 * auVar137._16_4_;
  auVar25._0_16_ = auVar245;
  auVar25._20_4_ = fVar271 * auVar137._20_4_;
  auVar25._24_4_ = fVar272 * auVar137._24_4_;
  auVar25._28_4_ = auVar137._28_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar122 * 0x17 + 6);
  auVar247 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar122 * 0x17 + 0xe);
  auVar189 = vpmovsxwd_avx(auVar13);
  auVar280._16_16_ = auVar189;
  auVar280._0_16_ = auVar247;
  auVar137 = vcvtdq2ps_avx(auVar280);
  auVar137 = vsubps_avx(auVar137,auVar213);
  auVar209._0_4_ = fVar260 * auVar137._0_4_;
  auVar209._4_4_ = fVar267 * auVar137._4_4_;
  auVar209._8_4_ = fVar268 * auVar137._8_4_;
  auVar209._12_4_ = fVar269 * auVar137._12_4_;
  auVar26._16_4_ = fVar270 * auVar137._16_4_;
  auVar26._0_16_ = auVar209;
  auVar26._20_4_ = fVar271 * auVar137._20_4_;
  auVar26._24_4_ = fVar272 * auVar137._24_4_;
  auVar26._28_4_ = auVar137._28_4_;
  auVar247 = vpminsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar189 = vpminsd_avx(auVar134,auVar172);
  auVar312._16_16_ = auVar247;
  auVar312._0_16_ = auVar189;
  auVar205 = auVar337._16_16_;
  auVar306 = ZEXT1664(auVar205);
  auVar247 = vpminsd_avx(auVar205,auVar24._16_16_);
  auVar189 = vpminsd_avx(auVar187,auVar225);
  auVar323._16_16_ = auVar247;
  auVar323._0_16_ = auVar189;
  auVar137 = vmaxps_avx(auVar312,auVar323);
  auVar247 = vpminsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar189 = vpminsd_avx(auVar245,auVar209);
  auVar336._16_16_ = auVar247;
  auVar336._0_16_ = auVar189;
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar347._4_4_ = uVar130;
  auVar347._0_4_ = uVar130;
  auVar347._8_4_ = uVar130;
  auVar347._12_4_ = uVar130;
  auVar347._16_4_ = uVar130;
  auVar347._20_4_ = uVar130;
  auVar347._24_4_ = uVar130;
  auVar347._28_4_ = uVar130;
  auVar337 = vmaxps_avx(auVar336,auVar347);
  auVar137 = vmaxps_avx(auVar137,auVar337);
  local_80._4_4_ = auVar137._4_4_ * 0.99999964;
  local_80._0_4_ = auVar137._0_4_ * 0.99999964;
  local_80._8_4_ = auVar137._8_4_ * 0.99999964;
  local_80._12_4_ = auVar137._12_4_ * 0.99999964;
  local_80._16_4_ = auVar137._16_4_ * 0.99999964;
  local_80._20_4_ = auVar137._20_4_ * 0.99999964;
  local_80._24_4_ = auVar137._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar340 = ZEXT3264(local_80);
  auVar247 = vpmaxsd_avx(auVar22._16_16_,auVar23._16_16_);
  auVar189 = vpmaxsd_avx(auVar134,auVar172);
  auVar140._16_16_ = auVar247;
  auVar140._0_16_ = auVar189;
  auVar247 = vpmaxsd_avx(auVar205,auVar24._16_16_);
  auVar189 = vpmaxsd_avx(auVar187,auVar225);
  auVar179._16_16_ = auVar247;
  auVar179._0_16_ = auVar189;
  auVar137 = vminps_avx(auVar140,auVar179);
  auVar247 = vpmaxsd_avx(auVar25._16_16_,auVar26._16_16_);
  auVar189 = vpmaxsd_avx(auVar245,auVar209);
  auVar180._16_16_ = auVar247;
  auVar180._0_16_ = auVar189;
  uVar130 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar197._4_4_ = uVar130;
  auVar197._0_4_ = uVar130;
  auVar197._8_4_ = uVar130;
  auVar197._12_4_ = uVar130;
  auVar197._16_4_ = uVar130;
  auVar197._20_4_ = uVar130;
  auVar197._24_4_ = uVar130;
  auVar197._28_4_ = uVar130;
  auVar337 = vminps_avx(auVar180,auVar197);
  auVar137 = vminps_avx(auVar137,auVar337);
  auVar18._4_4_ = auVar137._4_4_ * 1.0000004;
  auVar18._0_4_ = auVar137._0_4_ * 1.0000004;
  auVar18._8_4_ = auVar137._8_4_ * 1.0000004;
  auVar18._12_4_ = auVar137._12_4_ * 1.0000004;
  auVar18._16_4_ = auVar137._16_4_ * 1.0000004;
  auVar18._20_4_ = auVar137._20_4_ * 1.0000004;
  auVar18._24_4_ = auVar137._24_4_ * 1.0000004;
  auVar18._28_4_ = auVar137._28_4_;
  auVar137 = vcmpps_avx(local_80,auVar18,2);
  auVar247 = vpshufd_avx(ZEXT116((byte)PVar14),0);
  auVar181._16_16_ = auVar247;
  auVar181._0_16_ = auVar247;
  auVar337 = vcvtdq2ps_avx(auVar181);
  auVar337 = vcmpps_avx(_DAT_01f7b060,auVar337,1);
  auVar137 = vandps_avx(auVar137,auVar337);
  uVar130 = vmovmskps_avx(auVar137);
  local_5e0 = mm_lookupmask_ps._16_8_;
  uStack_5d8 = mm_lookupmask_ps._24_8_;
  uStack_5d0 = mm_lookupmask_ps._16_8_;
  uStack_5c8 = mm_lookupmask_ps._24_8_;
  local_5e8 = pre->ray_space + k;
  local_700 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  uVar122 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar130);
  local_6f8 = pre;
  while (uVar122 != 0) {
    auVar137 = auVar306._0_32_;
    auVar337 = auVar340._0_32_;
    lVar126 = 0;
    if (uVar122 != 0) {
      for (; (uVar122 >> lVar126 & 1) == 0; lVar126 = lVar126 + 1) {
      }
    }
    uVar129 = uVar122 - 1 & uVar122;
    uVar121 = *(uint *)(prim + 2);
    local_7a8 = (ulong)uVar121;
    local_520 = *(float *)(prim + lVar126 * 4 + 6);
    pGVar16 = (context->scene->geometries).items[local_7a8].ptr;
    uVar127 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                              pGVar16[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i * (ulong)(uint)local_520);
    p_Var17 = pGVar16[1].intersectionFilterN;
    lVar126 = *(long *)&pGVar16[1].time_range.upper;
    auVar247 = *(undefined1 (*) [16])(lVar126 + (long)p_Var17 * uVar127);
    auVar189 = *(undefined1 (*) [16])(lVar126 + (uVar127 + 1) * (long)p_Var17);
    auVar205 = *(undefined1 (*) [16])(lVar126 + (uVar127 + 2) * (long)p_Var17);
    lVar128 = 0;
    if (uVar129 != 0) {
      for (; (uVar129 >> lVar128 & 1) == 0; lVar128 = lVar128 + 1) {
      }
    }
    auVar210 = *(undefined1 (*) [16])(lVar126 + (uVar127 + 3) * (long)p_Var17);
    if (((uVar129 != 0) && (uVar127 = uVar129 - 1 & uVar129, uVar127 != 0)) &&
       (lVar126 = 0, uVar127 != 0)) {
      for (; (uVar127 >> lVar126 & 1) == 0; lVar126 = lVar126 + 1) {
      }
    }
    auVar135 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    uVar15 = (uint)pGVar16[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar9 = vinsertps_avx(auVar135,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar8 = vsubps_avx(auVar247,auVar9);
    auVar135 = vshufps_avx(auVar8,auVar8,0);
    auVar7 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    fVar186 = (local_5e8->vx).field_0.m128[0];
    fVar201 = (local_5e8->vx).field_0.m128[1];
    fVar202 = (local_5e8->vx).field_0.m128[2];
    fVar203 = (local_5e8->vx).field_0.m128[3];
    fVar204 = (local_5e8->vy).field_0.m128[0];
    fVar206 = (local_5e8->vy).field_0.m128[1];
    fVar207 = (local_5e8->vy).field_0.m128[2];
    fVar243 = (local_5e8->vy).field_0.m128[3];
    fVar254 = (local_5e8->vz).field_0.m128[0];
    fVar255 = (local_5e8->vz).field_0.m128[1];
    fVar256 = (local_5e8->vz).field_0.m128[2];
    fVar257 = (local_5e8->vz).field_0.m128[3];
    auVar173._0_4_ = auVar135._0_4_ * fVar186 + auVar7._0_4_ * fVar204 + fVar254 * auVar8._0_4_;
    auVar173._4_4_ = auVar135._4_4_ * fVar201 + auVar7._4_4_ * fVar206 + fVar255 * auVar8._4_4_;
    auVar173._8_4_ = auVar135._8_4_ * fVar202 + auVar7._8_4_ * fVar207 + fVar256 * auVar8._8_4_;
    auVar173._12_4_ = auVar135._12_4_ * fVar203 + auVar7._12_4_ * fVar243 + fVar257 * auVar8._12_4_;
    auVar135 = vblendps_avx(auVar173,auVar247,8);
    auVar10 = vsubps_avx(auVar189,auVar9);
    auVar7 = vshufps_avx(auVar10,auVar10,0);
    auVar8 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar246._0_4_ = auVar7._0_4_ * fVar186 + auVar8._0_4_ * fVar204 + fVar254 * auVar10._0_4_;
    auVar246._4_4_ = auVar7._4_4_ * fVar201 + auVar8._4_4_ * fVar206 + fVar255 * auVar10._4_4_;
    auVar246._8_4_ = auVar7._8_4_ * fVar202 + auVar8._8_4_ * fVar207 + fVar256 * auVar10._8_4_;
    auVar246._12_4_ = auVar7._12_4_ * fVar203 + auVar8._12_4_ * fVar243 + fVar257 * auVar10._12_4_;
    auVar7 = vblendps_avx(auVar246,auVar189,8);
    auVar11 = vsubps_avx(auVar205,auVar9);
    auVar8 = vshufps_avx(auVar11,auVar11,0);
    auVar10 = vshufps_avx(auVar11,auVar11,0x55);
    auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar287._0_4_ = auVar8._0_4_ * fVar186 + auVar10._0_4_ * fVar204 + fVar254 * auVar11._0_4_;
    auVar287._4_4_ = auVar8._4_4_ * fVar201 + auVar10._4_4_ * fVar206 + fVar255 * auVar11._4_4_;
    auVar287._8_4_ = auVar8._8_4_ * fVar202 + auVar10._8_4_ * fVar207 + fVar256 * auVar11._8_4_;
    auVar287._12_4_ = auVar8._12_4_ * fVar203 + auVar10._12_4_ * fVar243 + fVar257 * auVar11._12_4_;
    auVar11 = vshufps_avx(auVar205,auVar205,0xff);
    auVar8 = vblendps_avx(auVar287,auVar205,8);
    auVar12 = vsubps_avx(auVar210,auVar9);
    auVar9 = vshufps_avx(auVar12,auVar12,0);
    auVar10 = vshufps_avx(auVar12,auVar12,0x55);
    auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
    auVar300._0_4_ = auVar9._0_4_ * fVar186 + auVar10._0_4_ * fVar204 + fVar254 * auVar12._0_4_;
    auVar300._4_4_ = auVar9._4_4_ * fVar201 + auVar10._4_4_ * fVar206 + fVar255 * auVar12._4_4_;
    auVar300._8_4_ = auVar9._8_4_ * fVar202 + auVar10._8_4_ * fVar207 + fVar256 * auVar12._8_4_;
    auVar300._12_4_ = auVar9._12_4_ * fVar203 + auVar10._12_4_ * fVar243 + fVar257 * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar210,auVar210,0xff);
    auVar9 = vblendps_avx(auVar300,auVar210,8);
    auVar226._8_4_ = 0x7fffffff;
    auVar226._0_8_ = 0x7fffffff7fffffff;
    auVar226._12_4_ = 0x7fffffff;
    auVar135 = vandps_avx(auVar135,auVar226);
    auVar7 = vandps_avx(auVar7,auVar226);
    auVar10 = vmaxps_avx(auVar135,auVar7);
    auVar135 = vandps_avx(auVar8,auVar226);
    auVar7 = vandps_avx(auVar9,auVar226);
    auVar135 = vmaxps_avx(auVar135,auVar7);
    auVar135 = vmaxps_avx(auVar10,auVar135);
    auVar7 = vmovshdup_avx(auVar135);
    auVar7 = vmaxss_avx(auVar7,auVar135);
    auVar135 = vshufpd_avx(auVar135,auVar135,1);
    auVar135 = vmaxss_avx(auVar135,auVar7);
    lVar126 = (long)(int)uVar15 * 0x44;
    fVar186 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0x908);
    fVar201 = *(float *)(bspline_basis0 + lVar126 + 0x90c);
    fVar202 = *(float *)(bspline_basis0 + lVar126 + 0x910);
    fVar203 = *(float *)(bspline_basis0 + lVar126 + 0x914);
    fVar204 = *(float *)(bspline_basis0 + lVar126 + 0x918);
    fVar206 = *(float *)(bspline_basis0 + lVar126 + 0x91c);
    fVar207 = *(float *)(bspline_basis0 + lVar126 + 0x920);
    auVar118 = *(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0x908);
    auVar7 = vshufps_avx(auVar287,auVar287,0);
    register0x00001490 = auVar7;
    _local_540 = auVar7;
    auVar8 = vshufps_avx(auVar287,auVar287,0x55);
    register0x00001310 = auVar8;
    _local_480 = auVar8;
    register0x00001410 = auVar11;
    _local_120 = auVar11;
    fVar260 = *(float *)(bspline_basis0 + lVar126 + 0xd8c);
    fVar267 = *(float *)(bspline_basis0 + lVar126 + 0xd90);
    fVar268 = *(float *)(bspline_basis0 + lVar126 + 0xd94);
    fVar269 = *(float *)(bspline_basis0 + lVar126 + 0xd98);
    fVar270 = *(float *)(bspline_basis0 + lVar126 + 0xd9c);
    fVar271 = *(float *)(bspline_basis0 + lVar126 + 0xda0);
    fVar272 = *(float *)(bspline_basis0 + lVar126 + 0xda4);
    local_760._0_16_ = auVar300;
    auVar9 = vshufps_avx(auVar300,auVar300,0);
    register0x00001550 = auVar9;
    _local_4e0 = auVar9;
    auVar10 = vshufps_avx(auVar300,auVar300,0x55);
    register0x000013d0 = auVar12;
    _local_140 = auVar12;
    fVar335 = auVar9._0_4_;
    fVar341 = auVar9._4_4_;
    fVar342 = auVar9._8_4_;
    fVar344 = auVar9._12_4_;
    fVar354 = auVar10._0_4_;
    fVar358 = auVar10._4_4_;
    fVar359 = auVar10._8_4_;
    fVar360 = auVar10._12_4_;
    fVar309 = auVar7._0_4_;
    fVar315 = auVar7._4_4_;
    fVar317 = auVar7._8_4_;
    fVar319 = auVar7._12_4_;
    fVar273 = auVar8._0_4_;
    fVar234 = auVar8._4_4_;
    fVar237 = auVar8._8_4_;
    fVar240 = auVar8._12_4_;
    fVar224 = auVar12._0_4_;
    fVar236 = auVar12._4_4_;
    fVar239 = auVar12._8_4_;
    fVar242 = auVar12._12_4_;
    fVar285 = auVar11._0_4_;
    fVar290 = auVar11._4_4_;
    fVar293 = auVar11._8_4_;
    auVar7 = vshufps_avx(auVar246,auVar246,0);
    register0x00001490 = auVar7;
    _local_720 = auVar7;
    fVar243 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0x484);
    fVar254 = *(float *)(bspline_basis0 + lVar126 + 0x488);
    fVar255 = *(float *)(bspline_basis0 + lVar126 + 0x48c);
    fVar256 = *(float *)(bspline_basis0 + lVar126 + 0x490);
    fVar257 = *(float *)(bspline_basis0 + lVar126 + 0x494);
    fVar258 = *(float *)(bspline_basis0 + lVar126 + 0x498);
    fVar259 = *(float *)(bspline_basis0 + lVar126 + 0x49c);
    auVar119 = *(undefined1 (*) [28])(bspline_basis0 + lVar126 + 0x484);
    fVar291 = *(float *)(bspline_basis0 + lVar126 + 0x4a0);
    fVar310 = auVar7._0_4_;
    fVar316 = auVar7._4_4_;
    fVar318 = auVar7._8_4_;
    fVar320 = auVar7._12_4_;
    auVar7 = vshufps_avx(auVar246,auVar246,0x55);
    fVar131 = auVar7._0_4_;
    fVar149 = auVar7._4_4_;
    fVar153 = auVar7._8_4_;
    fVar157 = auVar7._12_4_;
    auVar7 = vshufps_avx(auVar189,auVar189,0xff);
    register0x00001590 = auVar7;
    _local_160 = auVar7;
    fVar343 = auVar7._0_4_;
    fVar345 = auVar7._4_4_;
    fVar346 = auVar7._8_4_;
    fVar351 = auVar7._12_4_;
    auVar7 = vshufps_avx(auVar173,auVar173,0);
    register0x00001310 = auVar7;
    _local_340 = auVar7;
    fVar294 = *(float *)(bspline_basis0 + lVar126);
    fVar220 = *(float *)(bspline_basis0 + lVar126 + 4);
    fVar283 = *(float *)(bspline_basis0 + lVar126 + 8);
    fVar295 = *(float *)(bspline_basis0 + lVar126 + 0xc);
    fStack_550 = *(float *)(bspline_basis0 + lVar126 + 0x10);
    fStack_54c = *(float *)(bspline_basis0 + lVar126 + 0x14);
    fStack_548 = *(float *)(bspline_basis0 + lVar126 + 0x18);
    fStack_544 = *(float *)(bspline_basis0 + lVar126 + 0x1c);
    fVar223 = auVar7._0_4_;
    fVar235 = auVar7._4_4_;
    fVar238 = auVar7._8_4_;
    fVar241 = auVar7._12_4_;
    auVar327._0_4_ = fVar223 * fVar294 + fVar310 * fVar243 + fVar309 * fVar186 + fVar335 * fVar260;
    auVar327._4_4_ = fVar235 * fVar220 + fVar316 * fVar254 + fVar315 * fVar201 + fVar341 * fVar267;
    auVar327._8_4_ = fVar238 * fVar283 + fVar318 * fVar255 + fVar317 * fVar202 + fVar342 * fVar268;
    auVar327._12_4_ = fVar241 * fVar295 + fVar320 * fVar256 + fVar319 * fVar203 + fVar344 * fVar269;
    auVar329._16_4_ =
         fVar223 * fStack_550 + fVar310 * fVar257 + fVar309 * fVar204 + fVar335 * fVar270;
    auVar329._0_16_ = auVar327;
    auVar329._20_4_ =
         fVar235 * fStack_54c + fVar316 * fVar258 + fVar315 * fVar206 + fVar341 * fVar271;
    auVar329._24_4_ =
         fVar238 * fStack_548 + fVar318 * fVar259 + fVar317 * fVar207 + fVar342 * fVar272;
    auVar329._28_4_ = fVar291 + 0.0;
    auVar7 = vshufps_avx(auVar173,auVar173,0x55);
    register0x000014d0 = auVar7;
    _local_4c0 = auVar7;
    fVar321 = auVar7._0_4_;
    fVar324 = auVar7._4_4_;
    fVar325 = auVar7._8_4_;
    fVar326 = auVar7._12_4_;
    auVar288._0_4_ = fVar321 * fVar294 + fVar131 * fVar243 + fVar273 * fVar186 + fVar354 * fVar260;
    auVar288._4_4_ = fVar324 * fVar220 + fVar149 * fVar254 + fVar234 * fVar201 + fVar358 * fVar267;
    auVar288._8_4_ = fVar325 * fVar283 + fVar153 * fVar255 + fVar237 * fVar202 + fVar359 * fVar268;
    auVar288._12_4_ = fVar326 * fVar295 + fVar157 * fVar256 + fVar240 * fVar203 + fVar360 * fVar269;
    auVar288._16_4_ =
         fVar321 * fStack_550 + fVar131 * fVar257 + fVar273 * fVar204 + fVar354 * fVar270;
    auVar288._20_4_ =
         fVar324 * fStack_54c + fVar149 * fVar258 + fVar234 * fVar206 + fVar358 * fVar271;
    auVar288._24_4_ =
         fVar325 * fStack_548 + fVar153 * fVar259 + fVar237 * fVar207 + fVar359 * fVar272;
    auVar288._28_4_ = fVar157 + 0.0 + 0.0;
    auVar7 = vpermilps_avx(auVar247,0xff);
    register0x00001450 = auVar7;
    _local_a0 = auVar7;
    fVar299 = auVar7._0_4_;
    fVar307 = auVar7._4_4_;
    fVar308 = auVar7._8_4_;
    fVar132 = fVar299 * fVar294 + fVar343 * fVar243 + fVar285 * fVar186 + fVar224 * fVar260;
    fVar150 = fVar307 * fVar220 + fVar345 * fVar254 + fVar290 * fVar201 + fVar236 * fVar267;
    fVar154 = fVar308 * fVar283 + fVar346 * fVar255 + fVar293 * fVar202 + fVar239 * fVar268;
    fVar158 = auVar7._12_4_ * fVar295 +
              fVar351 * fVar256 + auVar11._12_4_ * fVar203 + fVar242 * fVar269;
    fVar161 = fVar299 * fStack_550 + fVar343 * fVar257 + fVar285 * fVar204 + fVar224 * fVar270;
    fVar164 = fVar307 * fStack_54c + fVar345 * fVar258 + fVar290 * fVar206 + fVar236 * fVar271;
    fVar167 = fVar308 * fStack_548 + fVar346 * fVar259 + fVar293 * fVar207 + fVar239 * fVar272;
    fVar169 = *(float *)(bspline_basis0 + lVar126 + 0x924) + 0.0 + 0.0 + 0.0;
    fVar296 = *(float *)(bspline_basis1 + lVar126 + 0x908);
    fVar221 = *(float *)(bspline_basis1 + lVar126 + 0x90c);
    fVar284 = *(float *)(bspline_basis1 + lVar126 + 0x910);
    fVar297 = *(float *)(bspline_basis1 + lVar126 + 0x914);
    fVar298 = *(float *)(bspline_basis1 + lVar126 + 0x918);
    fVar222 = *(float *)(bspline_basis1 + lVar126 + 0x91c);
    fVar208 = *(float *)(bspline_basis1 + lVar126 + 0x920);
    fVar186 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar126 + 0xd8c);
    fVar201 = *(float *)(bspline_basis1 + lVar126 + 0xd90);
    fVar202 = *(float *)(bspline_basis1 + lVar126 + 0xd94);
    fVar203 = *(float *)(bspline_basis1 + lVar126 + 0xd98);
    fVar204 = *(float *)(bspline_basis1 + lVar126 + 0xd9c);
    fVar206 = *(float *)(bspline_basis1 + lVar126 + 0xda0);
    fVar207 = *(float *)(bspline_basis1 + lVar126 + 0xda4);
    auVar120 = *(undefined1 (*) [28])(bspline_basis1 + lVar126 + 0xd8c);
    fVar286 = *(float *)(bspline_basis1 + lVar126 + 0x484);
    fVar151 = *(float *)(bspline_basis1 + lVar126 + 0x488);
    fVar155 = *(float *)(bspline_basis1 + lVar126 + 0x48c);
    fVar159 = *(float *)(bspline_basis1 + lVar126 + 0x490);
    fVar162 = *(float *)(bspline_basis1 + lVar126 + 0x494);
    fVar165 = *(float *)(bspline_basis1 + lVar126 + 0x498);
    fVar133 = *(float *)(bspline_basis1 + lVar126 + 0x49c);
    fVar243 = fVar344 + fVar291 + 0.0;
    fVar152 = *(float *)(bspline_basis1 + lVar126);
    fVar156 = *(float *)(bspline_basis1 + lVar126 + 4);
    fVar160 = *(float *)(bspline_basis1 + lVar126 + 8);
    fVar163 = *(float *)(bspline_basis1 + lVar126 + 0xc);
    fVar166 = *(float *)(bspline_basis1 + lVar126 + 0x10);
    fVar168 = *(float *)(bspline_basis1 + lVar126 + 0x14);
    fVar170 = *(float *)(bspline_basis1 + lVar126 + 0x18);
    auVar229._0_4_ = fVar223 * fVar152 + fVar310 * fVar286 + fVar296 * fVar309 + fVar335 * fVar186;
    auVar229._4_4_ = fVar235 * fVar156 + fVar316 * fVar151 + fVar221 * fVar315 + fVar341 * fVar201;
    auVar229._8_4_ = fVar238 * fVar160 + fVar318 * fVar155 + fVar284 * fVar317 + fVar342 * fVar202;
    auVar229._12_4_ = fVar241 * fVar163 + fVar320 * fVar159 + fVar297 * fVar319 + fVar344 * fVar203;
    auVar229._16_4_ = fVar223 * fVar166 + fVar310 * fVar162 + fVar298 * fVar309 + fVar335 * fVar204;
    auVar229._20_4_ = fVar235 * fVar168 + fVar316 * fVar165 + fVar222 * fVar315 + fVar341 * fVar206;
    auVar229._24_4_ = fVar238 * fVar170 + fVar318 * fVar133 + fVar208 * fVar317 + fVar342 * fVar207;
    auVar229._28_4_ = fVar351 + fVar243;
    auVar214._0_4_ = fVar321 * fVar152 + fVar131 * fVar286 + fVar296 * fVar273 + fVar354 * fVar186;
    auVar214._4_4_ = fVar324 * fVar156 + fVar149 * fVar151 + fVar221 * fVar234 + fVar358 * fVar201;
    auVar214._8_4_ = fVar325 * fVar160 + fVar153 * fVar155 + fVar284 * fVar237 + fVar359 * fVar202;
    auVar214._12_4_ = fVar326 * fVar163 + fVar157 * fVar159 + fVar297 * fVar240 + fVar360 * fVar203;
    auVar214._16_4_ = fVar321 * fVar166 + fVar131 * fVar162 + fVar298 * fVar273 + fVar354 * fVar204;
    auVar214._20_4_ = fVar324 * fVar168 + fVar149 * fVar165 + fVar222 * fVar234 + fVar358 * fVar206;
    auVar214._24_4_ = fVar325 * fVar170 + fVar153 * fVar133 + fVar208 * fVar237 + fVar359 * fVar207;
    auVar214._28_4_ = fVar243 + fVar344 + fVar291 + 0.0;
    auVar355._0_4_ = fVar343 * fVar286 + fVar296 * fVar285 + fVar224 * fVar186 + fVar299 * fVar152;
    auVar355._4_4_ = fVar345 * fVar151 + fVar221 * fVar290 + fVar236 * fVar201 + fVar307 * fVar156;
    auVar355._8_4_ = fVar346 * fVar155 + fVar284 * fVar293 + fVar239 * fVar202 + fVar308 * fVar160;
    auVar355._12_4_ =
         fVar351 * fVar159 + fVar297 * auVar11._12_4_ + fVar242 * fVar203 + auVar7._12_4_ * fVar163;
    auVar355._16_4_ = fVar343 * fVar162 + fVar298 * fVar285 + fVar224 * fVar204 + fVar299 * fVar166;
    auVar355._20_4_ = fVar345 * fVar165 + fVar222 * fVar290 + fVar236 * fVar206 + fVar307 * fVar168;
    auVar355._24_4_ = fVar346 * fVar133 + fVar208 * fVar293 + fVar239 * fVar207 + fVar308 * fVar170;
    auVar355._28_4_ = fVar344 + fVar242 + fVar291 + fVar243;
    auVar21 = vsubps_avx(auVar229,auVar329);
    auVar22 = vsubps_avx(auVar214,auVar288);
    fVar186 = auVar21._0_4_;
    fVar202 = auVar21._4_4_;
    auVar27._4_4_ = auVar288._4_4_ * fVar202;
    auVar27._0_4_ = auVar288._0_4_ * fVar186;
    fVar204 = auVar21._8_4_;
    auVar27._8_4_ = auVar288._8_4_ * fVar204;
    fVar207 = auVar21._12_4_;
    auVar27._12_4_ = auVar288._12_4_ * fVar207;
    fVar254 = auVar21._16_4_;
    auVar27._16_4_ = auVar288._16_4_ * fVar254;
    fVar256 = auVar21._20_4_;
    auVar27._20_4_ = auVar288._20_4_ * fVar256;
    fVar258 = auVar21._24_4_;
    auVar27._24_4_ = auVar288._24_4_ * fVar258;
    auVar27._28_4_ = fVar243;
    fVar201 = auVar22._0_4_;
    fVar203 = auVar22._4_4_;
    auVar28._4_4_ = auVar327._4_4_ * fVar203;
    auVar28._0_4_ = auVar327._0_4_ * fVar201;
    fVar206 = auVar22._8_4_;
    auVar28._8_4_ = auVar327._8_4_ * fVar206;
    fVar243 = auVar22._12_4_;
    auVar28._12_4_ = auVar327._12_4_ * fVar243;
    fVar255 = auVar22._16_4_;
    auVar28._16_4_ = auVar329._16_4_ * fVar255;
    fVar257 = auVar22._20_4_;
    auVar28._20_4_ = auVar329._20_4_ * fVar257;
    fVar259 = auVar22._24_4_;
    auVar28._24_4_ = auVar329._24_4_ * fVar259;
    auVar28._28_4_ = auVar214._28_4_;
    auVar20 = vsubps_avx(auVar27,auVar28);
    auVar110._4_4_ = fVar150;
    auVar110._0_4_ = fVar132;
    auVar110._8_4_ = fVar154;
    auVar110._12_4_ = fVar158;
    auVar110._16_4_ = fVar161;
    auVar110._20_4_ = fVar164;
    auVar110._24_4_ = fVar167;
    auVar110._28_4_ = fVar169;
    auVar19 = vmaxps_avx(auVar110,auVar355);
    auVar29._4_4_ = auVar19._4_4_ * auVar19._4_4_ * (fVar202 * fVar202 + fVar203 * fVar203);
    auVar29._0_4_ = auVar19._0_4_ * auVar19._0_4_ * (fVar186 * fVar186 + fVar201 * fVar201);
    auVar29._8_4_ = auVar19._8_4_ * auVar19._8_4_ * (fVar204 * fVar204 + fVar206 * fVar206);
    auVar29._12_4_ = auVar19._12_4_ * auVar19._12_4_ * (fVar207 * fVar207 + fVar243 * fVar243);
    auVar29._16_4_ = auVar19._16_4_ * auVar19._16_4_ * (fVar254 * fVar254 + fVar255 * fVar255);
    auVar29._20_4_ = auVar19._20_4_ * auVar19._20_4_ * (fVar256 * fVar256 + fVar257 * fVar257);
    auVar29._24_4_ = auVar19._24_4_ * auVar19._24_4_ * (fVar258 * fVar258 + fVar259 * fVar259);
    auVar29._28_4_ = auVar229._28_4_ + auVar214._28_4_;
    auVar30._4_4_ = auVar20._4_4_ * auVar20._4_4_;
    auVar30._0_4_ = auVar20._0_4_ * auVar20._0_4_;
    auVar30._8_4_ = auVar20._8_4_ * auVar20._8_4_;
    auVar30._12_4_ = auVar20._12_4_ * auVar20._12_4_;
    auVar30._16_4_ = auVar20._16_4_ * auVar20._16_4_;
    auVar30._20_4_ = auVar20._20_4_ * auVar20._20_4_;
    auVar30._24_4_ = auVar20._24_4_ * auVar20._24_4_;
    auVar30._28_4_ = auVar20._28_4_;
    auVar227._0_4_ = (float)(int)uVar15;
    auVar227._4_12_ = auVar327._4_12_;
    auVar19 = vcmpps_avx(auVar30,auVar29,2);
    local_500._0_16_ = auVar227;
    auVar7 = vshufps_avx(auVar227,auVar227,0);
    auVar215._16_16_ = auVar7;
    auVar215._0_16_ = auVar7;
    auVar20 = vcmpps_avx(_DAT_01f7b060,auVar215,1);
    auVar219 = ZEXT3264(auVar20);
    auVar7 = vpermilps_avx(auVar173,0xaa);
    register0x00001450 = auVar7;
    _local_580 = auVar7;
    auVar8 = vpermilps_avx(auVar246,0xaa);
    register0x00001550 = auVar8;
    _local_320 = auVar8;
    auVar9 = vpermilps_avx(auVar287,0xaa);
    register0x00001590 = auVar9;
    _local_c0 = auVar9;
    auVar10 = vpermilps_avx(auVar300,0xaa);
    register0x00001310 = auVar10;
    _local_4a0 = auVar10;
    auVar23 = auVar20 & auVar19;
    uVar6 = *(uint *)(ray + k * 4 + 0x30);
    fStack_51c = 0.0;
    fStack_518 = 0.0;
    fStack_514 = 0.0;
    auVar135 = ZEXT416((uint)(auVar135._0_4_ * 4.7683716e-07));
    local_830._0_4_ = auVar247._0_4_;
    fVar186 = (float)local_830;
    local_830._4_4_ = auVar247._4_4_;
    fVar201 = local_830._4_4_;
    uStack_828._0_4_ = auVar247._8_4_;
    fVar202 = (float)uStack_828;
    uStack_828._4_4_ = auVar247._12_4_;
    fVar203 = uStack_828._4_4_;
    local_830 = auVar247._0_8_;
    uStack_828 = auVar247._8_8_;
    local_870 = auVar189._0_4_;
    fStack_86c = auVar189._4_4_;
    fStack_868 = auVar189._8_4_;
    fStack_864 = auVar189._12_4_;
    local_880 = auVar205._0_4_;
    fStack_87c = auVar205._4_4_;
    fStack_878 = auVar205._8_4_;
    fStack_874 = auVar205._12_4_;
    local_7d0 = auVar210._0_4_;
    fStack_7cc = auVar210._4_4_;
    fStack_7c8 = auVar210._8_4_;
    fStack_7c4 = auVar210._12_4_;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0x7f,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar23 >> 0xbf,0) == '\0') &&
        (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f]) {
      bVar124 = 0;
      auVar340 = ZEXT3264(auVar337);
      auVar306 = ZEXT3264(auVar137);
      auVar334 = ZEXT3264(_local_720);
    }
    else {
      _local_360 = vandps_avx(auVar19,auVar20);
      fVar285 = auVar7._0_4_;
      fVar290 = auVar7._4_4_;
      fVar293 = auVar7._8_4_;
      fVar299 = auVar7._12_4_;
      fVar307 = auVar8._0_4_;
      fVar308 = auVar8._4_4_;
      fVar343 = auVar8._8_4_;
      fVar345 = auVar8._12_4_;
      fVar346 = auVar9._0_4_;
      fVar351 = auVar9._4_4_;
      fVar352 = auVar9._8_4_;
      fVar353 = auVar9._12_4_;
      local_5c0._0_4_ = auVar120._0_4_;
      local_5c0._4_4_ = auVar120._4_4_;
      fStack_5b8 = auVar120._8_4_;
      fStack_5b4 = auVar120._12_4_;
      fStack_5b0 = auVar120._16_4_;
      fStack_5ac = auVar120._20_4_;
      fStack_5a8 = auVar120._24_4_;
      fVar224 = auVar10._0_4_;
      fVar236 = auVar10._4_4_;
      fVar239 = auVar10._8_4_;
      fVar242 = auVar10._12_4_;
      fVar204 = auVar20._28_4_ + *(float *)(bspline_basis1 + lVar126 + 0x924) + 0.0;
      local_760._0_16_ = auVar135;
      local_5c0._0_4_ =
           fVar285 * fVar152 +
           fVar307 * fVar286 + fVar346 * fVar296 + fVar224 * (float)local_5c0._0_4_;
      local_5c0._4_4_ =
           fVar290 * fVar156 +
           fVar308 * fVar151 + fVar351 * fVar221 + fVar236 * (float)local_5c0._4_4_;
      fStack_5b8 = fVar293 * fVar160 + fVar343 * fVar155 + fVar352 * fVar284 + fVar239 * fStack_5b8;
      fStack_5b4 = fVar299 * fVar163 + fVar345 * fVar159 + fVar353 * fVar297 + fVar242 * fStack_5b4;
      fStack_5b0 = fVar285 * fVar166 + fVar307 * fVar162 + fVar346 * fVar298 + fVar224 * fStack_5b0;
      fStack_5ac = fVar290 * fVar168 + fVar308 * fVar165 + fVar351 * fVar222 + fVar236 * fStack_5ac;
      fStack_5a8 = fVar293 * fVar170 + fVar343 * fVar133 + fVar352 * fVar208 + fVar239 * fStack_5a8;
      fStack_5a4 = local_360._28_4_ + fVar204;
      local_6a0._0_4_ = auVar119._0_4_;
      local_6a0._4_4_ = auVar119._4_4_;
      fStack_698 = auVar119._8_4_;
      fStack_694 = auVar119._12_4_;
      fStack_690 = auVar119._16_4_;
      fStack_68c = auVar119._20_4_;
      fStack_688 = auVar119._24_4_;
      local_5a0._0_4_ = auVar118._0_4_;
      local_5a0._4_4_ = auVar118._4_4_;
      fStack_598 = auVar118._8_4_;
      fStack_594 = auVar118._12_4_;
      fStack_590 = auVar118._16_4_;
      fStack_58c = auVar118._20_4_;
      fStack_588 = auVar118._24_4_;
      local_680 = fVar285 * fVar294 +
                  fVar307 * (float)local_6a0._0_4_ +
                  fVar346 * (float)local_5a0._0_4_ + fVar224 * fVar260;
      fStack_67c = fVar290 * fVar220 +
                   fVar308 * (float)local_6a0._4_4_ +
                   fVar351 * (float)local_5a0._4_4_ + fVar236 * fVar267;
      fStack_678 = fVar293 * fVar283 +
                   fVar343 * fStack_698 + fVar352 * fStack_598 + fVar239 * fVar268;
      fStack_674 = fVar299 * fVar295 +
                   fVar345 * fStack_694 + fVar353 * fStack_594 + fVar242 * fVar269;
      fStack_670 = fVar285 * fStack_550 +
                   fVar307 * fStack_690 + fVar346 * fStack_590 + fVar224 * fVar270;
      fStack_66c = fVar290 * fStack_54c +
                   fVar308 * fStack_68c + fVar351 * fStack_58c + fVar236 * fVar271;
      fStack_668 = fVar293 * fStack_548 +
                   fVar343 * fStack_688 + fVar352 * fStack_588 + fVar239 * fVar272;
      fStack_664 = fStack_5a4 + fVar204 + local_360._28_4_ + auVar20._28_4_;
      fVar204 = *(float *)(bspline_basis0 + lVar126 + 0x1210);
      fVar206 = *(float *)(bspline_basis0 + lVar126 + 0x1214);
      fVar207 = *(float *)(bspline_basis0 + lVar126 + 0x1218);
      fVar243 = *(float *)(bspline_basis0 + lVar126 + 0x121c);
      fVar254 = *(float *)(bspline_basis0 + lVar126 + 0x1220);
      fVar255 = *(float *)(bspline_basis0 + lVar126 + 0x1224);
      fVar256 = *(float *)(bspline_basis0 + lVar126 + 0x1228);
      fVar257 = *(float *)(bspline_basis0 + lVar126 + 0x1694);
      fVar258 = *(float *)(bspline_basis0 + lVar126 + 0x1698);
      fVar259 = *(float *)(bspline_basis0 + lVar126 + 0x169c);
      fVar260 = *(float *)(bspline_basis0 + lVar126 + 0x16a0);
      fVar267 = *(float *)(bspline_basis0 + lVar126 + 0x16a4);
      fVar268 = *(float *)(bspline_basis0 + lVar126 + 0x16a8);
      fVar269 = *(float *)(bspline_basis0 + lVar126 + 0x16ac);
      fVar270 = *(float *)(bspline_basis0 + lVar126 + 0x1b18);
      fVar271 = *(float *)(bspline_basis0 + lVar126 + 0x1b1c);
      fVar272 = *(float *)(bspline_basis0 + lVar126 + 0x1b20);
      fVar291 = *(float *)(bspline_basis0 + lVar126 + 0x1b24);
      fVar294 = *(float *)(bspline_basis0 + lVar126 + 0x1b28);
      fVar220 = *(float *)(bspline_basis0 + lVar126 + 0x1b2c);
      fVar283 = *(float *)(bspline_basis0 + lVar126 + 0x1b30);
      fVar295 = *(float *)(bspline_basis0 + lVar126 + 0x1f9c);
      fVar296 = *(float *)(bspline_basis0 + lVar126 + 0x1fa0);
      fVar221 = *(float *)(bspline_basis0 + lVar126 + 0x1fa4);
      fVar284 = *(float *)(bspline_basis0 + lVar126 + 0x1fa8);
      fVar297 = *(float *)(bspline_basis0 + lVar126 + 0x1fac);
      fVar298 = *(float *)(bspline_basis0 + lVar126 + 0x1fb0);
      fVar222 = *(float *)(bspline_basis0 + lVar126 + 0x1fb4);
      fVar208 = *(float *)(bspline_basis0 + lVar126 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar126 + 0x1fb8);
      fVar286 = *(float *)(bspline_basis0 + lVar126 + 0x16b0) + fVar208;
      local_560 = fVar223 * fVar204 + fVar310 * fVar257 + fVar309 * fVar270 + fVar335 * fVar295;
      fStack_55c = fVar235 * fVar206 + fVar316 * fVar258 + fVar315 * fVar271 + fVar341 * fVar296;
      fStack_558 = fVar238 * fVar207 + fVar318 * fVar259 + fVar317 * fVar272 + fVar342 * fVar221;
      fStack_554 = fVar241 * fVar243 + fVar320 * fVar260 + fVar319 * fVar291 + fVar344 * fVar284;
      fStack_550 = fVar223 * fVar254 + fVar310 * fVar267 + fVar309 * fVar294 + fVar335 * fVar297;
      fStack_54c = fVar235 * fVar255 + fVar316 * fVar268 + fVar315 * fVar220 + fVar341 * fVar298;
      fStack_548 = fVar238 * fVar256 + fVar318 * fVar269 + fVar317 * fVar283 + fVar342 * fVar222;
      fStack_544 = *(float *)(bspline_basis0 + lVar126 + 0x16b0) +
                   *(float *)(bspline_basis0 + lVar126 + 0x1fb8) +
                   fVar299 + *(float *)(bspline_basis1 + lVar126 + 0x4a0);
      auVar262._0_4_ = fVar321 * fVar204 + fVar131 * fVar257 + fVar273 * fVar270 + fVar354 * fVar295
      ;
      auVar262._4_4_ = fVar324 * fVar206 + fVar149 * fVar258 + fVar234 * fVar271 + fVar358 * fVar296
      ;
      auVar262._8_4_ = fVar325 * fVar207 + fVar153 * fVar259 + fVar237 * fVar272 + fVar359 * fVar221
      ;
      auVar262._12_4_ =
           fVar326 * fVar243 + fVar157 * fVar260 + fVar240 * fVar291 + fVar360 * fVar284;
      auVar262._16_4_ =
           fVar321 * fVar254 + fVar131 * fVar267 + fVar273 * fVar294 + fVar354 * fVar297;
      auVar262._20_4_ =
           fVar324 * fVar255 + fVar149 * fVar268 + fVar234 * fVar220 + fVar358 * fVar298;
      auVar262._24_4_ =
           fVar325 * fVar256 + fVar153 * fVar269 + fVar237 * fVar283 + fVar359 * fVar222;
      auVar262._28_4_ =
           fVar208 + fVar299 + *(float *)(bspline_basis1 + lVar126 + 0x4a0) +
                     fVar299 + *(float *)(bspline_basis1 + lVar126 + 0x1c);
      local_380._4_4_ =
           fVar290 * fVar206 + fVar308 * fVar258 + fVar351 * fVar271 + fVar236 * fVar296;
      local_380._0_4_ =
           fVar285 * fVar204 + fVar307 * fVar257 + fVar346 * fVar270 + fVar224 * fVar295;
      fStack_378 = fVar293 * fVar207 + fVar343 * fVar259 + fVar352 * fVar272 + fVar239 * fVar221;
      fStack_374 = fVar299 * fVar243 + fVar345 * fVar260 + fVar353 * fVar291 + fVar242 * fVar284;
      fStack_370 = fVar285 * fVar254 + fVar307 * fVar267 + fVar346 * fVar294 + fVar224 * fVar297;
      fStack_36c = fVar290 * fVar255 + fVar308 * fVar268 + fVar351 * fVar220 + fVar236 * fVar298;
      fStack_368 = fVar293 * fVar256 + fVar343 * fVar269 + fVar352 * fVar283 + fVar239 * fVar222;
      fStack_364 = *(float *)(bspline_basis0 + lVar126 + 0x122c) + fVar286;
      fVar204 = *(float *)(bspline_basis1 + lVar126 + 0x1b18);
      fVar206 = *(float *)(bspline_basis1 + lVar126 + 0x1b1c);
      fVar207 = *(float *)(bspline_basis1 + lVar126 + 0x1b20);
      fVar243 = *(float *)(bspline_basis1 + lVar126 + 0x1b24);
      fVar254 = *(float *)(bspline_basis1 + lVar126 + 0x1b28);
      fVar255 = *(float *)(bspline_basis1 + lVar126 + 0x1b2c);
      fVar256 = *(float *)(bspline_basis1 + lVar126 + 0x1b30);
      fVar257 = *(float *)(bspline_basis1 + lVar126 + 0x1f9c);
      fVar258 = *(float *)(bspline_basis1 + lVar126 + 0x1fa0);
      fVar259 = *(float *)(bspline_basis1 + lVar126 + 0x1fa4);
      fVar260 = *(float *)(bspline_basis1 + lVar126 + 0x1fa8);
      fVar267 = *(float *)(bspline_basis1 + lVar126 + 0x1fac);
      fVar268 = *(float *)(bspline_basis1 + lVar126 + 0x1fb0);
      fVar269 = *(float *)(bspline_basis1 + lVar126 + 0x1fb4);
      fVar270 = *(float *)(bspline_basis1 + lVar126 + 0x1694);
      fVar271 = *(float *)(bspline_basis1 + lVar126 + 0x1698);
      fVar272 = *(float *)(bspline_basis1 + lVar126 + 0x169c);
      fVar291 = *(float *)(bspline_basis1 + lVar126 + 0x16a0);
      fVar294 = *(float *)(bspline_basis1 + lVar126 + 0x16a4);
      fVar220 = *(float *)(bspline_basis1 + lVar126 + 0x16a8);
      fVar283 = *(float *)(bspline_basis1 + lVar126 + 0x16ac);
      fVar295 = *(float *)(bspline_basis1 + lVar126 + 0x1210);
      fVar296 = *(float *)(bspline_basis1 + lVar126 + 0x1214);
      fVar221 = *(float *)(bspline_basis1 + lVar126 + 0x1218);
      fVar284 = *(float *)(bspline_basis1 + lVar126 + 0x121c);
      fVar297 = *(float *)(bspline_basis1 + lVar126 + 0x1220);
      fVar298 = *(float *)(bspline_basis1 + lVar126 + 0x1224);
      fVar222 = *(float *)(bspline_basis1 + lVar126 + 0x1228);
      auVar281._0_4_ = fVar223 * fVar295 + fVar310 * fVar270 + fVar309 * fVar204 + fVar335 * fVar257
      ;
      auVar281._4_4_ = fVar235 * fVar296 + fVar316 * fVar271 + fVar315 * fVar206 + fVar341 * fVar258
      ;
      auVar281._8_4_ = fVar238 * fVar221 + fVar318 * fVar272 + fVar317 * fVar207 + fVar342 * fVar259
      ;
      auVar281._12_4_ =
           fVar241 * fVar284 + fVar320 * fVar291 + fVar319 * fVar243 + fVar344 * fVar260;
      auVar281._16_4_ =
           fVar223 * fVar297 + fVar310 * fVar294 + fVar309 * fVar254 + fVar335 * fVar267;
      auVar281._20_4_ =
           fVar235 * fVar298 + fVar316 * fVar220 + fVar315 * fVar255 + fVar341 * fVar268;
      auVar281._24_4_ =
           fVar238 * fVar222 + fVar318 * fVar283 + fVar317 * fVar256 + fVar342 * fVar269;
      auVar281._28_4_ = fVar319 + fVar319 + fVar299 + fVar286;
      auVar302._0_4_ = fVar321 * fVar295 + fVar131 * fVar270 + fVar273 * fVar204 + fVar354 * fVar257
      ;
      auVar302._4_4_ = fVar324 * fVar296 + fVar149 * fVar271 + fVar234 * fVar206 + fVar358 * fVar258
      ;
      auVar302._8_4_ = fVar325 * fVar221 + fVar153 * fVar272 + fVar237 * fVar207 + fVar359 * fVar259
      ;
      auVar302._12_4_ =
           fVar326 * fVar284 + fVar157 * fVar291 + fVar240 * fVar243 + fVar360 * fVar260;
      auVar302._16_4_ =
           fVar321 * fVar297 + fVar131 * fVar294 + fVar273 * fVar254 + fVar354 * fVar267;
      auVar302._20_4_ =
           fVar324 * fVar298 + fVar149 * fVar220 + fVar234 * fVar255 + fVar358 * fVar268;
      auVar302._24_4_ =
           fVar325 * fVar222 + fVar153 * fVar283 + fVar237 * fVar256 + fVar359 * fVar269;
      auVar302._28_4_ = fVar319 + fVar319 + fVar319 + fVar299;
      auVar198._0_4_ = fVar285 * fVar295 + fVar307 * fVar270 + fVar346 * fVar204 + fVar257 * fVar224
      ;
      auVar198._4_4_ = fVar290 * fVar296 + fVar308 * fVar271 + fVar351 * fVar206 + fVar258 * fVar236
      ;
      auVar198._8_4_ = fVar293 * fVar221 + fVar343 * fVar272 + fVar352 * fVar207 + fVar259 * fVar239
      ;
      auVar198._12_4_ =
           fVar299 * fVar284 + fVar345 * fVar291 + fVar353 * fVar243 + fVar260 * fVar242;
      auVar198._16_4_ =
           fVar285 * fVar297 + fVar307 * fVar294 + fVar346 * fVar254 + fVar267 * fVar224;
      auVar198._20_4_ =
           fVar290 * fVar298 + fVar308 * fVar220 + fVar351 * fVar255 + fVar268 * fVar236;
      auVar198._24_4_ =
           fVar293 * fVar222 + fVar343 * fVar283 + fVar352 * fVar256 + fVar269 * fVar239;
      auVar198._28_4_ =
           *(float *)(bspline_basis1 + lVar126 + 0x122c) +
           *(float *)(bspline_basis1 + lVar126 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar126 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar126 + 0x1fb8);
      auVar230._8_4_ = 0x7fffffff;
      auVar230._0_8_ = 0x7fffffff7fffffff;
      auVar230._12_4_ = 0x7fffffff;
      auVar230._16_4_ = 0x7fffffff;
      auVar230._20_4_ = 0x7fffffff;
      auVar230._24_4_ = 0x7fffffff;
      auVar230._28_4_ = 0x7fffffff;
      auVar115._4_4_ = fStack_55c;
      auVar115._0_4_ = local_560;
      auVar115._8_4_ = fStack_558;
      auVar115._12_4_ = fStack_554;
      auVar115._16_4_ = fStack_550;
      auVar115._20_4_ = fStack_54c;
      auVar115._24_4_ = fStack_548;
      auVar115._28_4_ = fStack_544;
      auVar19 = vandps_avx(auVar115,auVar230);
      auVar20 = vandps_avx(auVar262,auVar230);
      auVar20 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vandps_avx(auVar230,_local_380);
      auVar19 = vmaxps_avx(auVar20,auVar19);
      auVar247 = vpermilps_avx(auVar135,0);
      auVar263._16_16_ = auVar247;
      auVar263._0_16_ = auVar247;
      auVar19 = vcmpps_avx(auVar19,auVar263,1);
      auVar23 = vblendvps_avx(auVar115,auVar21,auVar19);
      auVar24 = vblendvps_avx(auVar262,auVar22,auVar19);
      auVar19 = vandps_avx(auVar281,auVar230);
      auVar20 = vandps_avx(auVar302,auVar230);
      auVar25 = vmaxps_avx(auVar19,auVar20);
      auVar19 = vandps_avx(auVar198,auVar230);
      auVar19 = vmaxps_avx(auVar25,auVar19);
      auVar25 = vcmpps_avx(auVar19,auVar263,1);
      auVar19 = vblendvps_avx(auVar281,auVar21,auVar25);
      auVar21 = vblendvps_avx(auVar302,auVar22,auVar25);
      fVar286 = auVar23._0_4_;
      fVar151 = auVar23._4_4_;
      fVar155 = auVar23._8_4_;
      fVar159 = auVar23._12_4_;
      fVar162 = auVar23._16_4_;
      fVar165 = auVar23._20_4_;
      fVar133 = auVar23._24_4_;
      fVar152 = auVar19._0_4_;
      fVar156 = auVar19._4_4_;
      fVar160 = auVar19._8_4_;
      fVar163 = auVar19._12_4_;
      fVar166 = auVar19._16_4_;
      fVar168 = auVar19._20_4_;
      fVar170 = auVar19._24_4_;
      fVar273 = -auVar19._28_4_;
      fVar204 = auVar24._0_4_;
      fVar254 = auVar24._4_4_;
      fVar258 = auVar24._8_4_;
      fVar268 = auVar24._12_4_;
      fVar272 = auVar24._16_4_;
      fVar283 = auVar24._20_4_;
      fVar284 = auVar24._24_4_;
      auVar141._0_4_ = fVar204 * fVar204 + fVar286 * fVar286;
      auVar141._4_4_ = fVar254 * fVar254 + fVar151 * fVar151;
      auVar141._8_4_ = fVar258 * fVar258 + fVar155 * fVar155;
      auVar141._12_4_ = fVar268 * fVar268 + fVar159 * fVar159;
      auVar141._16_4_ = fVar272 * fVar272 + fVar162 * fVar162;
      auVar141._20_4_ = fVar283 * fVar283 + fVar165 * fVar165;
      auVar141._24_4_ = fVar284 * fVar284 + fVar133 * fVar133;
      auVar141._28_4_ = auVar302._28_4_ + auVar23._28_4_;
      auVar22 = vrsqrtps_avx(auVar141);
      fVar206 = auVar22._0_4_;
      fVar207 = auVar22._4_4_;
      auVar31._4_4_ = fVar207 * 1.5;
      auVar31._0_4_ = fVar206 * 1.5;
      fVar243 = auVar22._8_4_;
      auVar31._8_4_ = fVar243 * 1.5;
      fVar255 = auVar22._12_4_;
      auVar31._12_4_ = fVar255 * 1.5;
      fVar256 = auVar22._16_4_;
      auVar31._16_4_ = fVar256 * 1.5;
      fVar257 = auVar22._20_4_;
      auVar31._20_4_ = fVar257 * 1.5;
      fVar259 = auVar22._24_4_;
      fVar208 = auVar20._28_4_;
      auVar31._24_4_ = fVar259 * 1.5;
      auVar31._28_4_ = fVar208;
      auVar32._4_4_ = fVar207 * fVar207 * fVar207 * auVar141._4_4_ * 0.5;
      auVar32._0_4_ = fVar206 * fVar206 * fVar206 * auVar141._0_4_ * 0.5;
      auVar32._8_4_ = fVar243 * fVar243 * fVar243 * auVar141._8_4_ * 0.5;
      auVar32._12_4_ = fVar255 * fVar255 * fVar255 * auVar141._12_4_ * 0.5;
      auVar32._16_4_ = fVar256 * fVar256 * fVar256 * auVar141._16_4_ * 0.5;
      auVar32._20_4_ = fVar257 * fVar257 * fVar257 * auVar141._20_4_ * 0.5;
      auVar32._24_4_ = fVar259 * fVar259 * fVar259 * auVar141._24_4_ * 0.5;
      auVar32._28_4_ = auVar141._28_4_;
      auVar20 = vsubps_avx(auVar31,auVar32);
      fVar206 = auVar20._0_4_;
      fVar255 = auVar20._4_4_;
      fVar259 = auVar20._8_4_;
      fVar269 = auVar20._12_4_;
      fVar291 = auVar20._16_4_;
      fVar295 = auVar20._20_4_;
      fVar297 = auVar20._24_4_;
      fVar207 = auVar21._0_4_;
      fVar256 = auVar21._4_4_;
      fVar260 = auVar21._8_4_;
      fVar270 = auVar21._12_4_;
      fVar294 = auVar21._16_4_;
      fVar296 = auVar21._20_4_;
      fVar298 = auVar21._24_4_;
      auVar142._0_4_ = fVar207 * fVar207 + fVar152 * fVar152;
      auVar142._4_4_ = fVar256 * fVar256 + fVar156 * fVar156;
      auVar142._8_4_ = fVar260 * fVar260 + fVar160 * fVar160;
      auVar142._12_4_ = fVar270 * fVar270 + fVar163 * fVar163;
      auVar142._16_4_ = fVar294 * fVar294 + fVar166 * fVar166;
      auVar142._20_4_ = fVar296 * fVar296 + fVar168 * fVar168;
      auVar142._24_4_ = fVar298 * fVar298 + fVar170 * fVar170;
      auVar142._28_4_ = auVar19._28_4_ + auVar20._28_4_;
      auVar19 = vrsqrtps_avx(auVar142);
      fVar243 = auVar19._0_4_;
      fVar257 = auVar19._4_4_;
      auVar33._4_4_ = fVar257 * 1.5;
      auVar33._0_4_ = fVar243 * 1.5;
      fVar267 = auVar19._8_4_;
      auVar33._8_4_ = fVar267 * 1.5;
      fVar271 = auVar19._12_4_;
      auVar33._12_4_ = fVar271 * 1.5;
      fVar220 = auVar19._16_4_;
      auVar33._16_4_ = fVar220 * 1.5;
      fVar221 = auVar19._20_4_;
      auVar33._20_4_ = fVar221 * 1.5;
      fVar222 = auVar19._24_4_;
      auVar33._24_4_ = fVar222 * 1.5;
      auVar33._28_4_ = fVar208;
      auVar34._4_4_ = fVar257 * fVar257 * fVar257 * auVar142._4_4_ * 0.5;
      auVar34._0_4_ = fVar243 * fVar243 * fVar243 * auVar142._0_4_ * 0.5;
      auVar34._8_4_ = fVar267 * fVar267 * fVar267 * auVar142._8_4_ * 0.5;
      auVar34._12_4_ = fVar271 * fVar271 * fVar271 * auVar142._12_4_ * 0.5;
      auVar34._16_4_ = fVar220 * fVar220 * fVar220 * auVar142._16_4_ * 0.5;
      auVar34._20_4_ = fVar221 * fVar221 * fVar221 * auVar142._20_4_ * 0.5;
      auVar34._24_4_ = fVar222 * fVar222 * fVar222 * auVar142._24_4_ * 0.5;
      auVar34._28_4_ = auVar142._28_4_;
      auVar19 = vsubps_avx(auVar33,auVar34);
      fVar243 = auVar19._0_4_;
      fVar257 = auVar19._4_4_;
      fVar267 = auVar19._8_4_;
      fVar271 = auVar19._12_4_;
      fVar220 = auVar19._16_4_;
      fVar221 = auVar19._20_4_;
      fVar222 = auVar19._24_4_;
      fVar204 = fVar132 * fVar204 * fVar206;
      fVar254 = fVar150 * fVar254 * fVar255;
      auVar35._4_4_ = fVar254;
      auVar35._0_4_ = fVar204;
      fVar258 = fVar154 * fVar258 * fVar259;
      auVar35._8_4_ = fVar258;
      fVar268 = fVar158 * fVar268 * fVar269;
      auVar35._12_4_ = fVar268;
      fVar272 = fVar161 * fVar272 * fVar291;
      auVar35._16_4_ = fVar272;
      fVar283 = fVar164 * fVar283 * fVar295;
      auVar35._20_4_ = fVar283;
      fVar284 = fVar167 * fVar284 * fVar297;
      auVar35._24_4_ = fVar284;
      auVar35._28_4_ = fVar273;
      local_660._4_4_ = auVar327._4_4_ + fVar254;
      local_660._0_4_ = auVar327._0_4_ + fVar204;
      fStack_658 = auVar327._8_4_ + fVar258;
      fStack_654 = auVar327._12_4_ + fVar268;
      fStack_650 = auVar329._16_4_ + fVar272;
      fStack_64c = auVar329._20_4_ + fVar283;
      fStack_648 = auVar329._24_4_ + fVar284;
      fStack_644 = auVar329._28_4_ + fVar273;
      fVar204 = fVar132 * fVar206 * -fVar286;
      fVar254 = fVar150 * fVar255 * -fVar151;
      auVar36._4_4_ = fVar254;
      auVar36._0_4_ = fVar204;
      fVar258 = fVar154 * fVar259 * -fVar155;
      auVar36._8_4_ = fVar258;
      fVar268 = fVar158 * fVar269 * -fVar159;
      auVar36._12_4_ = fVar268;
      fVar272 = fVar161 * fVar291 * -fVar162;
      auVar36._16_4_ = fVar272;
      fVar283 = fVar164 * fVar295 * -fVar165;
      auVar36._20_4_ = fVar283;
      fVar284 = fVar167 * fVar297 * -fVar133;
      auVar36._24_4_ = fVar284;
      auVar36._28_4_ = fVar208;
      local_6a0._4_4_ = fVar254 + auVar288._4_4_;
      local_6a0._0_4_ = fVar204 + auVar288._0_4_;
      fStack_698 = fVar258 + auVar288._8_4_;
      fStack_694 = fVar268 + auVar288._12_4_;
      fStack_690 = fVar272 + auVar288._16_4_;
      fStack_68c = fVar283 + auVar288._20_4_;
      fStack_688 = fVar284 + auVar288._24_4_;
      fStack_684 = fVar208 + auVar288._28_4_;
      fVar204 = fVar206 * 0.0 * fVar132;
      fVar206 = fVar255 * 0.0 * fVar150;
      auVar37._4_4_ = fVar206;
      auVar37._0_4_ = fVar204;
      fVar254 = fVar259 * 0.0 * fVar154;
      auVar37._8_4_ = fVar254;
      fVar255 = fVar269 * 0.0 * fVar158;
      auVar37._12_4_ = fVar255;
      fVar258 = fVar291 * 0.0 * fVar161;
      auVar37._16_4_ = fVar258;
      fVar259 = fVar295 * 0.0 * fVar164;
      auVar37._20_4_ = fVar259;
      fVar268 = fVar297 * 0.0 * fVar167;
      auVar37._24_4_ = fVar268;
      auVar37._28_4_ = fVar157;
      auVar112._4_4_ = fStack_67c;
      auVar112._0_4_ = local_680;
      auVar112._8_4_ = fStack_678;
      auVar112._12_4_ = fStack_674;
      auVar112._16_4_ = fStack_670;
      auVar112._20_4_ = fStack_66c;
      auVar112._24_4_ = fStack_668;
      auVar112._28_4_ = fStack_664;
      auVar264._0_4_ = fVar204 + local_680;
      auVar264._4_4_ = fVar206 + fStack_67c;
      auVar264._8_4_ = fVar254 + fStack_678;
      auVar264._12_4_ = fVar255 + fStack_674;
      auVar264._16_4_ = fVar258 + fStack_670;
      auVar264._20_4_ = fVar259 + fStack_66c;
      auVar264._24_4_ = fVar268 + fStack_668;
      auVar264._28_4_ = fVar157 + fStack_664;
      fVar204 = auVar355._0_4_ * fVar207 * fVar243;
      fVar206 = auVar355._4_4_ * fVar256 * fVar257;
      auVar38._4_4_ = fVar206;
      auVar38._0_4_ = fVar204;
      fVar207 = auVar355._8_4_ * fVar260 * fVar267;
      auVar38._8_4_ = fVar207;
      fVar254 = auVar355._12_4_ * fVar270 * fVar271;
      auVar38._12_4_ = fVar254;
      fVar255 = auVar355._16_4_ * fVar294 * fVar220;
      auVar38._16_4_ = fVar255;
      fVar256 = auVar355._20_4_ * fVar296 * fVar221;
      auVar38._20_4_ = fVar256;
      fVar258 = auVar355._24_4_ * fVar298 * fVar222;
      auVar38._24_4_ = fVar258;
      auVar38._28_4_ = auVar21._28_4_;
      auVar24 = vsubps_avx(auVar329,auVar35);
      auVar303._0_4_ = auVar229._0_4_ + fVar204;
      auVar303._4_4_ = auVar229._4_4_ + fVar206;
      auVar303._8_4_ = auVar229._8_4_ + fVar207;
      auVar303._12_4_ = auVar229._12_4_ + fVar254;
      auVar303._16_4_ = auVar229._16_4_ + fVar255;
      auVar303._20_4_ = auVar229._20_4_ + fVar256;
      auVar303._24_4_ = auVar229._24_4_ + fVar258;
      auVar303._28_4_ = auVar229._28_4_ + auVar21._28_4_;
      fVar204 = auVar355._0_4_ * fVar243 * -fVar152;
      fVar206 = auVar355._4_4_ * fVar257 * -fVar156;
      auVar39._4_4_ = fVar206;
      auVar39._0_4_ = fVar204;
      fVar207 = auVar355._8_4_ * fVar267 * -fVar160;
      auVar39._8_4_ = fVar207;
      fVar254 = auVar355._12_4_ * fVar271 * -fVar163;
      auVar39._12_4_ = fVar254;
      fVar255 = auVar355._16_4_ * fVar220 * -fVar166;
      auVar39._16_4_ = fVar255;
      fVar256 = auVar355._20_4_ * fVar221 * -fVar168;
      auVar39._20_4_ = fVar256;
      fVar258 = auVar355._24_4_ * fVar222 * -fVar170;
      auVar39._24_4_ = fVar258;
      auVar39._28_4_ = fVar345;
      auVar25 = vsubps_avx(auVar288,auVar36);
      auVar313._0_4_ = fVar204 + auVar214._0_4_;
      auVar313._4_4_ = fVar206 + auVar214._4_4_;
      auVar313._8_4_ = fVar207 + auVar214._8_4_;
      auVar313._12_4_ = fVar254 + auVar214._12_4_;
      auVar313._16_4_ = fVar255 + auVar214._16_4_;
      auVar313._20_4_ = fVar256 + auVar214._20_4_;
      auVar313._24_4_ = fVar258 + auVar214._24_4_;
      auVar313._28_4_ = fVar345 + auVar214._28_4_;
      fVar204 = auVar355._0_4_ * fVar243 * 0.0;
      fVar206 = auVar355._4_4_ * fVar257 * 0.0;
      auVar40._4_4_ = fVar206;
      auVar40._0_4_ = fVar204;
      fVar207 = auVar355._8_4_ * fVar267 * 0.0;
      auVar40._8_4_ = fVar207;
      fVar243 = auVar355._12_4_ * fVar271 * 0.0;
      auVar40._12_4_ = fVar243;
      fVar254 = auVar355._16_4_ * fVar220 * 0.0;
      auVar40._16_4_ = fVar254;
      fVar255 = auVar355._20_4_ * fVar221 * 0.0;
      auVar40._20_4_ = fVar255;
      fVar256 = auVar355._24_4_ * fVar222 * 0.0;
      auVar40._24_4_ = fVar256;
      auVar40._28_4_ = 0x3f000000;
      auVar26 = vsubps_avx(auVar112,auVar37);
      auVar348._0_4_ = fVar204 + (float)local_5c0._0_4_;
      auVar348._4_4_ = fVar206 + (float)local_5c0._4_4_;
      auVar348._8_4_ = fVar207 + fStack_5b8;
      auVar348._12_4_ = fVar243 + fStack_5b4;
      auVar348._16_4_ = fVar254 + fStack_5b0;
      auVar348._20_4_ = fVar255 + fStack_5ac;
      auVar348._24_4_ = fVar256 + fStack_5a8;
      auVar348._28_4_ = fStack_5a4 + 0.5;
      auVar19 = vsubps_avx(auVar229,auVar38);
      auVar20 = vsubps_avx(auVar214,auVar39);
      auVar138 = vsubps_avx(_local_5c0,auVar40);
      auVar21 = vsubps_avx(auVar313,auVar25);
      auVar22 = vsubps_avx(auVar348,auVar26);
      auVar41._4_4_ = auVar26._4_4_ * auVar21._4_4_;
      auVar41._0_4_ = auVar26._0_4_ * auVar21._0_4_;
      auVar41._8_4_ = auVar26._8_4_ * auVar21._8_4_;
      auVar41._12_4_ = auVar26._12_4_ * auVar21._12_4_;
      auVar41._16_4_ = auVar26._16_4_ * auVar21._16_4_;
      auVar41._20_4_ = auVar26._20_4_ * auVar21._20_4_;
      auVar41._24_4_ = auVar26._24_4_ * auVar21._24_4_;
      auVar41._28_4_ = fVar320;
      auVar42._4_4_ = auVar25._4_4_ * auVar22._4_4_;
      auVar42._0_4_ = auVar25._0_4_ * auVar22._0_4_;
      auVar42._8_4_ = auVar25._8_4_ * auVar22._8_4_;
      auVar42._12_4_ = auVar25._12_4_ * auVar22._12_4_;
      auVar42._16_4_ = auVar25._16_4_ * auVar22._16_4_;
      auVar42._20_4_ = auVar25._20_4_ * auVar22._20_4_;
      auVar42._24_4_ = auVar25._24_4_ * auVar22._24_4_;
      auVar42._28_4_ = auVar214._28_4_;
      auVar23 = vsubps_avx(auVar42,auVar41);
      auVar43._4_4_ = auVar24._4_4_ * auVar22._4_4_;
      auVar43._0_4_ = auVar24._0_4_ * auVar22._0_4_;
      auVar43._8_4_ = auVar24._8_4_ * auVar22._8_4_;
      auVar43._12_4_ = auVar24._12_4_ * auVar22._12_4_;
      auVar43._16_4_ = auVar24._16_4_ * auVar22._16_4_;
      auVar43._20_4_ = auVar24._20_4_ * auVar22._20_4_;
      auVar43._24_4_ = auVar24._24_4_ * auVar22._24_4_;
      auVar43._28_4_ = auVar22._28_4_;
      auVar18 = vsubps_avx(auVar303,auVar24);
      auVar44._4_4_ = auVar26._4_4_ * auVar18._4_4_;
      auVar44._0_4_ = auVar26._0_4_ * auVar18._0_4_;
      auVar44._8_4_ = auVar26._8_4_ * auVar18._8_4_;
      auVar44._12_4_ = auVar26._12_4_ * auVar18._12_4_;
      auVar44._16_4_ = auVar26._16_4_ * auVar18._16_4_;
      auVar44._20_4_ = auVar26._20_4_ * auVar18._20_4_;
      auVar44._24_4_ = auVar26._24_4_ * auVar18._24_4_;
      auVar44._28_4_ = auVar229._28_4_;
      auVar139 = vsubps_avx(auVar44,auVar43);
      auVar45._4_4_ = auVar18._4_4_ * auVar25._4_4_;
      auVar45._0_4_ = auVar18._0_4_ * auVar25._0_4_;
      auVar45._8_4_ = auVar18._8_4_ * auVar25._8_4_;
      auVar45._12_4_ = auVar18._12_4_ * auVar25._12_4_;
      auVar45._16_4_ = auVar18._16_4_ * auVar25._16_4_;
      auVar45._20_4_ = auVar18._20_4_ * auVar25._20_4_;
      auVar45._24_4_ = auVar18._24_4_ * auVar25._24_4_;
      auVar45._28_4_ = auVar22._28_4_;
      auVar46._4_4_ = auVar24._4_4_ * auVar21._4_4_;
      auVar46._0_4_ = auVar24._0_4_ * auVar21._0_4_;
      auVar46._8_4_ = auVar24._8_4_ * auVar21._8_4_;
      auVar46._12_4_ = auVar24._12_4_ * auVar21._12_4_;
      auVar46._16_4_ = auVar24._16_4_ * auVar21._16_4_;
      auVar46._20_4_ = auVar24._20_4_ * auVar21._20_4_;
      auVar46._24_4_ = auVar24._24_4_ * auVar21._24_4_;
      auVar46._28_4_ = auVar21._28_4_;
      auVar21 = vsubps_avx(auVar46,auVar45);
      auVar143._0_4_ = auVar23._0_4_ * 0.0 + auVar21._0_4_ + auVar139._0_4_ * 0.0;
      auVar143._4_4_ = auVar23._4_4_ * 0.0 + auVar21._4_4_ + auVar139._4_4_ * 0.0;
      auVar143._8_4_ = auVar23._8_4_ * 0.0 + auVar21._8_4_ + auVar139._8_4_ * 0.0;
      auVar143._12_4_ = auVar23._12_4_ * 0.0 + auVar21._12_4_ + auVar139._12_4_ * 0.0;
      auVar143._16_4_ = auVar23._16_4_ * 0.0 + auVar21._16_4_ + auVar139._16_4_ * 0.0;
      auVar143._20_4_ = auVar23._20_4_ * 0.0 + auVar21._20_4_ + auVar139._20_4_ * 0.0;
      auVar143._24_4_ = auVar23._24_4_ * 0.0 + auVar21._24_4_ + auVar139._24_4_ * 0.0;
      auVar143._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar139._28_4_;
      auVar18 = vcmpps_avx(auVar143,ZEXT432(0) << 0x20,2);
      local_6c0 = vblendvps_avx(auVar19,_local_660,auVar18);
      auVar19 = vblendvps_avx(auVar20,_local_6a0,auVar18);
      auVar20 = vblendvps_avx(auVar138,auVar264,auVar18);
      auVar21 = vblendvps_avx(auVar24,auVar303,auVar18);
      auVar22 = vblendvps_avx(auVar25,auVar313,auVar18);
      auVar23 = vblendvps_avx(auVar26,auVar348,auVar18);
      auVar24 = vblendvps_avx(auVar303,auVar24,auVar18);
      auVar25 = vblendvps_avx(auVar313,auVar25,auVar18);
      local_740._0_16_ = vpackssdw_avx(local_360._0_16_,local_360._16_16_);
      local_740._16_16_ = auVar329._16_16_;
      auVar26 = vblendvps_avx(auVar348,auVar26,auVar18);
      auVar24 = vsubps_avx(auVar24,local_6c0);
      auVar139 = vsubps_avx(auVar25,auVar19);
      auVar26 = vsubps_avx(auVar26,auVar20);
      auVar140 = vsubps_avx(auVar19,auVar22);
      fVar204 = auVar139._0_4_;
      fVar133 = auVar20._0_4_;
      fVar255 = auVar139._4_4_;
      fVar152 = auVar20._4_4_;
      auVar47._4_4_ = fVar152 * fVar255;
      auVar47._0_4_ = fVar133 * fVar204;
      fVar260 = auVar139._8_4_;
      fVar156 = auVar20._8_4_;
      auVar47._8_4_ = fVar156 * fVar260;
      fVar271 = auVar139._12_4_;
      fVar160 = auVar20._12_4_;
      auVar47._12_4_ = fVar160 * fVar271;
      fVar283 = auVar139._16_4_;
      fVar163 = auVar20._16_4_;
      auVar47._16_4_ = fVar163 * fVar283;
      fVar297 = auVar139._20_4_;
      fVar166 = auVar20._20_4_;
      auVar47._20_4_ = fVar166 * fVar297;
      fVar151 = auVar139._24_4_;
      fVar168 = auVar20._24_4_;
      auVar47._24_4_ = fVar168 * fVar151;
      auVar47._28_4_ = auVar25._28_4_;
      fVar206 = auVar19._0_4_;
      fVar240 = auVar26._0_4_;
      fVar256 = auVar19._4_4_;
      fVar241 = auVar26._4_4_;
      auVar48._4_4_ = fVar241 * fVar256;
      auVar48._0_4_ = fVar240 * fVar206;
      fVar267 = auVar19._8_4_;
      fVar224 = auVar26._8_4_;
      auVar48._8_4_ = fVar224 * fVar267;
      fVar272 = auVar19._12_4_;
      fVar236 = auVar26._12_4_;
      auVar48._12_4_ = fVar236 * fVar272;
      fVar295 = auVar19._16_4_;
      fVar239 = auVar26._16_4_;
      auVar48._16_4_ = fVar239 * fVar295;
      fVar298 = auVar19._20_4_;
      fVar242 = auVar26._20_4_;
      auVar48._20_4_ = fVar242 * fVar298;
      fVar155 = auVar19._24_4_;
      fVar285 = auVar26._24_4_;
      uVar130 = auVar138._28_4_;
      auVar48._24_4_ = fVar285 * fVar155;
      auVar48._28_4_ = uVar130;
      auVar25 = vsubps_avx(auVar48,auVar47);
      fVar207 = local_6c0._0_4_;
      fVar257 = local_6c0._4_4_;
      auVar49._4_4_ = fVar241 * fVar257;
      auVar49._0_4_ = fVar240 * fVar207;
      fVar268 = local_6c0._8_4_;
      auVar49._8_4_ = fVar224 * fVar268;
      fVar291 = local_6c0._12_4_;
      auVar49._12_4_ = fVar236 * fVar291;
      fVar296 = local_6c0._16_4_;
      auVar49._16_4_ = fVar239 * fVar296;
      fVar222 = local_6c0._20_4_;
      auVar49._20_4_ = fVar242 * fVar222;
      fVar159 = local_6c0._24_4_;
      auVar49._24_4_ = fVar285 * fVar159;
      auVar49._28_4_ = uVar130;
      fVar243 = auVar24._0_4_;
      fVar258 = auVar24._4_4_;
      auVar50._4_4_ = fVar152 * fVar258;
      auVar50._0_4_ = fVar133 * fVar243;
      fVar269 = auVar24._8_4_;
      auVar50._8_4_ = fVar156 * fVar269;
      fVar294 = auVar24._12_4_;
      auVar50._12_4_ = fVar160 * fVar294;
      fVar221 = auVar24._16_4_;
      auVar50._16_4_ = fVar163 * fVar221;
      fVar208 = auVar24._20_4_;
      auVar50._20_4_ = fVar166 * fVar208;
      fVar162 = auVar24._24_4_;
      auVar50._24_4_ = fVar168 * fVar162;
      auVar50._28_4_ = auVar348._28_4_;
      auVar138 = vsubps_avx(auVar50,auVar49);
      auVar51._4_4_ = fVar256 * fVar258;
      auVar51._0_4_ = fVar206 * fVar243;
      auVar51._8_4_ = fVar267 * fVar269;
      auVar51._12_4_ = fVar272 * fVar294;
      auVar51._16_4_ = fVar295 * fVar221;
      auVar51._20_4_ = fVar298 * fVar208;
      auVar51._24_4_ = fVar155 * fVar162;
      auVar51._28_4_ = uVar130;
      auVar356._0_4_ = fVar207 * fVar204;
      auVar356._4_4_ = fVar257 * fVar255;
      auVar356._8_4_ = fVar268 * fVar260;
      auVar356._12_4_ = fVar291 * fVar271;
      auVar356._16_4_ = fVar296 * fVar283;
      auVar356._20_4_ = fVar222 * fVar297;
      auVar356._24_4_ = fVar159 * fVar151;
      auVar356._28_4_ = 0;
      auVar178 = vsubps_avx(auVar356,auVar51);
      auVar179 = vsubps_avx(auVar20,auVar23);
      fVar254 = auVar178._28_4_ + auVar138._28_4_;
      auVar182._0_4_ = auVar178._0_4_ + auVar138._0_4_ * 0.0 + auVar25._0_4_ * 0.0;
      auVar182._4_4_ = auVar178._4_4_ + auVar138._4_4_ * 0.0 + auVar25._4_4_ * 0.0;
      auVar182._8_4_ = auVar178._8_4_ + auVar138._8_4_ * 0.0 + auVar25._8_4_ * 0.0;
      auVar182._12_4_ = auVar178._12_4_ + auVar138._12_4_ * 0.0 + auVar25._12_4_ * 0.0;
      auVar182._16_4_ = auVar178._16_4_ + auVar138._16_4_ * 0.0 + auVar25._16_4_ * 0.0;
      auVar182._20_4_ = auVar178._20_4_ + auVar138._20_4_ * 0.0 + auVar25._20_4_ * 0.0;
      auVar182._24_4_ = auVar178._24_4_ + auVar138._24_4_ * 0.0 + auVar25._24_4_ * 0.0;
      auVar182._28_4_ = fVar254 + auVar25._28_4_;
      fVar170 = auVar140._0_4_;
      fVar273 = auVar140._4_4_;
      auVar52._4_4_ = fVar273 * auVar23._4_4_;
      auVar52._0_4_ = fVar170 * auVar23._0_4_;
      fVar223 = auVar140._8_4_;
      auVar52._8_4_ = fVar223 * auVar23._8_4_;
      fVar234 = auVar140._12_4_;
      auVar52._12_4_ = fVar234 * auVar23._12_4_;
      fVar235 = auVar140._16_4_;
      auVar52._16_4_ = fVar235 * auVar23._16_4_;
      fVar237 = auVar140._20_4_;
      auVar52._20_4_ = fVar237 * auVar23._20_4_;
      fVar238 = auVar140._24_4_;
      auVar52._24_4_ = fVar238 * auVar23._24_4_;
      auVar52._28_4_ = fVar254;
      fVar254 = auVar179._0_4_;
      fVar259 = auVar179._4_4_;
      auVar53._4_4_ = auVar22._4_4_ * fVar259;
      auVar53._0_4_ = auVar22._0_4_ * fVar254;
      fVar270 = auVar179._8_4_;
      auVar53._8_4_ = auVar22._8_4_ * fVar270;
      fVar220 = auVar179._12_4_;
      auVar53._12_4_ = auVar22._12_4_ * fVar220;
      fVar284 = auVar179._16_4_;
      auVar53._16_4_ = auVar22._16_4_ * fVar284;
      fVar286 = auVar179._20_4_;
      auVar53._20_4_ = auVar22._20_4_ * fVar286;
      fVar165 = auVar179._24_4_;
      auVar53._24_4_ = auVar22._24_4_ * fVar165;
      auVar53._28_4_ = auVar178._28_4_;
      auVar138 = vsubps_avx(auVar53,auVar52);
      auVar140 = vsubps_avx(local_6c0,auVar21);
      fVar290 = auVar140._0_4_;
      fVar293 = auVar140._4_4_;
      auVar54._4_4_ = fVar293 * auVar23._4_4_;
      auVar54._0_4_ = fVar290 * auVar23._0_4_;
      fVar299 = auVar140._8_4_;
      auVar54._8_4_ = fVar299 * auVar23._8_4_;
      fVar307 = auVar140._12_4_;
      auVar54._12_4_ = fVar307 * auVar23._12_4_;
      fVar308 = auVar140._16_4_;
      auVar54._16_4_ = fVar308 * auVar23._16_4_;
      fVar309 = auVar140._20_4_;
      auVar54._20_4_ = fVar309 * auVar23._20_4_;
      fVar310 = auVar140._24_4_;
      auVar54._24_4_ = fVar310 * auVar23._24_4_;
      auVar54._28_4_ = auVar23._28_4_;
      auVar55._4_4_ = auVar21._4_4_ * fVar259;
      auVar55._0_4_ = auVar21._0_4_ * fVar254;
      auVar55._8_4_ = auVar21._8_4_ * fVar270;
      auVar55._12_4_ = auVar21._12_4_ * fVar220;
      auVar55._16_4_ = auVar21._16_4_ * fVar284;
      auVar55._20_4_ = auVar21._20_4_ * fVar286;
      auVar55._24_4_ = auVar21._24_4_ * fVar165;
      auVar55._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = auVar22._4_4_ * fVar293;
      auVar56._0_4_ = auVar22._0_4_ * fVar290;
      auVar56._8_4_ = auVar22._8_4_ * fVar299;
      auVar56._12_4_ = auVar22._12_4_ * fVar307;
      auVar56._16_4_ = auVar22._16_4_ * fVar308;
      auVar56._20_4_ = auVar22._20_4_ * fVar309;
      auVar56._24_4_ = auVar22._24_4_ * fVar310;
      auVar56._28_4_ = auVar23._28_4_;
      auVar57._4_4_ = auVar21._4_4_ * fVar273;
      auVar57._0_4_ = auVar21._0_4_ * fVar170;
      auVar57._8_4_ = auVar21._8_4_ * fVar223;
      auVar57._12_4_ = auVar21._12_4_ * fVar234;
      auVar57._16_4_ = auVar21._16_4_ * fVar235;
      auVar57._20_4_ = auVar21._20_4_ * fVar237;
      auVar57._24_4_ = auVar21._24_4_ * fVar238;
      auVar57._28_4_ = auVar21._28_4_;
      auVar21 = vsubps_avx(auVar57,auVar56);
      auVar231._0_4_ = auVar138._0_4_ * 0.0 + auVar21._0_4_ + auVar25._0_4_ * 0.0;
      auVar231._4_4_ = auVar138._4_4_ * 0.0 + auVar21._4_4_ + auVar25._4_4_ * 0.0;
      auVar231._8_4_ = auVar138._8_4_ * 0.0 + auVar21._8_4_ + auVar25._8_4_ * 0.0;
      auVar231._12_4_ = auVar138._12_4_ * 0.0 + auVar21._12_4_ + auVar25._12_4_ * 0.0;
      auVar231._16_4_ = auVar138._16_4_ * 0.0 + auVar21._16_4_ + auVar25._16_4_ * 0.0;
      auVar231._20_4_ = auVar138._20_4_ * 0.0 + auVar21._20_4_ + auVar25._20_4_ * 0.0;
      auVar231._24_4_ = auVar138._24_4_ * 0.0 + auVar21._24_4_ + auVar25._24_4_ * 0.0;
      auVar231._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar25._28_4_;
      auVar21 = vmaxps_avx(auVar182,auVar231);
      auVar21 = vcmpps_avx(auVar21,ZEXT832(0) << 0x20,2);
      auVar247 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
      auVar247 = vpand_avx(auVar247,local_740._0_16_);
      auVar189 = vpmovsxwd_avx(auVar247);
      auVar205 = vpunpckhwd_avx(auVar247,auVar247);
      auVar216._16_16_ = auVar205;
      auVar216._0_16_ = auVar189;
      if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar216 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar216 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar216 >> 0x7f,0) == '\0') &&
            (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar205 >> 0x3f,0) == '\0') &&
          (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar205[0xf]
         ) {
LAB_00a68a54:
        auVar252._8_8_ = uStack_5d8;
        auVar252._0_8_ = local_5e0;
        auVar252._16_8_ = uStack_5d0;
        auVar252._24_8_ = uStack_5c8;
        auVar340 = ZEXT3264(auVar337);
        auVar306 = ZEXT3264(auVar137);
        auVar219 = ZEXT3264(auVar216);
        auVar349._4_4_ = fVar150;
        auVar349._0_4_ = fVar132;
        auVar349._8_4_ = fVar154;
        auVar349._12_4_ = fVar158;
        auVar349._16_4_ = fVar161;
        auVar349._20_4_ = fVar164;
        auVar349._24_4_ = fVar167;
        auVar349._28_4_ = fVar169;
      }
      else {
        auVar58._4_4_ = fVar259 * fVar255;
        auVar58._0_4_ = fVar254 * fVar204;
        auVar58._8_4_ = fVar270 * fVar260;
        auVar58._12_4_ = fVar220 * fVar271;
        auVar58._16_4_ = fVar284 * fVar283;
        auVar58._20_4_ = fVar286 * fVar297;
        auVar58._24_4_ = fVar165 * fVar151;
        auVar58._28_4_ = auVar205._12_4_;
        auVar330._0_4_ = fVar170 * fVar240;
        auVar330._4_4_ = fVar273 * fVar241;
        auVar330._8_4_ = fVar223 * fVar224;
        auVar330._12_4_ = fVar234 * fVar236;
        auVar330._16_4_ = fVar235 * fVar239;
        auVar330._20_4_ = fVar237 * fVar242;
        auVar330._24_4_ = fVar238 * fVar285;
        auVar330._28_4_ = 0;
        auVar21 = vsubps_avx(auVar330,auVar58);
        auVar59._4_4_ = fVar293 * fVar241;
        auVar59._0_4_ = fVar290 * fVar240;
        auVar59._8_4_ = fVar299 * fVar224;
        auVar59._12_4_ = fVar307 * fVar236;
        auVar59._16_4_ = fVar308 * fVar239;
        auVar59._20_4_ = fVar309 * fVar242;
        auVar59._24_4_ = fVar310 * fVar285;
        auVar59._28_4_ = auVar26._28_4_;
        auVar60._4_4_ = fVar259 * fVar258;
        auVar60._0_4_ = fVar254 * fVar243;
        auVar60._8_4_ = fVar270 * fVar269;
        auVar60._12_4_ = fVar220 * fVar294;
        auVar60._16_4_ = fVar284 * fVar221;
        auVar60._20_4_ = fVar286 * fVar208;
        auVar60._24_4_ = fVar165 * fVar162;
        auVar60._28_4_ = auVar179._28_4_;
        auVar23 = vsubps_avx(auVar60,auVar59);
        auVar61._4_4_ = fVar273 * fVar258;
        auVar61._0_4_ = fVar170 * fVar243;
        auVar61._8_4_ = fVar223 * fVar269;
        auVar61._12_4_ = fVar234 * fVar294;
        auVar61._16_4_ = fVar235 * fVar221;
        auVar61._20_4_ = fVar237 * fVar208;
        auVar61._24_4_ = fVar238 * fVar162;
        auVar61._28_4_ = auVar182._28_4_;
        auVar62._4_4_ = fVar293 * fVar255;
        auVar62._0_4_ = fVar290 * fVar204;
        auVar62._8_4_ = fVar299 * fVar260;
        auVar62._12_4_ = fVar307 * fVar271;
        auVar62._16_4_ = fVar308 * fVar283;
        auVar62._20_4_ = fVar309 * fVar297;
        auVar62._24_4_ = fVar310 * fVar151;
        auVar62._28_4_ = auVar139._28_4_;
        auVar25 = vsubps_avx(auVar62,auVar61);
        auVar282._0_4_ = auVar21._0_4_ * 0.0 + auVar25._0_4_ + auVar23._0_4_ * 0.0;
        auVar282._4_4_ = auVar21._4_4_ * 0.0 + auVar25._4_4_ + auVar23._4_4_ * 0.0;
        auVar282._8_4_ = auVar21._8_4_ * 0.0 + auVar25._8_4_ + auVar23._8_4_ * 0.0;
        auVar282._12_4_ = auVar21._12_4_ * 0.0 + auVar25._12_4_ + auVar23._12_4_ * 0.0;
        auVar282._16_4_ = auVar21._16_4_ * 0.0 + auVar25._16_4_ + auVar23._16_4_ * 0.0;
        auVar282._20_4_ = auVar21._20_4_ * 0.0 + auVar25._20_4_ + auVar23._20_4_ * 0.0;
        auVar282._24_4_ = auVar21._24_4_ * 0.0 + auVar25._24_4_ + auVar23._24_4_ * 0.0;
        auVar282._28_4_ = auVar139._28_4_ + auVar25._28_4_ + auVar182._28_4_;
        auVar22 = vrcpps_avx(auVar282);
        fVar204 = auVar22._0_4_;
        fVar243 = auVar22._4_4_;
        auVar63._4_4_ = auVar282._4_4_ * fVar243;
        auVar63._0_4_ = auVar282._0_4_ * fVar204;
        fVar254 = auVar22._8_4_;
        auVar63._8_4_ = auVar282._8_4_ * fVar254;
        fVar255 = auVar22._12_4_;
        auVar63._12_4_ = auVar282._12_4_ * fVar255;
        fVar258 = auVar22._16_4_;
        auVar63._16_4_ = auVar282._16_4_ * fVar258;
        fVar259 = auVar22._20_4_;
        auVar63._20_4_ = auVar282._20_4_ * fVar259;
        fVar260 = auVar22._24_4_;
        auVar63._24_4_ = auVar282._24_4_ * fVar260;
        auVar63._28_4_ = auVar179._28_4_;
        auVar331._8_4_ = 0x3f800000;
        auVar331._0_8_ = 0x3f8000003f800000;
        auVar331._12_4_ = 0x3f800000;
        auVar331._16_4_ = 0x3f800000;
        auVar331._20_4_ = 0x3f800000;
        auVar331._24_4_ = 0x3f800000;
        auVar331._28_4_ = 0x3f800000;
        auVar26 = vsubps_avx(auVar331,auVar63);
        fVar204 = auVar26._0_4_ * fVar204 + fVar204;
        fVar243 = auVar26._4_4_ * fVar243 + fVar243;
        fVar254 = auVar26._8_4_ * fVar254 + fVar254;
        fVar255 = auVar26._12_4_ * fVar255 + fVar255;
        fVar258 = auVar26._16_4_ * fVar258 + fVar258;
        fVar259 = auVar26._20_4_ * fVar259 + fVar259;
        fVar260 = auVar26._24_4_ * fVar260 + fVar260;
        auVar64._4_4_ =
             (auVar21._4_4_ * fVar257 + auVar23._4_4_ * fVar256 + auVar25._4_4_ * fVar152) * fVar243
        ;
        auVar64._0_4_ =
             (auVar21._0_4_ * fVar207 + auVar23._0_4_ * fVar206 + auVar25._0_4_ * fVar133) * fVar204
        ;
        auVar64._8_4_ =
             (auVar21._8_4_ * fVar268 + auVar23._8_4_ * fVar267 + auVar25._8_4_ * fVar156) * fVar254
        ;
        auVar64._12_4_ =
             (auVar21._12_4_ * fVar291 + auVar23._12_4_ * fVar272 + auVar25._12_4_ * fVar160) *
             fVar255;
        auVar64._16_4_ =
             (auVar21._16_4_ * fVar296 + auVar23._16_4_ * fVar295 + auVar25._16_4_ * fVar163) *
             fVar258;
        auVar64._20_4_ =
             (auVar21._20_4_ * fVar222 + auVar23._20_4_ * fVar298 + auVar25._20_4_ * fVar166) *
             fVar259;
        auVar64._24_4_ =
             (auVar21._24_4_ * fVar159 + auVar23._24_4_ * fVar155 + auVar25._24_4_ * fVar168) *
             fVar260;
        auVar64._28_4_ = local_6c0._28_4_ + auVar24._28_4_ + auVar20._28_4_;
        auVar189 = vpermilps_avx(ZEXT416(uVar6),0);
        auVar217._16_16_ = auVar189;
        auVar217._0_16_ = auVar189;
        auVar20 = vcmpps_avx(auVar217,auVar64,2);
        uVar130 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar250._4_4_ = uVar130;
        auVar250._0_4_ = uVar130;
        auVar250._8_4_ = uVar130;
        auVar250._12_4_ = uVar130;
        auVar250._16_4_ = uVar130;
        auVar250._20_4_ = uVar130;
        auVar250._24_4_ = uVar130;
        auVar250._28_4_ = uVar130;
        auVar21 = vcmpps_avx(auVar64,auVar250,2);
        auVar20 = vandps_avx(auVar21,auVar20);
        auVar189 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        auVar247 = vpand_avx(auVar247,auVar189);
        auVar189 = vpmovsxwd_avx(auVar247);
        auVar205 = vpshufd_avx(auVar247,0xee);
        auVar205 = vpmovsxwd_avx(auVar205);
        auVar216._16_16_ = auVar205;
        auVar216._0_16_ = auVar189;
        if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar216 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar216 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar216 >> 0x7f,0) == '\0') &&
              (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar205 >> 0x3f,0) == '\0') &&
            (auVar216 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar205[0xf]) goto LAB_00a68a54;
        auVar20 = vcmpps_avx(ZEXT832(0) << 0x20,auVar282,4);
        auVar189 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
        auVar247 = vpand_avx(auVar247,auVar189);
        auVar189 = vpmovsxwd_avx(auVar247);
        auVar247 = vpunpckhwd_avx(auVar247,auVar247);
        auVar219 = ZEXT1664(auVar247);
        auVar265._16_16_ = auVar247;
        auVar265._0_16_ = auVar189;
        auVar252._8_8_ = uStack_5d8;
        auVar252._0_8_ = local_5e0;
        auVar252._16_8_ = uStack_5d0;
        auVar252._24_8_ = uStack_5c8;
        auVar340 = ZEXT3264(auVar337);
        auVar306 = ZEXT3264(auVar137);
        auVar349._4_4_ = fVar150;
        auVar349._0_4_ = fVar132;
        auVar349._8_4_ = fVar154;
        auVar349._12_4_ = fVar158;
        auVar349._16_4_ = fVar161;
        auVar349._20_4_ = fVar164;
        auVar349._24_4_ = fVar167;
        auVar349._28_4_ = fVar169;
        if ((((((((auVar265 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar265 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar265 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar265 >> 0x7f,0) != '\0') ||
              (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar247 >> 0x3f,0) != '\0') ||
            (auVar265 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar247[0xf] < '\0') {
          auVar218._0_4_ = auVar182._0_4_ * fVar204;
          auVar218._4_4_ = auVar182._4_4_ * fVar243;
          auVar218._8_4_ = auVar182._8_4_ * fVar254;
          auVar218._12_4_ = auVar182._12_4_ * fVar255;
          auVar218._16_4_ = auVar182._16_4_ * fVar258;
          auVar218._20_4_ = auVar182._20_4_ * fVar259;
          auVar218._24_4_ = auVar182._24_4_ * fVar260;
          auVar218._28_4_ = 0;
          auVar65._4_4_ = auVar231._4_4_ * fVar243;
          auVar65._0_4_ = auVar231._0_4_ * fVar204;
          auVar65._8_4_ = auVar231._8_4_ * fVar254;
          auVar65._12_4_ = auVar231._12_4_ * fVar255;
          auVar65._16_4_ = auVar231._16_4_ * fVar258;
          auVar65._20_4_ = auVar231._20_4_ * fVar259;
          auVar65._24_4_ = auVar231._24_4_ * fVar260;
          auVar65._28_4_ = auVar26._28_4_ + auVar22._28_4_;
          auVar251._8_4_ = 0x3f800000;
          auVar251._0_8_ = 0x3f8000003f800000;
          auVar251._12_4_ = 0x3f800000;
          auVar251._16_4_ = 0x3f800000;
          auVar251._20_4_ = 0x3f800000;
          auVar251._24_4_ = 0x3f800000;
          auVar251._28_4_ = 0x3f800000;
          auVar137 = vsubps_avx(auVar251,auVar218);
          auVar137 = vblendvps_avx(auVar137,auVar218,auVar18);
          auVar340 = ZEXT3264(auVar137);
          auVar137 = vsubps_avx(auVar251,auVar65);
          auVar219 = ZEXT3264(auVar137);
          _local_3a0 = vblendvps_avx(auVar137,auVar65,auVar18);
          auVar306 = ZEXT3264(auVar64);
          auVar252 = auVar265;
        }
      }
      auVar334 = ZEXT3264(_local_720);
      if ((((((((auVar252 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar252 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar252 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar252 >> 0x7f,0) == '\0') &&
            (auVar252 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar252 >> 0xbf,0) == '\0') &&
          (auVar252 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar252[0x1f]) {
        bVar124 = 0;
      }
      else {
        auVar137 = vsubps_avx(auVar355,auVar349);
        fVar206 = auVar349._0_4_ + auVar340._0_4_ * auVar137._0_4_;
        fVar207 = auVar349._4_4_ + auVar340._4_4_ * auVar137._4_4_;
        fVar243 = auVar349._8_4_ + auVar340._8_4_ * auVar137._8_4_;
        fVar254 = auVar349._12_4_ + auVar340._12_4_ * auVar137._12_4_;
        fVar255 = auVar349._16_4_ + auVar340._16_4_ * auVar137._16_4_;
        fVar256 = auVar349._20_4_ + auVar340._20_4_ * auVar137._20_4_;
        fVar257 = auVar349._24_4_ + auVar340._24_4_ * auVar137._24_4_;
        fVar258 = auVar349._28_4_ + auVar137._28_4_;
        fVar204 = *(float *)((long)local_6f8->ray_space + k * 4 + -0x10);
        auVar66._4_4_ = (fVar207 + fVar207) * fVar204;
        auVar66._0_4_ = (fVar206 + fVar206) * fVar204;
        auVar66._8_4_ = (fVar243 + fVar243) * fVar204;
        auVar66._12_4_ = (fVar254 + fVar254) * fVar204;
        auVar66._16_4_ = (fVar255 + fVar255) * fVar204;
        auVar66._20_4_ = (fVar256 + fVar256) * fVar204;
        auVar66._24_4_ = (fVar257 + fVar257) * fVar204;
        auVar66._28_4_ = fVar258 + fVar258;
        local_7a0 = auVar306._0_32_;
        auVar137 = vcmpps_avx(local_7a0,auVar66,6);
        auVar337 = auVar252 & auVar137;
        if ((((((((auVar337 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar337 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar337 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar337 >> 0x7f,0) != '\0') ||
              (auVar337 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar337 >> 0xbf,0) != '\0') ||
            (auVar337 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar337[0x1f] < '\0') {
          local_220 = vandps_avx(auVar137,auVar252);
          local_2c0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
          local_2c0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
          fStack_2b8 = (float)uStack_398 + (float)uStack_398 + -1.0;
          fStack_2b4 = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
          fStack_2b0 = (float)uStack_390 + (float)uStack_390 + -1.0;
          fStack_2ac = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
          fStack_2a8 = (float)uStack_388 + (float)uStack_388 + -1.0;
          fStack_2a4 = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
          local_780 = auVar340._0_32_;
          local_280 = 0;
          local_270 = local_830;
          uStack_268 = uStack_828;
          fStack_25c = fStack_86c;
          fStack_258 = fStack_868;
          fStack_254 = fStack_864;
          fStack_24c = fStack_87c;
          fStack_248 = fStack_878;
          fStack_244 = fStack_874;
          local_240 = local_7d0;
          fStack_23c = fStack_7cc;
          fStack_238 = fStack_7c8;
          fStack_234 = fStack_7c4;
          local_3a0._4_4_ = local_2c0._4_4_;
          local_3a0._0_4_ = local_2c0._0_4_;
          uStack_398._0_4_ = fStack_2b8;
          uStack_398._4_4_ = fStack_2b4;
          uStack_390._0_4_ = fStack_2b0;
          uStack_390._4_4_ = fStack_2ac;
          auVar177 = _local_3a0;
          uStack_388._0_4_ = fStack_2a8;
          uStack_388._4_4_ = fStack_2a4;
          auVar137 = _local_3a0;
          if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar124 = 1, pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar192._0_4_ = 1.0 / auVar227._0_4_;
              auVar192._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar247 = vshufps_avx(auVar192,auVar192,0);
              local_200[0] = auVar247._0_4_ * (auVar340._0_4_ + 0.0);
              local_200[1] = auVar247._4_4_ * (auVar340._4_4_ + 1.0);
              local_200[2] = auVar247._8_4_ * (auVar340._8_4_ + 2.0);
              local_200[3] = auVar247._12_4_ * (auVar340._12_4_ + 3.0);
              fStack_1f0 = auVar247._0_4_ * (auVar340._16_4_ + 4.0);
              fStack_1ec = auVar247._4_4_ * (auVar340._20_4_ + 5.0);
              fStack_1e8 = auVar247._8_4_ * (auVar340._24_4_ + 6.0);
              fStack_1e4 = auVar340._28_4_ + 7.0;
              uStack_390 = auVar177._16_8_;
              uStack_388 = auVar137._24_8_;
              local_1e0 = local_3a0;
              uStack_1d8 = uStack_398;
              uStack_1d0 = uStack_390;
              uStack_1c8 = uStack_388;
              local_1c0 = local_7a0;
              uVar130 = vmovmskps_avx(local_220);
              uVar127 = CONCAT44((int)((ulong)context->args >> 0x20),uVar130);
              lVar128 = 0;
              if (uVar127 != 0) {
                for (; (uVar127 >> lVar128 & 1) == 0; lVar128 = lVar128 + 1) {
                }
              }
              local_620._0_16_ = vshufps_avx(ZEXT416(uVar121),ZEXT416(uVar121),0);
              local_620._16_16_ = auVar19._16_16_;
              _local_640 = vpermilps_avx(ZEXT416((uint)local_520),0);
              _auStack_630 = auVar214._16_16_;
              _local_5a0 = auVar355;
              _local_3a0 = auVar137;
              local_2e0 = local_780;
              local_2a0 = local_7a0;
              local_27c = uVar15;
              local_260 = local_870;
              local_250 = local_880;
              while (uVar127 != 0) {
                uVar130 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_420 = local_200[lVar128];
                local_740._0_8_ = lVar128;
                local_410 = *(undefined4 *)((long)&local_1e0 + lVar128 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + lVar128 * 4);
                fVar206 = 1.0 - local_420;
                fVar204 = local_420 * fVar206 * 4.0;
                auVar247 = ZEXT416((uint)(local_420 * local_420 * 0.5));
                auVar247 = vshufps_avx(auVar247,auVar247,0);
                auVar189 = ZEXT416((uint)((fVar206 * fVar206 + fVar204) * 0.5));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                auVar205 = ZEXT416((uint)((-local_420 * local_420 - fVar204) * 0.5));
                auVar205 = vshufps_avx(auVar205,auVar205,0);
                local_6f0.context = context->user;
                auVar210 = ZEXT416((uint)(fVar206 * -fVar206 * 0.5));
                auVar210 = vshufps_avx(auVar210,auVar210,0);
                auVar193._0_4_ =
                     auVar210._0_4_ * fVar186 +
                     auVar205._0_4_ * local_870 +
                     local_7d0 * auVar247._0_4_ + local_880 * auVar189._0_4_;
                auVar193._4_4_ =
                     auVar210._4_4_ * fVar201 +
                     auVar205._4_4_ * fStack_86c +
                     fStack_7cc * auVar247._4_4_ + fStack_87c * auVar189._4_4_;
                auVar193._8_4_ =
                     auVar210._8_4_ * fVar202 +
                     auVar205._8_4_ * fStack_868 +
                     fStack_7c8 * auVar247._8_4_ + fStack_878 * auVar189._8_4_;
                auVar193._12_4_ =
                     auVar210._12_4_ * fVar203 +
                     auVar205._12_4_ * fStack_864 +
                     fStack_7c4 * auVar247._12_4_ + fStack_874 * auVar189._12_4_;
                local_450 = (RTCHitN  [16])vshufps_avx(auVar193,auVar193,0);
                local_440 = vshufps_avx(auVar193,auVar193,0x55);
                auVar219 = ZEXT1664(local_440);
                local_430 = vshufps_avx(auVar193,auVar193,0xaa);
                local_400 = local_640;
                uStack_3f8 = uStack_638;
                local_3f0 = local_620._0_16_;
                vcmpps_avx(ZEXT1632(local_620._0_16_),ZEXT1632(local_620._0_16_),0xf);
                uStack_3dc = (local_6f0.context)->instID[0];
                local_3e0 = uStack_3dc;
                uStack_3d8 = uStack_3dc;
                uStack_3d4 = uStack_3dc;
                uStack_3d0 = (local_6f0.context)->instPrimID[0];
                uStack_3cc = uStack_3d0;
                uStack_3c8 = uStack_3d0;
                uStack_3c4 = uStack_3d0;
                local_7c0 = *local_700;
                local_6f0.valid = (int *)local_7c0;
                local_6f0.geometryUserPtr = pGVar16->userPtr;
                local_6f0.hit = local_450;
                local_6f0.N = 4;
                local_6c0._0_4_ = uVar130;
                local_6f0.ray = (RTCRayN *)ray;
                fStack_41c = local_420;
                fStack_418 = local_420;
                fStack_414 = local_420;
                uStack_40c = local_410;
                uStack_408 = local_410;
                uStack_404 = local_410;
                if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar219 = ZEXT1664(local_440);
                  (*pGVar16->occlusionFilterN)(&local_6f0);
                  auVar334 = ZEXT3264(_local_720);
                  auVar306 = ZEXT3264(local_7a0);
                  auVar340 = ZEXT3264(local_780);
                  uVar130 = local_6c0._0_4_;
                }
                if (local_7c0 == (undefined1  [16])0x0) {
                  auVar247 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar247 = auVar247 ^ _DAT_01f46b70;
                }
                else {
                  p_Var17 = context->args->filter;
                  if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar16->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar219 = ZEXT1664(auVar219._0_16_);
                    (*p_Var17)(&local_6f0);
                    auVar334 = ZEXT3264(_local_720);
                    auVar306 = ZEXT3264(local_7a0);
                    auVar340 = ZEXT3264(local_780);
                    uVar130 = local_6c0._0_4_;
                  }
                  auVar189 = vpcmpeqd_avx(local_7c0,_DAT_01f45a50);
                  auVar247 = auVar189 ^ _DAT_01f46b70;
                  auVar194._8_4_ = 0xff800000;
                  auVar194._0_8_ = 0xff800000ff800000;
                  auVar194._12_4_ = 0xff800000;
                  auVar189 = vblendvps_avx(auVar194,*(undefined1 (*) [16])(local_6f0.ray + 0x80),
                                           auVar189);
                  *(undefined1 (*) [16])(local_6f0.ray + 0x80) = auVar189;
                }
                auVar176._8_8_ = 0x100000001;
                auVar176._0_8_ = 0x100000001;
                if ((auVar176 & auVar247) != (undefined1  [16])0x0) {
                  bVar124 = 1;
                  goto LAB_00a67afa;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar130;
                uVar127 = uVar127 ^ 1L << (local_740._0_8_ & 0x3f);
                lVar128 = 0;
                if (uVar127 != 0) {
                  for (; (uVar127 >> lVar128 & 1) == 0; lVar128 = lVar128 + 1) {
                  }
                }
              }
              bVar124 = 0;
            }
            goto LAB_00a67afa;
          }
        }
        bVar124 = 0;
      }
LAB_00a67afa:
      auVar135 = local_760._0_16_;
    }
    auVar185 = ZEXT1664(auVar135);
    if (8 < (int)uVar15) {
      auVar247 = vpshufd_avx(ZEXT416(uVar15),0);
      local_560 = auVar247._0_4_;
      fStack_55c = auVar247._4_4_;
      fStack_558 = auVar247._8_4_;
      fStack_554 = auVar247._12_4_;
      auVar247 = vshufps_avx(auVar135,auVar135,0);
      register0x00001210 = auVar247;
      _local_380 = auVar247;
      auVar247 = vpermilps_avx(ZEXT416(uVar6),0);
      local_e0._16_16_ = auVar247;
      local_e0._0_16_ = auVar247;
      auVar136._0_4_ = 1.0 / (float)local_500._0_4_;
      auVar136._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar247 = vshufps_avx(auVar136,auVar136,0);
      register0x00001210 = auVar247;
      _local_100 = auVar247;
      local_2f0 = vshufps_avx(ZEXT416((uint)local_7a8),ZEXT416((uint)local_7a8),0);
      auVar116._4_4_ = fStack_51c;
      auVar116._0_4_ = local_520;
      auVar116._8_4_ = fStack_518;
      auVar116._12_4_ = fStack_514;
      local_300 = vpermilps_avx(auVar116,0);
      auVar148 = ZEXT1664(local_300);
      local_780 = auVar340._0_32_;
      local_7a0 = auVar306._0_32_;
      for (lVar128 = 8; lVar128 < (int)uVar15; lVar128 = lVar128 + 8) {
        pauVar1 = (undefined1 (*) [28])(bspline_basis0 + lVar128 * 4 + lVar126);
        fVar204 = *(float *)*pauVar1;
        fVar206 = *(float *)(*pauVar1 + 4);
        fVar207 = *(float *)(*pauVar1 + 8);
        fVar243 = *(float *)(*pauVar1 + 0xc);
        fVar254 = *(float *)(*pauVar1 + 0x10);
        fVar255 = *(float *)(*pauVar1 + 0x14);
        fVar256 = *(float *)(*pauVar1 + 0x18);
        auVar120 = *pauVar1;
        pfVar2 = (float *)(lVar126 + 0x21fffac + lVar128 * 4);
        fVar257 = *pfVar2;
        fVar258 = pfVar2[1];
        fVar259 = pfVar2[2];
        fVar260 = pfVar2[3];
        fVar267 = pfVar2[4];
        fVar268 = pfVar2[5];
        fVar269 = pfVar2[6];
        pauVar1 = (undefined1 (*) [28])(lVar126 + 0x2200430 + lVar128 * 4);
        fVar270 = *(float *)*pauVar1;
        fVar271 = *(float *)(*pauVar1 + 4);
        fVar272 = *(float *)(*pauVar1 + 8);
        fVar291 = *(float *)(*pauVar1 + 0xc);
        fVar294 = *(float *)(*pauVar1 + 0x10);
        fVar220 = *(float *)(*pauVar1 + 0x14);
        fVar283 = *(float *)(*pauVar1 + 0x18);
        auVar119 = *pauVar1;
        pauVar1 = (undefined1 (*) [28])(lVar126 + 0x22008b4 + lVar128 * 4);
        fVar295 = *(float *)*pauVar1;
        fVar296 = *(float *)(*pauVar1 + 4);
        fVar221 = *(float *)(*pauVar1 + 8);
        fVar284 = *(float *)(*pauVar1 + 0xc);
        fVar297 = *(float *)(*pauVar1 + 0x10);
        fVar298 = *(float *)(*pauVar1 + 0x14);
        fVar222 = *(float *)(*pauVar1 + 0x18);
        auVar118 = *pauVar1;
        fVar286 = auVar219._28_4_;
        fVar208 = fVar286 + *(float *)pauVar1[1];
        fVar170 = fVar286 + fVar286 + auVar148._28_4_;
        fVar132 = fVar286 + fVar208;
        auVar199._0_4_ =
             fVar204 * (float)local_340._0_4_ +
             auVar334._0_4_ * fVar257 +
             fVar270 * (float)local_540._0_4_ + (float)local_4e0._0_4_ * fVar295;
        auVar199._4_4_ =
             fVar206 * (float)local_340._4_4_ +
             auVar334._4_4_ * fVar258 +
             fVar271 * (float)local_540._4_4_ + (float)local_4e0._4_4_ * fVar296;
        auVar199._8_4_ =
             fVar207 * fStack_338 +
             auVar334._8_4_ * fVar259 + fVar272 * fStack_538 + fStack_4d8 * fVar221;
        auVar199._12_4_ =
             fVar243 * fStack_334 +
             auVar334._12_4_ * fVar260 + fVar291 * fStack_534 + fStack_4d4 * fVar284;
        auVar199._16_4_ =
             fVar254 * fStack_330 +
             auVar334._16_4_ * fVar267 + fVar294 * fStack_530 + fStack_4d0 * fVar297;
        auVar199._20_4_ =
             fVar255 * fStack_32c +
             auVar334._20_4_ * fVar268 + fVar220 * fStack_52c + fStack_4cc * fVar298;
        auVar199._24_4_ =
             fVar256 * fStack_328 +
             auVar334._24_4_ * fVar269 + fVar283 * fStack_528 + fStack_4c8 * fVar222;
        auVar199._28_4_ = fVar208 + fVar170;
        local_760._0_4_ =
             fVar257 * fVar131 + (float)local_480._0_4_ * fVar270 + fVar354 * fVar295 +
             fVar204 * (float)local_4c0._0_4_;
        local_760._4_4_ =
             fVar258 * fVar149 + (float)local_480._4_4_ * fVar271 + fVar358 * fVar296 +
             fVar206 * (float)local_4c0._4_4_;
        local_760._8_4_ =
             fVar259 * fVar153 + fStack_478 * fVar272 + fVar359 * fVar221 + fVar207 * fStack_4b8;
        local_760._12_4_ =
             fVar260 * fVar157 + fStack_474 * fVar291 + fVar360 * fVar284 + fVar243 * fStack_4b4;
        local_760._16_4_ =
             fVar267 * fVar131 + fStack_470 * fVar294 + fVar354 * fVar297 + fVar254 * fStack_4b0;
        local_760._20_4_ =
             fVar268 * fVar149 + fStack_46c * fVar220 + fVar358 * fVar298 + fVar255 * fStack_4ac;
        local_760._24_4_ =
             fVar269 * fVar153 + fStack_468 * fVar283 + fVar359 * fVar222 + fVar256 * fStack_4a8;
        local_760._28_4_ = fVar286 + fVar286 + auVar185._28_4_ + fVar170;
        auVar219 = ZEXT3264(local_760);
        fVar133 = (float)local_a0._0_4_ * fVar204 +
                  fVar257 * (float)local_160._0_4_ +
                  (float)local_120._0_4_ * fVar270 + fVar295 * (float)local_140._0_4_;
        fVar152 = (float)local_a0._4_4_ * fVar206 +
                  fVar258 * (float)local_160._4_4_ +
                  (float)local_120._4_4_ * fVar271 + fVar296 * (float)local_140._4_4_;
        fVar156 = fStack_98 * fVar207 +
                  fVar259 * fStack_158 + fStack_118 * fVar272 + fVar221 * fStack_138;
        fVar160 = fStack_94 * fVar243 +
                  fVar260 * fStack_154 + fStack_114 * fVar291 + fVar284 * fStack_134;
        fVar163 = fStack_90 * fVar254 +
                  fVar267 * fStack_150 + fStack_110 * fVar294 + fVar297 * fStack_130;
        fVar166 = fStack_8c * fVar255 +
                  fVar268 * fStack_14c + fStack_10c * fVar220 + fVar298 * fStack_12c;
        fVar168 = fStack_88 * fVar256 +
                  fVar269 * fStack_148 + fStack_108 * fVar283 + fVar222 * fStack_128;
        fVar170 = fVar170 + fVar132;
        pfVar2 = (float *)(bspline_basis1 + lVar128 * 4 + lVar126);
        fVar270 = *pfVar2;
        fVar271 = pfVar2[1];
        fVar272 = pfVar2[2];
        fVar291 = pfVar2[3];
        fVar294 = pfVar2[4];
        fVar220 = pfVar2[5];
        fVar283 = pfVar2[6];
        pfVar3 = (float *)(lVar126 + 0x22023cc + lVar128 * 4);
        fVar295 = *pfVar3;
        fVar296 = pfVar3[1];
        fVar221 = pfVar3[2];
        fVar284 = pfVar3[3];
        fVar297 = pfVar3[4];
        fVar298 = pfVar3[5];
        fVar222 = pfVar3[6];
        auVar137 = *(undefined1 (*) [32])(lVar126 + 0x2202850 + lVar128 * 4);
        auVar148 = ZEXT3264(auVar137);
        pfVar4 = (float *)(lVar126 + 0x2202cd4 + lVar128 * 4);
        fVar208 = *pfVar4;
        fVar286 = pfVar4[1];
        fVar151 = pfVar4[2];
        fVar155 = pfVar4[3];
        fVar159 = pfVar4[4];
        fVar162 = pfVar4[5];
        fVar165 = pfVar4[6];
        fVar204 = auVar137._0_4_;
        fVar206 = auVar137._4_4_;
        fVar207 = auVar137._8_4_;
        fVar243 = auVar137._12_4_;
        fVar254 = auVar137._16_4_;
        fVar255 = auVar137._20_4_;
        fVar256 = auVar137._24_4_;
        fVar132 = fStack_524 + fStack_524 + fVar132;
        local_6c0._0_4_ =
             (float)local_340._0_4_ * fVar270 +
             auVar334._0_4_ * fVar295 +
             (float)local_540._0_4_ * fVar204 + fVar208 * (float)local_4e0._0_4_;
        local_6c0._4_4_ =
             (float)local_340._4_4_ * fVar271 +
             auVar334._4_4_ * fVar296 +
             (float)local_540._4_4_ * fVar206 + fVar286 * (float)local_4e0._4_4_;
        local_6c0._8_4_ =
             fStack_338 * fVar272 +
             auVar334._8_4_ * fVar221 + fStack_538 * fVar207 + fVar151 * fStack_4d8;
        local_6c0._12_4_ =
             fStack_334 * fVar291 +
             auVar334._12_4_ * fVar284 + fStack_534 * fVar243 + fVar155 * fStack_4d4;
        local_6c0._16_4_ =
             fStack_330 * fVar294 +
             auVar334._16_4_ * fVar297 + fStack_530 * fVar254 + fVar159 * fStack_4d0;
        local_6c0._20_4_ =
             fStack_32c * fVar220 +
             auVar334._20_4_ * fVar298 + fStack_52c * fVar255 + fVar162 * fStack_4cc;
        local_6c0._24_4_ =
             fStack_328 * fVar283 +
             auVar334._24_4_ * fVar222 + fStack_528 * fVar256 + fVar165 * fStack_4c8;
        local_6c0._28_4_ = fStack_524 + fStack_4c4 + fVar132;
        local_620._0_4_ =
             fVar270 * (float)local_4c0._0_4_ +
             fVar131 * fVar295 + (float)local_480._0_4_ * fVar204 + fVar208 * fVar354;
        local_620._4_4_ =
             fVar271 * (float)local_4c0._4_4_ +
             fVar149 * fVar296 + (float)local_480._4_4_ * fVar206 + fVar286 * fVar358;
        local_620._8_4_ =
             fVar272 * fStack_4b8 + fVar153 * fVar221 + fStack_478 * fVar207 + fVar151 * fVar359;
        local_620._12_4_ =
             fVar291 * fStack_4b4 + fVar157 * fVar284 + fStack_474 * fVar243 + fVar155 * fVar360;
        local_620._16_4_ =
             fVar294 * fStack_4b0 + fVar131 * fVar297 + fStack_470 * fVar254 + fVar159 * fVar354;
        local_620._20_4_ =
             fVar220 * fStack_4ac + fVar149 * fVar298 + fStack_46c * fVar255 + fVar162 * fVar358;
        local_620._24_4_ =
             fVar283 * fStack_4a8 + fVar153 * fVar222 + fStack_468 * fVar256 + fVar165 * fVar359;
        local_620._28_4_ = fVar132 + fStack_524 + fStack_524 + fVar360;
        local_5c0._0_4_ =
             fVar295 * (float)local_160._0_4_ +
             (float)local_120._0_4_ * fVar204 + fVar208 * (float)local_140._0_4_ +
             (float)local_a0._0_4_ * fVar270;
        local_5c0._4_4_ =
             fVar296 * (float)local_160._4_4_ +
             (float)local_120._4_4_ * fVar206 + fVar286 * (float)local_140._4_4_ +
             (float)local_a0._4_4_ * fVar271;
        fStack_5b8 = fVar221 * fStack_158 + fStack_118 * fVar207 + fVar151 * fStack_138 +
                     fStack_98 * fVar272;
        fStack_5b4 = fVar284 * fStack_154 + fStack_114 * fVar243 + fVar155 * fStack_134 +
                     fStack_94 * fVar291;
        fStack_5b0 = fVar297 * fStack_150 + fStack_110 * fVar254 + fVar159 * fStack_130 +
                     fStack_90 * fVar294;
        fStack_5ac = fVar298 * fStack_14c + fStack_10c * fVar255 + fVar162 * fStack_12c +
                     fStack_8c * fVar220;
        fStack_5a8 = fVar222 * fStack_148 + fStack_108 * fVar256 + fVar165 * fStack_128 +
                     fStack_88 * fVar283;
        fStack_5a4 = fStack_524 + fStack_524 + fStack_4c4 + fVar132;
        auVar19 = vsubps_avx(local_6c0,auVar199);
        auVar20 = vsubps_avx(local_620._0_32_,local_760);
        fVar169 = auVar19._0_4_;
        fVar273 = auVar19._4_4_;
        auVar67._4_4_ = fVar273 * local_760._4_4_;
        auVar67._0_4_ = fVar169 * local_760._0_4_;
        fVar223 = auVar19._8_4_;
        auVar67._8_4_ = fVar223 * local_760._8_4_;
        fVar234 = auVar19._12_4_;
        auVar67._12_4_ = fVar234 * local_760._12_4_;
        fVar235 = auVar19._16_4_;
        auVar67._16_4_ = fVar235 * local_760._16_4_;
        fVar237 = auVar19._20_4_;
        auVar67._20_4_ = fVar237 * local_760._20_4_;
        fVar238 = auVar19._24_4_;
        auVar67._24_4_ = fVar238 * local_760._24_4_;
        auVar67._28_4_ = fVar132;
        fVar132 = auVar20._0_4_;
        fVar150 = auVar20._4_4_;
        auVar68._4_4_ = fVar150 * auVar199._4_4_;
        auVar68._0_4_ = fVar132 * auVar199._0_4_;
        fVar154 = auVar20._8_4_;
        auVar68._8_4_ = fVar154 * auVar199._8_4_;
        fVar158 = auVar20._12_4_;
        auVar68._12_4_ = fVar158 * auVar199._12_4_;
        fVar161 = auVar20._16_4_;
        auVar68._16_4_ = fVar161 * auVar199._16_4_;
        fVar164 = auVar20._20_4_;
        auVar68._20_4_ = fVar164 * auVar199._20_4_;
        fVar167 = auVar20._24_4_;
        auVar68._24_4_ = fVar167 * auVar199._24_4_;
        auVar68._28_4_ = local_620._28_4_;
        auVar21 = vsubps_avx(auVar67,auVar68);
        auVar111._4_4_ = fVar152;
        auVar111._0_4_ = fVar133;
        auVar111._8_4_ = fVar156;
        auVar111._12_4_ = fVar160;
        auVar111._16_4_ = fVar163;
        auVar111._20_4_ = fVar166;
        auVar111._24_4_ = fVar168;
        auVar111._28_4_ = fVar170;
        auVar337 = vmaxps_avx(auVar111,_local_5c0);
        auVar69._4_4_ = auVar337._4_4_ * auVar337._4_4_ * (fVar273 * fVar273 + fVar150 * fVar150);
        auVar69._0_4_ = auVar337._0_4_ * auVar337._0_4_ * (fVar169 * fVar169 + fVar132 * fVar132);
        auVar69._8_4_ = auVar337._8_4_ * auVar337._8_4_ * (fVar223 * fVar223 + fVar154 * fVar154);
        auVar69._12_4_ = auVar337._12_4_ * auVar337._12_4_ * (fVar234 * fVar234 + fVar158 * fVar158)
        ;
        auVar69._16_4_ = auVar337._16_4_ * auVar337._16_4_ * (fVar235 * fVar235 + fVar161 * fVar161)
        ;
        auVar69._20_4_ = auVar337._20_4_ * auVar337._20_4_ * (fVar237 * fVar237 + fVar164 * fVar164)
        ;
        auVar69._24_4_ = auVar337._24_4_ * auVar337._24_4_ * (fVar238 * fVar238 + fVar167 * fVar167)
        ;
        auVar69._28_4_ = local_6c0._28_4_ + local_620._28_4_;
        auVar70._4_4_ = auVar21._4_4_ * auVar21._4_4_;
        auVar70._0_4_ = auVar21._0_4_ * auVar21._0_4_;
        auVar70._8_4_ = auVar21._8_4_ * auVar21._8_4_;
        auVar70._12_4_ = auVar21._12_4_ * auVar21._12_4_;
        auVar70._16_4_ = auVar21._16_4_ * auVar21._16_4_;
        auVar70._20_4_ = auVar21._20_4_ * auVar21._20_4_;
        auVar70._24_4_ = auVar21._24_4_ * auVar21._24_4_;
        auVar70._28_4_ = auVar21._28_4_;
        _local_5a0 = vcmpps_avx(auVar70,auVar69,2);
        auVar185 = ZEXT3264(_local_5a0);
        local_280 = (uint)lVar128;
        auVar189 = vpshufd_avx(ZEXT416(local_280),0);
        auVar247 = vpor_avx(auVar189,_DAT_01f4ad30);
        auVar189 = vpor_avx(auVar189,_DAT_01f7afa0);
        auVar114._4_4_ = fStack_55c;
        auVar114._0_4_ = local_560;
        auVar114._8_4_ = fStack_558;
        auVar114._12_4_ = fStack_554;
        auVar247 = vpcmpgtd_avx(auVar114,auVar247);
        auVar189 = vpcmpgtd_avx(auVar114,auVar189);
        auVar200._16_16_ = auVar189;
        auVar200._0_16_ = auVar247;
        auVar337 = auVar200 & _local_5a0;
        if ((((((((auVar337 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar337 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar337 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar337 >> 0x7f,0) == '\0') &&
              (auVar337 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar337 >> 0xbf,0) == '\0') &&
            (auVar337 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar337[0x1f]) {
          auVar340 = ZEXT3264(local_780);
          auVar306 = ZEXT3264(local_7a0);
          auVar334 = ZEXT3264(_local_720);
        }
        else {
          local_520 = fVar270 * (float)local_580._0_4_ +
                      fVar295 * (float)local_320._0_4_ +
                      (float)local_c0._0_4_ * fVar204 + fVar208 * (float)local_4a0._0_4_;
          fStack_51c = fVar271 * (float)local_580._4_4_ +
                       fVar296 * (float)local_320._4_4_ +
                       (float)local_c0._4_4_ * fVar206 + fVar286 * (float)local_4a0._4_4_;
          fStack_518 = fVar272 * fStack_578 +
                       fVar221 * fStack_318 + fStack_b8 * fVar207 + fVar151 * fStack_498;
          fStack_514 = fVar291 * fStack_574 +
                       fVar284 * fStack_314 + fStack_b4 * fVar243 + fVar155 * fStack_494;
          fStack_510 = fVar294 * fStack_570 +
                       fVar297 * fStack_310 + fStack_b0 * fVar254 + fVar159 * fStack_490;
          fStack_50c = fVar220 * fStack_56c +
                       fVar298 * fStack_30c + fStack_ac * fVar255 + fVar162 * fStack_48c;
          fStack_508 = fVar283 * fStack_568 +
                       fVar222 * fStack_308 + fStack_a8 * fVar256 + fVar165 * fStack_488;
          fStack_504 = pfVar2[7] + auVar137._28_4_ + local_5a0._28_4_ + 0.0;
          local_660._0_4_ = auVar119._0_4_;
          local_660._4_4_ = auVar119._4_4_;
          fStack_658 = auVar119._8_4_;
          fStack_654 = auVar119._12_4_;
          fStack_650 = auVar119._16_4_;
          fStack_64c = auVar119._20_4_;
          fStack_648 = auVar119._24_4_;
          local_6a0._0_4_ = auVar118._0_4_;
          local_6a0._4_4_ = auVar118._4_4_;
          fStack_698 = auVar118._8_4_;
          fStack_694 = auVar118._12_4_;
          fStack_690 = auVar118._16_4_;
          fStack_68c = auVar118._20_4_;
          fStack_688 = auVar118._24_4_;
          fVar150 = (float)local_4a0._0_4_ * (float)local_6a0._0_4_;
          fVar154 = (float)local_4a0._4_4_ * (float)local_6a0._4_4_;
          fVar158 = fStack_498 * fStack_698;
          fVar161 = fStack_494 * fStack_694;
          fVar164 = fStack_490 * fStack_690;
          fVar167 = fStack_48c * fStack_68c;
          fVar169 = fStack_488 * fStack_688;
          pfVar2 = (float *)(lVar126 + 0x2201640 + lVar128 * 4);
          fVar204 = *pfVar2;
          fVar206 = pfVar2[1];
          fVar207 = pfVar2[2];
          fVar243 = pfVar2[3];
          fVar254 = pfVar2[4];
          fVar255 = pfVar2[5];
          fVar256 = pfVar2[6];
          pfVar4 = (float *)(lVar126 + 0x2201ac4 + lVar128 * 4);
          fVar270 = *pfVar4;
          fVar271 = pfVar4[1];
          fVar272 = pfVar4[2];
          fVar291 = pfVar4[3];
          fVar294 = pfVar4[4];
          fVar220 = pfVar4[5];
          fVar283 = pfVar4[6];
          fVar273 = pfVar3[7] + 0.0;
          pfVar5 = (float *)(lVar126 + 0x22011bc + lVar128 * 4);
          fVar295 = *pfVar5;
          fVar296 = pfVar5[1];
          fVar221 = pfVar5[2];
          fVar284 = pfVar5[3];
          fVar297 = pfVar5[4];
          fVar298 = pfVar5[5];
          fVar222 = pfVar5[6];
          fVar132 = pfVar2[7] + pfVar4[7];
          fStack_344 = pfVar4[7] + fVar273;
          fVar273 = pfVar3[7] + fStack_84 + fVar273;
          pfVar2 = (float *)(lVar126 + 0x2200d38 + lVar128 * 4);
          fVar208 = *pfVar2;
          fVar286 = pfVar2[1];
          fVar151 = pfVar2[2];
          fVar155 = pfVar2[3];
          fVar159 = pfVar2[4];
          fVar162 = pfVar2[5];
          fVar165 = pfVar2[6];
          local_6a0._4_4_ =
               (float)local_340._4_4_ * fVar286 +
               fVar296 * (float)local_720._4_4_ +
               (float)local_540._4_4_ * fVar206 + (float)local_4e0._4_4_ * fVar271;
          local_6a0._0_4_ =
               (float)local_340._0_4_ * fVar208 +
               fVar295 * (float)local_720._0_4_ +
               (float)local_540._0_4_ * fVar204 + (float)local_4e0._0_4_ * fVar270;
          fStack_698 = fStack_338 * fVar151 +
                       fVar221 * fStack_718 + fStack_538 * fVar207 + fStack_4d8 * fVar272;
          fStack_694 = fStack_334 * fVar155 +
                       fVar284 * fStack_714 + fStack_534 * fVar243 + fStack_4d4 * fVar291;
          fStack_690 = fStack_330 * fVar159 +
                       fVar297 * fStack_710 + fStack_530 * fVar254 + fStack_4d0 * fVar294;
          fStack_68c = fStack_32c * fVar162 +
                       fVar298 * fStack_70c + fStack_52c * fVar255 + fStack_4cc * fVar220;
          fStack_688 = fStack_328 * fVar165 +
                       fVar222 * fStack_708 + fStack_528 * fVar256 + fStack_4c8 * fVar283;
          fStack_684 = fVar132 + fStack_344;
          fStack_344 = fStack_344 + fVar273;
          local_360._4_4_ =
               fVar286 * (float)local_4c0._4_4_ +
               (float)local_480._4_4_ * fVar206 + fVar358 * fVar271 + fVar296 * fVar149;
          local_360._0_4_ =
               fVar208 * (float)local_4c0._0_4_ +
               (float)local_480._0_4_ * fVar204 + fVar354 * fVar270 + fVar295 * fVar131;
          fStack_358 = fVar151 * fStack_4b8 +
                       fStack_478 * fVar207 + fVar359 * fVar272 + fVar221 * fVar153;
          fStack_354 = fVar155 * fStack_4b4 +
                       fStack_474 * fVar243 + fVar360 * fVar291 + fVar284 * fVar157;
          fStack_350 = fVar159 * fStack_4b0 +
                       fStack_470 * fVar254 + fVar354 * fVar294 + fVar297 * fVar131;
          fStack_34c = fVar162 * fStack_4ac +
                       fStack_46c * fVar255 + fVar358 * fVar220 + fVar298 * fVar149;
          fStack_348 = fVar165 * fStack_4a8 +
                       fStack_468 * fVar256 + fVar359 * fVar283 + fVar222 * fVar153;
          auVar338._0_4_ =
               fVar295 * (float)local_320._0_4_ +
               (float)local_c0._0_4_ * fVar204 + (float)local_4a0._0_4_ * fVar270 +
               fVar208 * (float)local_580._0_4_;
          auVar338._4_4_ =
               fVar296 * (float)local_320._4_4_ +
               (float)local_c0._4_4_ * fVar206 + (float)local_4a0._4_4_ * fVar271 +
               fVar286 * (float)local_580._4_4_;
          auVar338._8_4_ =
               fVar221 * fStack_318 + fStack_b8 * fVar207 + fStack_498 * fVar272 +
               fVar151 * fStack_578;
          auVar338._12_4_ =
               fVar284 * fStack_314 + fStack_b4 * fVar243 + fStack_494 * fVar291 +
               fVar155 * fStack_574;
          auVar338._16_4_ =
               fVar297 * fStack_310 + fStack_b0 * fVar254 + fStack_490 * fVar294 +
               fVar159 * fStack_570;
          auVar338._20_4_ =
               fVar298 * fStack_30c + fStack_ac * fVar255 + fStack_48c * fVar220 +
               fVar162 * fStack_56c;
          auVar338._24_4_ =
               fVar222 * fStack_308 + fStack_a8 * fVar256 + fStack_488 * fVar283 +
               fVar165 * fStack_568;
          auVar338._28_4_ = pfVar5[7] + fVar132 + fVar273;
          pfVar2 = (float *)(lVar126 + 0x2203a60 + lVar128 * 4);
          fVar204 = *pfVar2;
          fVar206 = pfVar2[1];
          fVar207 = pfVar2[2];
          fVar243 = pfVar2[3];
          fVar254 = pfVar2[4];
          fVar255 = pfVar2[5];
          fVar256 = pfVar2[6];
          pfVar3 = (float *)(lVar126 + 0x2203ee4 + lVar128 * 4);
          fVar270 = *pfVar3;
          fVar271 = pfVar3[1];
          fVar272 = pfVar3[2];
          fVar291 = pfVar3[3];
          fVar294 = pfVar3[4];
          fVar220 = pfVar3[5];
          fVar283 = pfVar3[6];
          pfVar4 = (float *)(lVar126 + 0x22035dc + lVar128 * 4);
          fVar295 = *pfVar4;
          fVar296 = pfVar4[1];
          fVar221 = pfVar4[2];
          fVar284 = pfVar4[3];
          fVar297 = pfVar4[4];
          fVar298 = pfVar4[5];
          fVar222 = pfVar4[6];
          pfVar5 = (float *)(lVar126 + 0x2203158 + lVar128 * 4);
          fVar208 = *pfVar5;
          fVar286 = pfVar5[1];
          fVar151 = pfVar5[2];
          fVar155 = pfVar5[3];
          fVar159 = pfVar5[4];
          fVar162 = pfVar5[5];
          fVar165 = pfVar5[6];
          auVar304._0_4_ =
               (float)local_340._0_4_ * fVar208 +
               fVar295 * (float)local_720._0_4_ +
               (float)local_540._0_4_ * fVar204 + (float)local_4e0._0_4_ * fVar270;
          auVar304._4_4_ =
               (float)local_340._4_4_ * fVar286 +
               fVar296 * (float)local_720._4_4_ +
               (float)local_540._4_4_ * fVar206 + (float)local_4e0._4_4_ * fVar271;
          auVar304._8_4_ =
               fStack_338 * fVar151 +
               fVar221 * fStack_718 + fStack_538 * fVar207 + fStack_4d8 * fVar272;
          auVar304._12_4_ =
               fStack_334 * fVar155 +
               fVar284 * fStack_714 + fStack_534 * fVar243 + fStack_4d4 * fVar291;
          auVar304._16_4_ =
               fStack_330 * fVar159 +
               fVar297 * fStack_710 + fStack_530 * fVar254 + fStack_4d0 * fVar294;
          auVar304._20_4_ =
               fStack_32c * fVar162 +
               fVar298 * fStack_70c + fStack_52c * fVar255 + fStack_4cc * fVar220;
          auVar304._24_4_ =
               fStack_328 * fVar165 +
               fVar222 * fStack_708 + fStack_528 * fVar256 + fStack_4c8 * fVar283;
          auVar304._28_4_ = fStack_464 + fStack_464 + fStack_4c4 + fStack_344;
          auVar332._0_4_ =
               fVar208 * (float)local_4c0._0_4_ +
               fVar295 * fVar131 + (float)local_480._0_4_ * fVar204 + fVar354 * fVar270;
          auVar332._4_4_ =
               fVar286 * (float)local_4c0._4_4_ +
               fVar296 * fVar149 + (float)local_480._4_4_ * fVar206 + fVar358 * fVar271;
          auVar332._8_4_ =
               fVar151 * fStack_4b8 + fVar221 * fVar153 + fStack_478 * fVar207 + fVar359 * fVar272;
          auVar332._12_4_ =
               fVar155 * fStack_4b4 + fVar284 * fVar157 + fStack_474 * fVar243 + fVar360 * fVar291;
          auVar332._16_4_ =
               fVar159 * fStack_4b0 + fVar297 * fVar131 + fStack_470 * fVar254 + fVar354 * fVar294;
          auVar332._20_4_ =
               fVar162 * fStack_4ac + fVar298 * fVar149 + fStack_46c * fVar255 + fVar358 * fVar220;
          auVar332._24_4_ =
               fVar165 * fStack_4a8 + fVar222 * fVar153 + fStack_468 * fVar256 + fVar359 * fVar283;
          auVar332._28_4_ = fStack_464 + fStack_464 + fVar360 + fStack_344;
          auVar253._8_4_ = 0x7fffffff;
          auVar253._0_8_ = 0x7fffffff7fffffff;
          auVar253._12_4_ = 0x7fffffff;
          auVar253._16_4_ = 0x7fffffff;
          auVar253._20_4_ = 0x7fffffff;
          auVar253._24_4_ = 0x7fffffff;
          auVar253._28_4_ = 0x7fffffff;
          auVar137 = vandps_avx(_local_6a0,auVar253);
          auVar337 = vandps_avx(_local_360,auVar253);
          auVar337 = vmaxps_avx(auVar137,auVar337);
          auVar137 = vandps_avx(auVar338,auVar253);
          auVar337 = vmaxps_avx(auVar337,auVar137);
          auVar337 = vcmpps_avx(auVar337,_local_380,1);
          auVar21 = vblendvps_avx(_local_6a0,auVar19,auVar337);
          auVar145._0_4_ =
               fVar208 * (float)local_580._0_4_ +
               fVar295 * (float)local_320._0_4_ +
               fVar270 * (float)local_4a0._0_4_ + (float)local_c0._0_4_ * fVar204;
          auVar145._4_4_ =
               fVar286 * (float)local_580._4_4_ +
               fVar296 * (float)local_320._4_4_ +
               fVar271 * (float)local_4a0._4_4_ + (float)local_c0._4_4_ * fVar206;
          auVar145._8_4_ =
               fVar151 * fStack_578 +
               fVar221 * fStack_318 + fVar272 * fStack_498 + fStack_b8 * fVar207;
          auVar145._12_4_ =
               fVar155 * fStack_574 +
               fVar284 * fStack_314 + fVar291 * fStack_494 + fStack_b4 * fVar243;
          auVar145._16_4_ =
               fVar159 * fStack_570 +
               fVar297 * fStack_310 + fVar294 * fStack_490 + fStack_b0 * fVar254;
          auVar145._20_4_ =
               fVar162 * fStack_56c +
               fVar298 * fStack_30c + fVar220 * fStack_48c + fStack_ac * fVar255;
          auVar145._24_4_ =
               fVar165 * fStack_568 +
               fVar222 * fStack_308 + fVar283 * fStack_488 + fStack_a8 * fVar256;
          auVar145._28_4_ = auVar137._28_4_ + pfVar4[7] + pfVar3[7] + pfVar2[7];
          auVar22 = vblendvps_avx(_local_360,auVar20,auVar337);
          auVar137 = vandps_avx(auVar304,auVar253);
          auVar337 = vandps_avx(auVar332,auVar253);
          auVar23 = vmaxps_avx(auVar137,auVar337);
          auVar137 = vandps_avx(auVar145,auVar253);
          auVar137 = vmaxps_avx(auVar23,auVar137);
          local_640._0_4_ = auVar120._0_4_;
          local_640._4_4_ = auVar120._4_4_;
          uStack_638._0_4_ = auVar120._8_4_;
          uStack_638._4_4_ = auVar120._12_4_;
          auStack_630._0_4_ = auVar120._16_4_;
          auStack_630._4_4_ = auVar120._20_4_;
          fStack_628 = auVar120._24_4_;
          auVar337 = vcmpps_avx(auVar137,_local_380,1);
          auVar137 = vblendvps_avx(auVar304,auVar19,auVar337);
          auVar146._0_4_ =
               (float)local_580._0_4_ * (float)local_640._0_4_ +
               (float)local_320._0_4_ * fVar257 +
               (float)local_c0._0_4_ * (float)local_660._0_4_ + fVar150;
          auVar146._4_4_ =
               (float)local_580._4_4_ * (float)local_640._4_4_ +
               (float)local_320._4_4_ * fVar258 +
               (float)local_c0._4_4_ * (float)local_660._4_4_ + fVar154;
          auVar146._8_4_ =
               fStack_578 * (float)uStack_638 +
               fStack_318 * fVar259 + fStack_b8 * fStack_658 + fVar158;
          auVar146._12_4_ =
               fStack_574 * uStack_638._4_4_ +
               fStack_314 * fVar260 + fStack_b4 * fStack_654 + fVar161;
          auVar146._16_4_ =
               fStack_570 * (float)auStack_630._0_4_ +
               fStack_310 * fVar267 + fStack_b0 * fStack_650 + fVar164;
          auVar146._20_4_ =
               fStack_56c * (float)auStack_630._4_4_ +
               fStack_30c * fVar268 + fStack_ac * fStack_64c + fVar167;
          auVar146._24_4_ =
               fStack_568 * fStack_628 + fStack_308 * fVar269 + fStack_a8 * fStack_648 + fVar169;
          auVar146._28_4_ = auVar23._28_4_ + fStack_504 + local_5a0._28_4_ + 0.0;
          auVar337 = vblendvps_avx(auVar332,auVar20,auVar337);
          fVar132 = auVar21._0_4_;
          fVar150 = auVar21._4_4_;
          fVar154 = auVar21._8_4_;
          fVar158 = auVar21._12_4_;
          fVar161 = auVar21._16_4_;
          fVar164 = auVar21._20_4_;
          fVar167 = auVar21._24_4_;
          fVar169 = auVar21._28_4_;
          fVar270 = auVar137._0_4_;
          fVar272 = auVar137._4_4_;
          fVar294 = auVar137._8_4_;
          fVar283 = auVar137._12_4_;
          fVar296 = auVar137._16_4_;
          fVar284 = auVar137._20_4_;
          fVar298 = auVar137._24_4_;
          fVar204 = auVar22._0_4_;
          fVar207 = auVar22._4_4_;
          fVar254 = auVar22._8_4_;
          fVar256 = auVar22._12_4_;
          fVar258 = auVar22._16_4_;
          fVar260 = auVar22._20_4_;
          fVar268 = auVar22._24_4_;
          auVar314._0_4_ = fVar204 * fVar204 + fVar132 * fVar132;
          auVar314._4_4_ = fVar207 * fVar207 + fVar150 * fVar150;
          auVar314._8_4_ = fVar254 * fVar254 + fVar154 * fVar154;
          auVar314._12_4_ = fVar256 * fVar256 + fVar158 * fVar158;
          auVar314._16_4_ = fVar258 * fVar258 + fVar161 * fVar161;
          auVar314._20_4_ = fVar260 * fVar260 + fVar164 * fVar164;
          auVar314._24_4_ = fVar268 * fVar268 + fVar167 * fVar167;
          auVar314._28_4_ = auVar19._28_4_ + fStack_524;
          auVar19 = vrsqrtps_avx(auVar314);
          fVar206 = auVar19._0_4_;
          fVar243 = auVar19._4_4_;
          auVar71._4_4_ = fVar243 * 1.5;
          auVar71._0_4_ = fVar206 * 1.5;
          fVar255 = auVar19._8_4_;
          auVar71._8_4_ = fVar255 * 1.5;
          fVar257 = auVar19._12_4_;
          auVar71._12_4_ = fVar257 * 1.5;
          fVar259 = auVar19._16_4_;
          auVar71._16_4_ = fVar259 * 1.5;
          fVar267 = auVar19._20_4_;
          auVar71._20_4_ = fVar267 * 1.5;
          fVar269 = auVar19._24_4_;
          auVar71._24_4_ = fVar269 * 1.5;
          auVar71._28_4_ = auVar332._28_4_;
          auVar72._4_4_ = fVar243 * fVar243 * fVar243 * auVar314._4_4_ * 0.5;
          auVar72._0_4_ = fVar206 * fVar206 * fVar206 * auVar314._0_4_ * 0.5;
          auVar72._8_4_ = fVar255 * fVar255 * fVar255 * auVar314._8_4_ * 0.5;
          auVar72._12_4_ = fVar257 * fVar257 * fVar257 * auVar314._12_4_ * 0.5;
          auVar72._16_4_ = fVar259 * fVar259 * fVar259 * auVar314._16_4_ * 0.5;
          auVar72._20_4_ = fVar267 * fVar267 * fVar267 * auVar314._20_4_ * 0.5;
          auVar72._24_4_ = fVar269 * fVar269 * fVar269 * auVar314._24_4_ * 0.5;
          auVar72._28_4_ = auVar314._28_4_;
          auVar21 = vsubps_avx(auVar71,auVar72);
          fVar208 = auVar21._0_4_;
          fVar286 = auVar21._4_4_;
          fVar151 = auVar21._8_4_;
          fVar155 = auVar21._12_4_;
          fVar159 = auVar21._16_4_;
          fVar162 = auVar21._20_4_;
          fVar165 = auVar21._24_4_;
          fVar206 = auVar337._0_4_;
          fVar243 = auVar337._4_4_;
          fVar255 = auVar337._8_4_;
          fVar257 = auVar337._12_4_;
          fVar259 = auVar337._16_4_;
          fVar267 = auVar337._20_4_;
          fVar269 = auVar337._24_4_;
          auVar289._0_4_ = fVar206 * fVar206 + fVar270 * fVar270;
          auVar289._4_4_ = fVar243 * fVar243 + fVar272 * fVar272;
          auVar289._8_4_ = fVar255 * fVar255 + fVar294 * fVar294;
          auVar289._12_4_ = fVar257 * fVar257 + fVar283 * fVar283;
          auVar289._16_4_ = fVar259 * fVar259 + fVar296 * fVar296;
          auVar289._20_4_ = fVar267 * fVar267 + fVar284 * fVar284;
          auVar289._24_4_ = fVar269 * fVar269 + fVar298 * fVar298;
          auVar289._28_4_ = auVar19._28_4_ + auVar137._28_4_;
          auVar137 = vrsqrtps_avx(auVar289);
          fVar271 = auVar137._0_4_;
          fVar291 = auVar137._4_4_;
          auVar73._4_4_ = fVar291 * 1.5;
          auVar73._0_4_ = fVar271 * 1.5;
          fVar220 = auVar137._8_4_;
          auVar73._8_4_ = fVar220 * 1.5;
          fVar295 = auVar137._12_4_;
          auVar73._12_4_ = fVar295 * 1.5;
          fVar221 = auVar137._16_4_;
          auVar73._16_4_ = fVar221 * 1.5;
          fVar297 = auVar137._20_4_;
          auVar73._20_4_ = fVar297 * 1.5;
          fVar222 = auVar137._24_4_;
          auVar73._24_4_ = fVar222 * 1.5;
          auVar73._28_4_ = auVar332._28_4_;
          auVar74._4_4_ = fVar291 * fVar291 * fVar291 * auVar289._4_4_ * 0.5;
          auVar74._0_4_ = fVar271 * fVar271 * fVar271 * auVar289._0_4_ * 0.5;
          auVar74._8_4_ = fVar220 * fVar220 * fVar220 * auVar289._8_4_ * 0.5;
          auVar74._12_4_ = fVar295 * fVar295 * fVar295 * auVar289._12_4_ * 0.5;
          auVar74._16_4_ = fVar221 * fVar221 * fVar221 * auVar289._16_4_ * 0.5;
          auVar74._20_4_ = fVar297 * fVar297 * fVar297 * auVar289._20_4_ * 0.5;
          auVar74._24_4_ = fVar222 * fVar222 * fVar222 * auVar289._24_4_ * 0.5;
          auVar74._28_4_ = auVar289._28_4_;
          auVar337 = vsubps_avx(auVar73,auVar74);
          fVar271 = auVar337._0_4_;
          fVar291 = auVar337._4_4_;
          fVar220 = auVar337._8_4_;
          fVar295 = auVar337._12_4_;
          fVar221 = auVar337._16_4_;
          fVar297 = auVar337._20_4_;
          fVar222 = auVar337._24_4_;
          fVar204 = fVar133 * fVar208 * fVar204;
          fVar207 = fVar152 * fVar286 * fVar207;
          auVar75._4_4_ = fVar207;
          auVar75._0_4_ = fVar204;
          fVar254 = fVar156 * fVar151 * fVar254;
          auVar75._8_4_ = fVar254;
          fVar256 = fVar160 * fVar155 * fVar256;
          auVar75._12_4_ = fVar256;
          fVar258 = fVar163 * fVar159 * fVar258;
          auVar75._16_4_ = fVar258;
          fVar260 = fVar166 * fVar162 * fVar260;
          auVar75._20_4_ = fVar260;
          fVar268 = fVar168 * fVar165 * fVar268;
          auVar75._24_4_ = fVar268;
          auVar75._28_4_ = auVar137._28_4_;
          local_640._4_4_ = fVar207 + auVar199._4_4_;
          local_640._0_4_ = fVar204 + auVar199._0_4_;
          uStack_638._0_4_ = fVar254 + auVar199._8_4_;
          uStack_638._4_4_ = fVar256 + auVar199._12_4_;
          auStack_630._0_4_ = fVar258 + auVar199._16_4_;
          auStack_630._4_4_ = fVar260 + auVar199._20_4_;
          fStack_628 = fVar268 + auVar199._24_4_;
          fStack_624 = auVar137._28_4_ + auVar199._28_4_;
          local_680 = fVar133 * fVar208 * -fVar132;
          fStack_67c = fVar152 * fVar286 * -fVar150;
          auVar76._4_4_ = fStack_67c;
          auVar76._0_4_ = local_680;
          fStack_678 = fVar156 * fVar151 * -fVar154;
          auVar76._8_4_ = fStack_678;
          fStack_674 = fVar160 * fVar155 * -fVar158;
          auVar76._12_4_ = fStack_674;
          fStack_670 = fVar163 * fVar159 * -fVar161;
          auVar76._16_4_ = fStack_670;
          fStack_66c = fVar166 * fVar162 * -fVar164;
          auVar76._20_4_ = fStack_66c;
          fStack_668 = fVar168 * fVar165 * -fVar167;
          auVar76._24_4_ = fStack_668;
          auVar76._28_4_ = -fVar169;
          local_680 = local_760._0_4_ + local_680;
          fStack_67c = local_760._4_4_ + fStack_67c;
          fStack_678 = local_760._8_4_ + fStack_678;
          fStack_674 = local_760._12_4_ + fStack_674;
          fStack_670 = local_760._16_4_ + fStack_670;
          fStack_66c = local_760._20_4_ + fStack_66c;
          fStack_668 = local_760._24_4_ + fStack_668;
          fStack_664 = local_760._28_4_ + -fVar169;
          fVar204 = fVar208 * 0.0 * fVar133;
          fVar207 = fVar286 * 0.0 * fVar152;
          auVar77._4_4_ = fVar207;
          auVar77._0_4_ = fVar204;
          fVar254 = fVar151 * 0.0 * fVar156;
          auVar77._8_4_ = fVar254;
          fVar256 = fVar155 * 0.0 * fVar160;
          auVar77._12_4_ = fVar256;
          fVar258 = fVar159 * 0.0 * fVar163;
          auVar77._16_4_ = fVar258;
          fVar260 = fVar162 * 0.0 * fVar166;
          auVar77._20_4_ = fVar260;
          fVar268 = fVar165 * 0.0 * fVar168;
          auVar77._24_4_ = fVar268;
          auVar77._28_4_ = fVar169;
          auVar24 = vsubps_avx(auVar199,auVar75);
          auVar357._0_4_ = fVar204 + auVar146._0_4_;
          auVar357._4_4_ = fVar207 + auVar146._4_4_;
          auVar357._8_4_ = fVar254 + auVar146._8_4_;
          auVar357._12_4_ = fVar256 + auVar146._12_4_;
          auVar357._16_4_ = fVar258 + auVar146._16_4_;
          auVar357._20_4_ = fVar260 + auVar146._20_4_;
          auVar357._24_4_ = fVar268 + auVar146._24_4_;
          auVar357._28_4_ = fVar169 + auVar146._28_4_;
          fVar204 = (float)local_5c0._0_4_ * fVar271 * fVar206;
          fVar206 = (float)local_5c0._4_4_ * fVar291 * fVar243;
          auVar78._4_4_ = fVar206;
          auVar78._0_4_ = fVar204;
          fVar207 = fStack_5b8 * fVar220 * fVar255;
          auVar78._8_4_ = fVar207;
          fVar243 = fStack_5b4 * fVar295 * fVar257;
          auVar78._12_4_ = fVar243;
          fVar254 = fStack_5b0 * fVar221 * fVar259;
          auVar78._16_4_ = fVar254;
          fVar255 = fStack_5ac * fVar297 * fVar267;
          auVar78._20_4_ = fVar255;
          fVar256 = fStack_5a8 * fVar222 * fVar269;
          auVar78._24_4_ = fVar256;
          auVar78._28_4_ = fVar170;
          auVar138 = vsubps_avx(local_760,auVar76);
          auVar339._0_4_ = (float)local_6c0._0_4_ + fVar204;
          auVar339._4_4_ = local_6c0._4_4_ + fVar206;
          auVar339._8_4_ = local_6c0._8_4_ + fVar207;
          auVar339._12_4_ = local_6c0._12_4_ + fVar243;
          auVar339._16_4_ = local_6c0._16_4_ + fVar254;
          auVar339._20_4_ = local_6c0._20_4_ + fVar255;
          auVar339._24_4_ = local_6c0._24_4_ + fVar256;
          auVar339._28_4_ = local_6c0._28_4_ + fVar170;
          fVar204 = fVar271 * -fVar270 * (float)local_5c0._0_4_;
          fVar206 = fVar291 * -fVar272 * (float)local_5c0._4_4_;
          auVar79._4_4_ = fVar206;
          auVar79._0_4_ = fVar204;
          fVar207 = fVar220 * -fVar294 * fStack_5b8;
          auVar79._8_4_ = fVar207;
          fVar243 = fVar295 * -fVar283 * fStack_5b4;
          auVar79._12_4_ = fVar243;
          fVar254 = fVar221 * -fVar296 * fStack_5b0;
          auVar79._16_4_ = fVar254;
          fVar255 = fVar297 * -fVar284 * fStack_5ac;
          auVar79._20_4_ = fVar255;
          fVar256 = fVar222 * -fVar298 * fStack_5a8;
          auVar79._24_4_ = fVar256;
          auVar79._28_4_ = auVar199._28_4_;
          auVar139 = vsubps_avx(auVar146,auVar77);
          auVar232._0_4_ = local_620._0_4_ + fVar204;
          auVar232._4_4_ = local_620._4_4_ + fVar206;
          auVar232._8_4_ = local_620._8_4_ + fVar207;
          auVar232._12_4_ = local_620._12_4_ + fVar243;
          auVar232._16_4_ = local_620._16_4_ + fVar254;
          auVar232._20_4_ = local_620._20_4_ + fVar255;
          auVar232._24_4_ = local_620._24_4_ + fVar256;
          auVar232._28_4_ = local_620._28_4_ + auVar199._28_4_;
          fVar204 = fVar271 * 0.0 * (float)local_5c0._0_4_;
          fVar206 = fVar291 * 0.0 * (float)local_5c0._4_4_;
          auVar80._4_4_ = fVar206;
          auVar80._0_4_ = fVar204;
          fVar207 = fVar220 * 0.0 * fStack_5b8;
          auVar80._8_4_ = fVar207;
          fVar243 = fVar295 * 0.0 * fStack_5b4;
          auVar80._12_4_ = fVar243;
          fVar254 = fVar221 * 0.0 * fStack_5b0;
          auVar80._16_4_ = fVar254;
          fVar255 = fVar297 * 0.0 * fStack_5ac;
          auVar80._20_4_ = fVar255;
          fVar256 = fVar222 * 0.0 * fStack_5a8;
          auVar80._24_4_ = fVar256;
          auVar80._28_4_ = auVar146._28_4_;
          auVar137 = vsubps_avx(local_6c0,auVar78);
          auVar117._4_4_ = fStack_51c;
          auVar117._0_4_ = local_520;
          auVar117._8_4_ = fStack_518;
          auVar117._12_4_ = fStack_514;
          auVar117._16_4_ = fStack_510;
          auVar117._20_4_ = fStack_50c;
          auVar117._24_4_ = fStack_508;
          auVar117._28_4_ = fStack_504;
          auVar305._0_4_ = local_520 + fVar204;
          auVar305._4_4_ = fStack_51c + fVar206;
          auVar305._8_4_ = fStack_518 + fVar207;
          auVar305._12_4_ = fStack_514 + fVar243;
          auVar305._16_4_ = fStack_510 + fVar254;
          auVar305._20_4_ = fStack_50c + fVar255;
          auVar305._24_4_ = fStack_508 + fVar256;
          auVar305._28_4_ = fStack_504 + auVar146._28_4_;
          auVar19 = vsubps_avx(local_620._0_32_,auVar79);
          auVar21 = vsubps_avx(auVar117,auVar80);
          auVar22 = vsubps_avx(auVar232,auVar138);
          auVar23 = vsubps_avx(auVar305,auVar139);
          auVar81._4_4_ = auVar139._4_4_ * auVar22._4_4_;
          auVar81._0_4_ = auVar139._0_4_ * auVar22._0_4_;
          auVar81._8_4_ = auVar139._8_4_ * auVar22._8_4_;
          auVar81._12_4_ = auVar139._12_4_ * auVar22._12_4_;
          auVar81._16_4_ = auVar139._16_4_ * auVar22._16_4_;
          auVar81._20_4_ = auVar139._20_4_ * auVar22._20_4_;
          auVar81._24_4_ = auVar139._24_4_ * auVar22._24_4_;
          auVar81._28_4_ = auVar332._28_4_;
          auVar82._4_4_ = auVar138._4_4_ * auVar23._4_4_;
          auVar82._0_4_ = auVar138._0_4_ * auVar23._0_4_;
          auVar82._8_4_ = auVar138._8_4_ * auVar23._8_4_;
          auVar82._12_4_ = auVar138._12_4_ * auVar23._12_4_;
          auVar82._16_4_ = auVar138._16_4_ * auVar23._16_4_;
          auVar82._20_4_ = auVar138._20_4_ * auVar23._20_4_;
          auVar82._24_4_ = auVar138._24_4_ * auVar23._24_4_;
          auVar82._28_4_ = fStack_504;
          auVar25 = vsubps_avx(auVar82,auVar81);
          auVar83._4_4_ = auVar24._4_4_ * auVar23._4_4_;
          auVar83._0_4_ = auVar24._0_4_ * auVar23._0_4_;
          auVar83._8_4_ = auVar24._8_4_ * auVar23._8_4_;
          auVar83._12_4_ = auVar24._12_4_ * auVar23._12_4_;
          auVar83._16_4_ = auVar24._16_4_ * auVar23._16_4_;
          auVar83._20_4_ = auVar24._20_4_ * auVar23._20_4_;
          auVar83._24_4_ = auVar24._24_4_ * auVar23._24_4_;
          auVar83._28_4_ = auVar23._28_4_;
          auVar23 = vsubps_avx(auVar339,auVar24);
          auVar84._4_4_ = auVar139._4_4_ * auVar23._4_4_;
          auVar84._0_4_ = auVar139._0_4_ * auVar23._0_4_;
          auVar84._8_4_ = auVar139._8_4_ * auVar23._8_4_;
          auVar84._12_4_ = auVar139._12_4_ * auVar23._12_4_;
          auVar84._16_4_ = auVar139._16_4_ * auVar23._16_4_;
          auVar84._20_4_ = auVar139._20_4_ * auVar23._20_4_;
          auVar84._24_4_ = auVar139._24_4_ * auVar23._24_4_;
          auVar84._28_4_ = auVar337._28_4_;
          auVar26 = vsubps_avx(auVar84,auVar83);
          auVar85._4_4_ = auVar138._4_4_ * auVar23._4_4_;
          auVar85._0_4_ = auVar138._0_4_ * auVar23._0_4_;
          auVar85._8_4_ = auVar138._8_4_ * auVar23._8_4_;
          auVar85._12_4_ = auVar138._12_4_ * auVar23._12_4_;
          auVar85._16_4_ = auVar138._16_4_ * auVar23._16_4_;
          auVar85._20_4_ = auVar138._20_4_ * auVar23._20_4_;
          auVar85._24_4_ = auVar138._24_4_ * auVar23._24_4_;
          auVar85._28_4_ = auVar337._28_4_;
          auVar86._4_4_ = auVar24._4_4_ * auVar22._4_4_;
          auVar86._0_4_ = auVar24._0_4_ * auVar22._0_4_;
          auVar86._8_4_ = auVar24._8_4_ * auVar22._8_4_;
          auVar86._12_4_ = auVar24._12_4_ * auVar22._12_4_;
          auVar86._16_4_ = auVar24._16_4_ * auVar22._16_4_;
          auVar86._20_4_ = auVar24._20_4_ * auVar22._20_4_;
          auVar86._24_4_ = auVar24._24_4_ * auVar22._24_4_;
          auVar86._28_4_ = auVar22._28_4_;
          auVar337 = vsubps_avx(auVar86,auVar85);
          auVar183._0_4_ = auVar25._0_4_ * 0.0 + auVar337._0_4_ + auVar26._0_4_ * 0.0;
          auVar183._4_4_ = auVar25._4_4_ * 0.0 + auVar337._4_4_ + auVar26._4_4_ * 0.0;
          auVar183._8_4_ = auVar25._8_4_ * 0.0 + auVar337._8_4_ + auVar26._8_4_ * 0.0;
          auVar183._12_4_ = auVar25._12_4_ * 0.0 + auVar337._12_4_ + auVar26._12_4_ * 0.0;
          auVar183._16_4_ = auVar25._16_4_ * 0.0 + auVar337._16_4_ + auVar26._16_4_ * 0.0;
          auVar183._20_4_ = auVar25._20_4_ * 0.0 + auVar337._20_4_ + auVar26._20_4_ * 0.0;
          auVar183._24_4_ = auVar25._24_4_ * 0.0 + auVar337._24_4_ + auVar26._24_4_ * 0.0;
          auVar183._28_4_ = auVar25._28_4_ + auVar337._28_4_ + auVar26._28_4_;
          auVar18 = vcmpps_avx(auVar183,ZEXT832(0) << 0x20,2);
          auVar137 = vblendvps_avx(auVar137,_local_640,auVar18);
          auVar219 = ZEXT3264(auVar137);
          auVar113._4_4_ = fStack_67c;
          auVar113._0_4_ = local_680;
          auVar113._8_4_ = fStack_678;
          auVar113._12_4_ = fStack_674;
          auVar113._16_4_ = fStack_670;
          auVar113._20_4_ = fStack_66c;
          auVar113._24_4_ = fStack_668;
          auVar113._28_4_ = fStack_664;
          auVar337 = vblendvps_avx(auVar19,auVar113,auVar18);
          auVar19 = vblendvps_avx(auVar21,auVar357,auVar18);
          auVar21 = vblendvps_avx(auVar24,auVar339,auVar18);
          auVar22 = vblendvps_avx(auVar138,auVar232,auVar18);
          auVar23 = vblendvps_avx(auVar139,auVar305,auVar18);
          auVar24 = vblendvps_avx(auVar339,auVar24,auVar18);
          auVar25 = vblendvps_avx(auVar232,auVar138,auVar18);
          auVar26 = vblendvps_avx(auVar305,auVar139,auVar18);
          local_760 = vandps_avx(_local_5a0,auVar200);
          auVar24 = vsubps_avx(auVar24,auVar137);
          auVar140 = vsubps_avx(auVar25,auVar337);
          auVar26 = vsubps_avx(auVar26,auVar19);
          auVar179 = vsubps_avx(auVar337,auVar22);
          fVar204 = auVar140._0_4_;
          fVar240 = auVar19._0_4_;
          fVar257 = auVar140._4_4_;
          fVar241 = auVar19._4_4_;
          auVar87._4_4_ = fVar241 * fVar257;
          auVar87._0_4_ = fVar240 * fVar204;
          fVar270 = auVar140._8_4_;
          fVar224 = auVar19._8_4_;
          auVar87._8_4_ = fVar224 * fVar270;
          fVar295 = auVar140._12_4_;
          fVar236 = auVar19._12_4_;
          auVar87._12_4_ = fVar236 * fVar295;
          fVar208 = auVar140._16_4_;
          fVar239 = auVar19._16_4_;
          auVar87._16_4_ = fVar239 * fVar208;
          fVar132 = auVar140._20_4_;
          fVar242 = auVar19._20_4_;
          auVar87._20_4_ = fVar242 * fVar132;
          fVar169 = auVar140._24_4_;
          fVar285 = auVar19._24_4_;
          auVar87._24_4_ = fVar285 * fVar169;
          auVar87._28_4_ = auVar25._28_4_;
          fVar206 = auVar337._0_4_;
          fVar290 = auVar26._0_4_;
          fVar258 = auVar337._4_4_;
          fVar293 = auVar26._4_4_;
          auVar88._4_4_ = fVar293 * fVar258;
          auVar88._0_4_ = fVar290 * fVar206;
          fVar271 = auVar337._8_4_;
          fVar299 = auVar26._8_4_;
          auVar88._8_4_ = fVar299 * fVar271;
          fVar296 = auVar337._12_4_;
          fVar307 = auVar26._12_4_;
          auVar88._12_4_ = fVar307 * fVar296;
          fVar286 = auVar337._16_4_;
          fVar308 = auVar26._16_4_;
          auVar88._16_4_ = fVar308 * fVar286;
          fVar150 = auVar337._20_4_;
          fVar309 = auVar26._20_4_;
          auVar88._20_4_ = fVar309 * fVar150;
          fVar273 = auVar337._24_4_;
          fVar310 = auVar26._24_4_;
          uVar130 = auVar138._28_4_;
          auVar88._24_4_ = fVar310 * fVar273;
          auVar88._28_4_ = uVar130;
          auVar25 = vsubps_avx(auVar88,auVar87);
          fVar207 = auVar137._0_4_;
          fVar259 = auVar137._4_4_;
          auVar89._4_4_ = fVar293 * fVar259;
          auVar89._0_4_ = fVar290 * fVar207;
          fVar272 = auVar137._8_4_;
          auVar89._8_4_ = fVar299 * fVar272;
          fVar221 = auVar137._12_4_;
          auVar89._12_4_ = fVar307 * fVar221;
          fVar151 = auVar137._16_4_;
          auVar89._16_4_ = fVar308 * fVar151;
          fVar154 = auVar137._20_4_;
          auVar89._20_4_ = fVar309 * fVar154;
          fVar223 = auVar137._24_4_;
          auVar89._24_4_ = fVar310 * fVar223;
          auVar89._28_4_ = uVar130;
          fVar243 = auVar24._0_4_;
          fVar260 = auVar24._4_4_;
          auVar90._4_4_ = fVar241 * fVar260;
          auVar90._0_4_ = fVar240 * fVar243;
          fVar291 = auVar24._8_4_;
          auVar90._8_4_ = fVar224 * fVar291;
          fVar284 = auVar24._12_4_;
          auVar90._12_4_ = fVar236 * fVar284;
          fVar155 = auVar24._16_4_;
          auVar90._16_4_ = fVar239 * fVar155;
          fVar158 = auVar24._20_4_;
          auVar90._20_4_ = fVar242 * fVar158;
          fVar234 = auVar24._24_4_;
          auVar90._24_4_ = fVar285 * fVar234;
          auVar90._28_4_ = auVar339._28_4_;
          auVar138 = vsubps_avx(auVar90,auVar89);
          auVar91._4_4_ = fVar258 * fVar260;
          auVar91._0_4_ = fVar206 * fVar243;
          auVar91._8_4_ = fVar271 * fVar291;
          auVar91._12_4_ = fVar296 * fVar284;
          auVar91._16_4_ = fVar286 * fVar155;
          auVar91._20_4_ = fVar150 * fVar158;
          auVar91._24_4_ = fVar273 * fVar234;
          auVar91._28_4_ = uVar130;
          auVar92._4_4_ = fVar259 * fVar257;
          auVar92._0_4_ = fVar207 * fVar204;
          auVar92._8_4_ = fVar272 * fVar270;
          auVar92._12_4_ = fVar221 * fVar295;
          auVar92._16_4_ = fVar151 * fVar208;
          auVar92._20_4_ = fVar154 * fVar132;
          auVar92._24_4_ = fVar223 * fVar169;
          auVar92._28_4_ = auVar139._28_4_;
          auVar139 = vsubps_avx(auVar92,auVar91);
          auVar178 = vsubps_avx(auVar19,auVar23);
          fVar255 = auVar139._28_4_ + auVar138._28_4_;
          local_740._0_4_ = auVar139._0_4_ + auVar138._0_4_ * 0.0 + auVar25._0_4_ * 0.0;
          local_740._4_4_ = auVar139._4_4_ + auVar138._4_4_ * 0.0 + auVar25._4_4_ * 0.0;
          local_740._8_4_ = auVar139._8_4_ + auVar138._8_4_ * 0.0 + auVar25._8_4_ * 0.0;
          local_740._12_4_ = auVar139._12_4_ + auVar138._12_4_ * 0.0 + auVar25._12_4_ * 0.0;
          local_740._16_4_ = auVar139._16_4_ + auVar138._16_4_ * 0.0 + auVar25._16_4_ * 0.0;
          local_740._20_4_ = auVar139._20_4_ + auVar138._20_4_ * 0.0 + auVar25._20_4_ * 0.0;
          local_740._24_4_ = auVar139._24_4_ + auVar138._24_4_ * 0.0 + auVar25._24_4_ * 0.0;
          local_740._28_4_ = fVar255 + auVar25._28_4_;
          fVar254 = auVar179._0_4_;
          fVar267 = auVar179._4_4_;
          auVar93._4_4_ = auVar23._4_4_ * fVar267;
          auVar93._0_4_ = auVar23._0_4_ * fVar254;
          fVar294 = auVar179._8_4_;
          auVar93._8_4_ = auVar23._8_4_ * fVar294;
          fVar297 = auVar179._12_4_;
          auVar93._12_4_ = auVar23._12_4_ * fVar297;
          fVar159 = auVar179._16_4_;
          auVar93._16_4_ = auVar23._16_4_ * fVar159;
          fVar161 = auVar179._20_4_;
          auVar93._20_4_ = auVar23._20_4_ * fVar161;
          fVar235 = auVar179._24_4_;
          auVar93._24_4_ = auVar23._24_4_ * fVar235;
          auVar93._28_4_ = fVar255;
          fVar255 = auVar178._0_4_;
          fVar268 = auVar178._4_4_;
          auVar94._4_4_ = auVar22._4_4_ * fVar268;
          auVar94._0_4_ = auVar22._0_4_ * fVar255;
          fVar220 = auVar178._8_4_;
          auVar94._8_4_ = auVar22._8_4_ * fVar220;
          fVar298 = auVar178._12_4_;
          auVar94._12_4_ = auVar22._12_4_ * fVar298;
          fVar162 = auVar178._16_4_;
          auVar94._16_4_ = auVar22._16_4_ * fVar162;
          fVar164 = auVar178._20_4_;
          auVar94._20_4_ = auVar22._20_4_ * fVar164;
          fVar237 = auVar178._24_4_;
          auVar94._24_4_ = auVar22._24_4_ * fVar237;
          auVar94._28_4_ = auVar139._28_4_;
          auVar138 = vsubps_avx(auVar94,auVar93);
          auVar139 = vsubps_avx(auVar137,auVar21);
          fVar256 = auVar139._0_4_;
          fVar269 = auVar139._4_4_;
          auVar95._4_4_ = auVar23._4_4_ * fVar269;
          auVar95._0_4_ = auVar23._0_4_ * fVar256;
          fVar283 = auVar139._8_4_;
          auVar95._8_4_ = auVar23._8_4_ * fVar283;
          fVar222 = auVar139._12_4_;
          auVar95._12_4_ = auVar23._12_4_ * fVar222;
          fVar165 = auVar139._16_4_;
          auVar95._16_4_ = auVar23._16_4_ * fVar165;
          fVar167 = auVar139._20_4_;
          auVar95._20_4_ = auVar23._20_4_ * fVar167;
          fVar238 = auVar139._24_4_;
          auVar95._24_4_ = auVar23._24_4_ * fVar238;
          auVar95._28_4_ = auVar23._28_4_;
          auVar96._4_4_ = fVar268 * auVar21._4_4_;
          auVar96._0_4_ = fVar255 * auVar21._0_4_;
          auVar96._8_4_ = fVar220 * auVar21._8_4_;
          auVar96._12_4_ = fVar298 * auVar21._12_4_;
          auVar96._16_4_ = fVar162 * auVar21._16_4_;
          auVar96._20_4_ = fVar164 * auVar21._20_4_;
          auVar96._24_4_ = fVar237 * auVar21._24_4_;
          auVar96._28_4_ = auVar25._28_4_;
          auVar23 = vsubps_avx(auVar95,auVar96);
          auVar97._4_4_ = auVar22._4_4_ * fVar269;
          auVar97._0_4_ = auVar22._0_4_ * fVar256;
          auVar97._8_4_ = auVar22._8_4_ * fVar283;
          auVar97._12_4_ = auVar22._12_4_ * fVar222;
          auVar97._16_4_ = auVar22._16_4_ * fVar165;
          auVar97._20_4_ = auVar22._20_4_ * fVar167;
          auVar97._24_4_ = auVar22._24_4_ * fVar238;
          auVar97._28_4_ = auVar22._28_4_;
          auVar98._4_4_ = fVar267 * auVar21._4_4_;
          auVar98._0_4_ = fVar254 * auVar21._0_4_;
          auVar98._8_4_ = fVar294 * auVar21._8_4_;
          auVar98._12_4_ = fVar297 * auVar21._12_4_;
          auVar98._16_4_ = fVar159 * auVar21._16_4_;
          auVar98._20_4_ = fVar161 * auVar21._20_4_;
          auVar98._24_4_ = fVar235 * auVar21._24_4_;
          auVar98._28_4_ = auVar21._28_4_;
          auVar21 = vsubps_avx(auVar98,auVar97);
          auVar147._0_4_ = auVar138._0_4_ * 0.0 + auVar21._0_4_ + auVar23._0_4_ * 0.0;
          auVar147._4_4_ = auVar138._4_4_ * 0.0 + auVar21._4_4_ + auVar23._4_4_ * 0.0;
          auVar147._8_4_ = auVar138._8_4_ * 0.0 + auVar21._8_4_ + auVar23._8_4_ * 0.0;
          auVar147._12_4_ = auVar138._12_4_ * 0.0 + auVar21._12_4_ + auVar23._12_4_ * 0.0;
          auVar147._16_4_ = auVar138._16_4_ * 0.0 + auVar21._16_4_ + auVar23._16_4_ * 0.0;
          auVar147._20_4_ = auVar138._20_4_ * 0.0 + auVar21._20_4_ + auVar23._20_4_ * 0.0;
          auVar147._24_4_ = auVar138._24_4_ * 0.0 + auVar21._24_4_ + auVar23._24_4_ * 0.0;
          auVar147._28_4_ = auVar23._28_4_ + auVar21._28_4_ + auVar23._28_4_;
          auVar148 = ZEXT3264(auVar147);
          auVar21 = vmaxps_avx(local_740,auVar147);
          auVar21 = vcmpps_avx(auVar21,ZEXT432(0) << 0x20,2);
          auVar22 = local_760 & auVar21;
          if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar22 >> 0x7f,0) == '\0') &&
                (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar22 >> 0xbf,0) == '\0') &&
              (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar22[0x1f]) {
LAB_00a68970:
            auVar292 = auVar179._4_12_;
            auVar185 = ZEXT3264(CONCAT824(uStack_5c8,
                                          CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
            auVar350._4_4_ = fVar152;
            auVar350._0_4_ = fVar133;
            auVar350._8_4_ = fVar156;
            auVar350._12_4_ = fVar160;
            auVar350._16_4_ = fVar163;
            auVar350._20_4_ = fVar166;
            auVar350._24_4_ = fVar168;
            auVar350._28_4_ = fVar170;
          }
          else {
            auVar22 = vandps_avx(auVar21,local_760);
            auVar99._4_4_ = fVar268 * fVar257;
            auVar99._0_4_ = fVar255 * fVar204;
            auVar99._8_4_ = fVar220 * fVar270;
            auVar99._12_4_ = fVar298 * fVar295;
            auVar99._16_4_ = fVar162 * fVar208;
            auVar99._20_4_ = fVar164 * fVar132;
            auVar99._24_4_ = fVar237 * fVar169;
            auVar99._28_4_ = local_760._28_4_;
            auVar100._4_4_ = fVar267 * fVar293;
            auVar100._0_4_ = fVar254 * fVar290;
            auVar100._8_4_ = fVar294 * fVar299;
            auVar100._12_4_ = fVar297 * fVar307;
            auVar100._16_4_ = fVar159 * fVar308;
            auVar100._20_4_ = fVar161 * fVar309;
            auVar100._24_4_ = fVar235 * fVar310;
            auVar100._28_4_ = auVar21._28_4_;
            auVar23 = vsubps_avx(auVar100,auVar99);
            auVar101._4_4_ = fVar269 * fVar293;
            auVar101._0_4_ = fVar256 * fVar290;
            auVar101._8_4_ = fVar283 * fVar299;
            auVar101._12_4_ = fVar222 * fVar307;
            auVar101._16_4_ = fVar165 * fVar308;
            auVar101._20_4_ = fVar167 * fVar309;
            auVar101._24_4_ = fVar238 * fVar310;
            auVar101._28_4_ = auVar26._28_4_;
            auVar102._4_4_ = fVar268 * fVar260;
            auVar102._0_4_ = fVar255 * fVar243;
            auVar102._8_4_ = fVar220 * fVar291;
            auVar102._12_4_ = fVar298 * fVar284;
            auVar102._16_4_ = fVar162 * fVar155;
            auVar102._20_4_ = fVar164 * fVar158;
            auVar102._24_4_ = fVar237 * fVar234;
            auVar102._28_4_ = auVar178._28_4_;
            auVar25 = vsubps_avx(auVar102,auVar101);
            auVar103._4_4_ = fVar267 * fVar260;
            auVar103._0_4_ = fVar254 * fVar243;
            auVar103._8_4_ = fVar294 * fVar291;
            auVar103._12_4_ = fVar297 * fVar284;
            auVar103._16_4_ = fVar159 * fVar155;
            auVar103._20_4_ = fVar161 * fVar158;
            auVar103._24_4_ = fVar235 * fVar234;
            auVar103._28_4_ = auVar24._28_4_;
            auVar104._4_4_ = fVar269 * fVar257;
            auVar104._0_4_ = fVar256 * fVar204;
            auVar104._8_4_ = fVar283 * fVar270;
            auVar104._12_4_ = fVar222 * fVar295;
            auVar104._16_4_ = fVar165 * fVar208;
            auVar104._20_4_ = fVar167 * fVar132;
            auVar104._24_4_ = fVar238 * fVar169;
            auVar104._28_4_ = auVar140._28_4_;
            auVar179 = vsubps_avx(auVar104,auVar103);
            auVar292 = auVar179._4_12_;
            auVar184._0_4_ = auVar23._0_4_ * 0.0 + auVar179._0_4_ + auVar25._0_4_ * 0.0;
            auVar184._4_4_ = auVar23._4_4_ * 0.0 + auVar179._4_4_ + auVar25._4_4_ * 0.0;
            auVar184._8_4_ = auVar23._8_4_ * 0.0 + auVar179._8_4_ + auVar25._8_4_ * 0.0;
            auVar184._12_4_ = auVar23._12_4_ * 0.0 + auVar179._12_4_ + auVar25._12_4_ * 0.0;
            auVar184._16_4_ = auVar23._16_4_ * 0.0 + auVar179._16_4_ + auVar25._16_4_ * 0.0;
            auVar184._20_4_ = auVar23._20_4_ * 0.0 + auVar179._20_4_ + auVar25._20_4_ * 0.0;
            auVar184._24_4_ = auVar23._24_4_ * 0.0 + auVar179._24_4_ + auVar25._24_4_ * 0.0;
            auVar184._28_4_ = auVar140._28_4_ + auVar179._28_4_ + auVar24._28_4_;
            auVar21 = vrcpps_avx(auVar184);
            fVar204 = auVar21._0_4_;
            fVar243 = auVar21._4_4_;
            auVar105._4_4_ = auVar184._4_4_ * fVar243;
            auVar105._0_4_ = auVar184._0_4_ * fVar204;
            fVar254 = auVar21._8_4_;
            auVar105._8_4_ = auVar184._8_4_ * fVar254;
            fVar255 = auVar21._12_4_;
            auVar105._12_4_ = auVar184._12_4_ * fVar255;
            fVar256 = auVar21._16_4_;
            auVar105._16_4_ = auVar184._16_4_ * fVar256;
            fVar257 = auVar21._20_4_;
            auVar105._20_4_ = auVar184._20_4_ * fVar257;
            fVar260 = auVar21._24_4_;
            auVar105._24_4_ = auVar184._24_4_ * fVar260;
            auVar105._28_4_ = auVar178._28_4_;
            auVar333._8_4_ = 0x3f800000;
            auVar333._0_8_ = 0x3f8000003f800000;
            auVar333._12_4_ = 0x3f800000;
            auVar333._16_4_ = 0x3f800000;
            auVar333._20_4_ = 0x3f800000;
            auVar333._24_4_ = 0x3f800000;
            auVar333._28_4_ = 0x3f800000;
            auVar21 = vsubps_avx(auVar333,auVar105);
            fVar204 = auVar21._0_4_ * fVar204 + fVar204;
            fVar243 = auVar21._4_4_ * fVar243 + fVar243;
            fVar254 = auVar21._8_4_ * fVar254 + fVar254;
            fVar255 = auVar21._12_4_ * fVar255 + fVar255;
            fVar256 = auVar21._16_4_ * fVar256 + fVar256;
            fVar257 = auVar21._20_4_ * fVar257 + fVar257;
            fVar260 = auVar21._24_4_ * fVar260 + fVar260;
            auVar106._4_4_ =
                 (fVar259 * auVar23._4_4_ + auVar25._4_4_ * fVar258 + auVar179._4_4_ * fVar241) *
                 fVar243;
            auVar106._0_4_ =
                 (fVar207 * auVar23._0_4_ + auVar25._0_4_ * fVar206 + auVar179._0_4_ * fVar240) *
                 fVar204;
            auVar106._8_4_ =
                 (fVar272 * auVar23._8_4_ + auVar25._8_4_ * fVar271 + auVar179._8_4_ * fVar224) *
                 fVar254;
            auVar106._12_4_ =
                 (fVar221 * auVar23._12_4_ + auVar25._12_4_ * fVar296 + auVar179._12_4_ * fVar236) *
                 fVar255;
            auVar106._16_4_ =
                 (fVar151 * auVar23._16_4_ + auVar25._16_4_ * fVar286 + auVar179._16_4_ * fVar239) *
                 fVar256;
            auVar106._20_4_ =
                 (fVar154 * auVar23._20_4_ + auVar25._20_4_ * fVar150 + auVar179._20_4_ * fVar242) *
                 fVar257;
            auVar106._24_4_ =
                 (fVar223 * auVar23._24_4_ + auVar25._24_4_ * fVar273 + auVar179._24_4_ * fVar285) *
                 fVar260;
            auVar106._28_4_ = auVar137._28_4_ + auVar337._28_4_ + auVar19._28_4_;
            auVar219 = ZEXT3264(auVar106);
            uVar130 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar233._4_4_ = uVar130;
            auVar233._0_4_ = uVar130;
            auVar233._8_4_ = uVar130;
            auVar233._12_4_ = uVar130;
            auVar233._16_4_ = uVar130;
            auVar233._20_4_ = uVar130;
            auVar233._24_4_ = uVar130;
            auVar233._28_4_ = uVar130;
            auVar137 = vcmpps_avx(local_e0,auVar106,2);
            auVar337 = vcmpps_avx(auVar106,auVar233,2);
            auVar137 = vandps_avx(auVar137,auVar337);
            auVar19 = auVar22 & auVar137;
            if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar19 >> 0x7f,0) == '\0') &&
                  (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar19 >> 0xbf,0) == '\0') &&
                (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar19[0x1f]) goto LAB_00a68970;
            auVar137 = vandps_avx(auVar22,auVar137);
            auVar19 = vcmpps_avx(ZEXT432(0) << 0x20,auVar184,4);
            auVar21 = auVar137 & auVar19;
            auVar185 = ZEXT3264(CONCAT824(uStack_5c8,
                                          CONCAT816(uStack_5d0,CONCAT88(uStack_5d8,local_5e0))));
            auVar350._4_4_ = fVar152;
            auVar350._0_4_ = fVar133;
            auVar350._8_4_ = fVar156;
            auVar350._12_4_ = fVar160;
            auVar350._16_4_ = fVar163;
            auVar350._20_4_ = fVar166;
            auVar350._24_4_ = fVar168;
            auVar350._28_4_ = fVar170;
            if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar21 >> 0x7f,0) != '\0') ||
                  (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar21 >> 0xbf,0) != '\0') ||
                (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar21[0x1f] < '\0') {
              auVar137 = vandps_avx(auVar19,auVar137);
              auVar185 = ZEXT3264(auVar137);
              auVar107._4_4_ = fVar243 * local_740._4_4_;
              auVar107._0_4_ = fVar204 * local_740._0_4_;
              auVar107._8_4_ = fVar254 * local_740._8_4_;
              auVar107._12_4_ = fVar255 * local_740._12_4_;
              auVar107._16_4_ = fVar256 * local_740._16_4_;
              auVar107._20_4_ = fVar257 * local_740._20_4_;
              auVar107._24_4_ = fVar260 * local_740._24_4_;
              auVar107._28_4_ = auVar337._28_4_;
              auVar108._4_4_ = auVar147._4_4_ * fVar243;
              auVar108._0_4_ = auVar147._0_4_ * fVar204;
              auVar108._8_4_ = auVar147._8_4_ * fVar254;
              auVar108._12_4_ = auVar147._12_4_ * fVar255;
              auVar108._16_4_ = auVar147._16_4_ * fVar256;
              auVar108._20_4_ = auVar147._20_4_ * fVar257;
              auVar108._24_4_ = auVar147._24_4_ * fVar260;
              auVar108._28_4_ = auVar147._28_4_;
              auVar266._8_4_ = 0x3f800000;
              auVar266._0_8_ = 0x3f8000003f800000;
              auVar266._12_4_ = 0x3f800000;
              auVar266._16_4_ = 0x3f800000;
              auVar266._20_4_ = 0x3f800000;
              auVar266._24_4_ = 0x3f800000;
              auVar266._28_4_ = 0x3f800000;
              auVar137 = vsubps_avx(auVar266,auVar107);
              local_180 = vblendvps_avx(auVar137,auVar107,auVar18);
              auVar137 = vsubps_avx(auVar266,auVar108);
              _local_3c0 = vblendvps_avx(auVar137,auVar108,auVar18);
              auVar148 = ZEXT3264(_local_3c0);
              local_1a0 = auVar106;
            }
          }
          auVar340 = ZEXT3264(local_780);
          auVar306 = ZEXT3264(local_7a0);
          auVar137 = auVar185._0_32_;
          auVar334 = ZEXT3264(_local_720);
          local_500 = auVar200;
          if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar137 >> 0x7f,0) != '\0') ||
                (auVar185 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
               SUB321(auVar137 >> 0xbf,0) != '\0') ||
              (auVar185 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
              auVar185[0x1f] < '\0') {
            auVar337 = vsubps_avx(_local_5c0,auVar350);
            auVar219 = ZEXT3264(local_180);
            fVar206 = auVar350._0_4_ + auVar337._0_4_ * local_180._0_4_;
            fVar207 = auVar350._4_4_ + auVar337._4_4_ * local_180._4_4_;
            fVar243 = auVar350._8_4_ + auVar337._8_4_ * local_180._8_4_;
            fVar254 = auVar350._12_4_ + auVar337._12_4_ * local_180._12_4_;
            fVar255 = auVar350._16_4_ + auVar337._16_4_ * local_180._16_4_;
            fVar256 = auVar350._20_4_ + auVar337._20_4_ * local_180._20_4_;
            fVar257 = auVar350._24_4_ + auVar337._24_4_ * local_180._24_4_;
            fVar258 = auVar350._28_4_ + auVar337._28_4_;
            fVar204 = *(float *)((long)local_6f8->ray_space + k * 4 + -0x10);
            auVar109._4_4_ = (fVar207 + fVar207) * fVar204;
            auVar109._0_4_ = (fVar206 + fVar206) * fVar204;
            auVar109._8_4_ = (fVar243 + fVar243) * fVar204;
            auVar109._12_4_ = (fVar254 + fVar254) * fVar204;
            auVar109._16_4_ = (fVar255 + fVar255) * fVar204;
            auVar109._20_4_ = (fVar256 + fVar256) * fVar204;
            auVar109._24_4_ = (fVar257 + fVar257) * fVar204;
            auVar109._28_4_ = fVar258 + fVar258;
            auVar337 = vcmpps_avx(local_1a0,auVar109,6);
            auVar148 = ZEXT3264(auVar337);
            auVar19 = auVar137 & auVar337;
            if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar19 >> 0x7f,0) != '\0') ||
                  (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar19 >> 0xbf,0) != '\0') ||
                (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar19[0x1f] < '\0') {
              local_220 = vandps_avx(auVar337,auVar137);
              auVar148 = ZEXT3264(local_220);
              auVar174._0_8_ =
                   CONCAT44((float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0,
                            (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0);
              auVar174._8_4_ = (float)uStack_3b8 + (float)uStack_3b8 + -1.0;
              auVar174._12_4_ = uStack_3b8._4_4_ + uStack_3b8._4_4_ + -1.0;
              auVar177._16_4_ = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
              auVar177._0_16_ = auVar174;
              auVar177._20_4_ = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
              fStack_2a8 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
              _local_2c0 = auVar177;
              fStack_2a4 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
              auVar185 = ZEXT3264(_local_2c0);
              local_2e0 = local_180;
              local_2a0 = local_1a0;
              local_260 = local_870;
              fStack_25c = fStack_86c;
              fStack_258 = fStack_868;
              fStack_254 = fStack_864;
              local_250 = local_880;
              fStack_24c = fStack_87c;
              fStack_248 = fStack_878;
              fStack_244 = fStack_874;
              local_240 = local_7d0;
              fStack_23c = fStack_7cc;
              fStack_238 = fStack_7c8;
              fStack_234 = fStack_7c4;
              pGVar16 = (context->scene->geometries).items[local_7a8].ptr;
              _local_3c0 = _local_2c0;
              if ((pGVar16->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar123 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar123 = context->args;
                if ((pRVar123->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar123 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pGVar16 >> 8),1),
                   pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar188._0_4_ = (float)(int)local_280;
                  auVar188._4_12_ = auVar292;
                  auVar247 = vshufps_avx(auVar188,auVar188,0);
                  local_200[0] = (auVar247._0_4_ + local_180._0_4_ + 0.0) * (float)local_100._0_4_;
                  local_200[1] = (auVar247._4_4_ + local_180._4_4_ + 1.0) * (float)local_100._4_4_;
                  local_200[2] = (auVar247._8_4_ + local_180._8_4_ + 2.0) * fStack_f8;
                  local_200[3] = (auVar247._12_4_ + local_180._12_4_ + 3.0) * fStack_f4;
                  fStack_1f0 = (auVar247._0_4_ + local_180._16_4_ + 4.0) * fStack_f0;
                  fStack_1ec = (auVar247._4_4_ + local_180._20_4_ + 5.0) * fStack_ec;
                  fStack_1e8 = (auVar247._8_4_ + local_180._24_4_ + 6.0) * fStack_e8;
                  fStack_1e4 = auVar247._12_4_ + (float)local_180._28_4_ + 7.0;
                  uStack_3b8 = auVar174._8_8_;
                  uStack_3b0 = auVar177._16_8_;
                  uStack_3a8 = local_2c0._24_8_;
                  local_1e0 = auVar174._0_8_;
                  uStack_1d8 = uStack_3b8;
                  uStack_1d0 = uStack_3b0;
                  uStack_1c8 = uStack_3a8;
                  auVar185 = ZEXT3264(local_1a0);
                  local_1c0 = local_1a0;
                  uVar130 = vmovmskps_avx(local_220);
                  uVar127 = CONCAT44((int)((ulong)pRVar123 >> 0x20),uVar130);
                  lVar125 = 0;
                  _local_660 = auVar20;
                  local_27c = uVar15;
                  local_270 = local_830;
                  uStack_268 = uStack_828;
                  if (uVar127 != 0) {
                    for (; (uVar127 >> lVar125 & 1) == 0; lVar125 = lVar125 + 1) {
                    }
                  }
                  while (uVar127 != 0) {
                    local_760._0_8_ = uVar127;
                    local_6c0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_420 = local_200[lVar125];
                    local_740._0_8_ = lVar125;
                    local_410 = *(undefined4 *)((long)&local_1e0 + lVar125 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + lVar125 * 4);
                    fVar206 = 1.0 - local_420;
                    fVar204 = local_420 * fVar206 * 4.0;
                    auVar247 = ZEXT416((uint)(local_420 * local_420 * 0.5));
                    auVar247 = vshufps_avx(auVar247,auVar247,0);
                    auVar189 = ZEXT416((uint)((fVar206 * fVar206 + fVar204) * 0.5));
                    auVar189 = vshufps_avx(auVar189,auVar189,0);
                    auVar205 = ZEXT416((uint)((-local_420 * local_420 - fVar204) * 0.5));
                    auVar205 = vshufps_avx(auVar205,auVar205,0);
                    local_6f0.context = context->user;
                    auVar210 = ZEXT416((uint)(fVar206 * -fVar206 * 0.5));
                    auVar210 = vshufps_avx(auVar210,auVar210,0);
                    auVar190._0_4_ =
                         fVar186 * auVar210._0_4_ +
                         local_870 * auVar205._0_4_ +
                         auVar247._0_4_ * local_7d0 + local_880 * auVar189._0_4_;
                    auVar190._4_4_ =
                         fVar201 * auVar210._4_4_ +
                         fStack_86c * auVar205._4_4_ +
                         auVar247._4_4_ * fStack_7cc + fStack_87c * auVar189._4_4_;
                    auVar190._8_4_ =
                         fVar202 * auVar210._8_4_ +
                         fStack_868 * auVar205._8_4_ +
                         auVar247._8_4_ * fStack_7c8 + fStack_878 * auVar189._8_4_;
                    auVar190._12_4_ =
                         fVar203 * auVar210._12_4_ +
                         fStack_864 * auVar205._12_4_ +
                         auVar247._12_4_ * fStack_7c4 + fStack_874 * auVar189._12_4_;
                    local_450 = (RTCHitN  [16])vshufps_avx(auVar190,auVar190,0);
                    local_440 = vshufps_avx(auVar190,auVar190,0x55);
                    auVar219 = ZEXT1664(local_440);
                    local_430 = vshufps_avx(auVar190,auVar190,0xaa);
                    local_400 = local_300._0_8_;
                    uStack_3f8 = local_300._8_8_;
                    local_3f0 = local_2f0;
                    vcmpps_avx(ZEXT1632(local_2f0),ZEXT1632(local_2f0),0xf);
                    uStack_3dc = (local_6f0.context)->instID[0];
                    local_3e0 = uStack_3dc;
                    uStack_3d8 = uStack_3dc;
                    uStack_3d4 = uStack_3dc;
                    uStack_3d0 = (local_6f0.context)->instPrimID[0];
                    uStack_3cc = uStack_3d0;
                    uStack_3c8 = uStack_3d0;
                    uStack_3c4 = uStack_3d0;
                    local_7c0 = *local_700;
                    local_6f0.valid = (int *)local_7c0;
                    local_6f0.geometryUserPtr = pGVar16->userPtr;
                    local_6f0.hit = local_450;
                    local_6f0.N = 4;
                    local_6f0.ray = (RTCRayN *)ray;
                    fStack_41c = local_420;
                    fStack_418 = local_420;
                    fStack_414 = local_420;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    if (pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar219 = ZEXT1664(local_440);
                      (*pGVar16->occlusionFilterN)(&local_6f0);
                    }
                    if (local_7c0 == (undefined1  [16])0x0) {
                      auVar247 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar247 = auVar247 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var17 = context->args->filter;
                      if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar16->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar219 = ZEXT1664(auVar219._0_16_);
                        (*p_Var17)(&local_6f0);
                      }
                      auVar189 = vpcmpeqd_avx(local_7c0,_DAT_01f45a50);
                      auVar247 = auVar189 ^ _DAT_01f46b70;
                      auVar191._8_4_ = 0xff800000;
                      auVar191._0_8_ = 0xff800000ff800000;
                      auVar191._12_4_ = 0xff800000;
                      auVar189 = vblendvps_avx(auVar191,*(undefined1 (*) [16])(local_6f0.ray + 0x80)
                                               ,auVar189);
                      *(undefined1 (*) [16])(local_6f0.ray + 0x80) = auVar189;
                    }
                    auVar148 = ZEXT1664(auVar247);
                    auVar175._8_8_ = 0x100000001;
                    auVar175._0_8_ = 0x100000001;
                    auVar185 = ZEXT1664(auVar175);
                    if ((auVar175 & auVar247) != (undefined1  [16])0x0) {
                      pRVar123 = (RTCIntersectArguments *)0x1;
                      goto LAB_00a689b5;
                    }
                    auVar148 = ZEXT464((uint)local_6c0._0_4_);
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_6c0._0_4_;
                    uVar127 = local_760._0_8_ ^ 1L << (local_740._0_8_ & 0x3f);
                    lVar125 = 0;
                    if (uVar127 != 0) {
                      for (; (uVar127 >> lVar125 & 1) == 0; lVar125 = lVar125 + 1) {
                      }
                    }
                  }
                  pRVar123 = (RTCIntersectArguments *)0x0;
LAB_00a689b5:
                  auVar340 = ZEXT3264(local_780);
                  auVar306 = ZEXT3264(local_7a0);
                  auVar334 = ZEXT3264(_local_720);
                }
              }
              bVar124 = bVar124 | (byte)pRVar123;
            }
          }
        }
      }
    }
    if (bVar124 != 0) break;
    uVar130 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar144._4_4_ = uVar130;
    auVar144._0_4_ = uVar130;
    auVar144._8_4_ = uVar130;
    auVar144._12_4_ = uVar130;
    auVar144._16_4_ = uVar130;
    auVar144._20_4_ = uVar130;
    auVar144._24_4_ = uVar130;
    auVar144._28_4_ = uVar130;
    auVar137 = vcmpps_avx(local_80,auVar144,2);
    uVar121 = vmovmskps_avx(auVar137);
    uVar122 = (ulong)((uint)uVar129 & uVar121);
  }
  return uVar122 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }